

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  bool bVar77;
  undefined1 auVar78 [12];
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar99;
  ulong uVar100;
  long lVar101;
  uint uVar102;
  long lVar103;
  ulong uVar104;
  ulong uVar105;
  bool bVar106;
  vint4 bi_1;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar132;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar133;
  undefined8 extraout_XMM1_Qa;
  float fVar170;
  vint4 bi;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar134;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar168;
  float fVar172;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar154 [32];
  float fVar169;
  float fVar171;
  float fVar173;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar148 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar153 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar200;
  float fVar203;
  vint4 bi_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  float fVar221;
  float fVar236;
  float fVar237;
  vint4 ai_1;
  undefined1 auVar222 [16];
  float fVar238;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [28];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  float fVar239;
  float fVar256;
  float fVar257;
  vint4 ai_2;
  undefined1 auVar240 [16];
  float fVar258;
  undefined1 auVar241 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar260;
  undefined1 auVar250 [28];
  float fVar259;
  undefined1 auVar255 [64];
  float fVar261;
  float fVar274;
  float fVar275;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar276;
  float fVar277;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  float fVar278;
  float fVar279;
  float fVar288;
  float fVar290;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar292;
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar285 [32];
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar300;
  float fVar301;
  float fVar312;
  float fVar314;
  vint4 ai;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar318;
  float fVar321;
  float fVar324;
  float fVar327;
  float fVar329;
  float fVar330;
  undefined1 auVar307 [32];
  float fVar316;
  float fVar319;
  float fVar322;
  float fVar325;
  float fVar328;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar320;
  float fVar323;
  float fVar326;
  undefined1 auVar311 [64];
  float fVar331;
  float fVar332;
  float fVar333;
  float fVar341;
  float fVar344;
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  float fVar342;
  float fVar343;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar352;
  float fVar354;
  float fVar355;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar350;
  float fVar353;
  float fVar356;
  undefined1 auVar340 [64];
  float fVar360;
  float fVar367;
  float fVar370;
  undefined1 auVar363 [16];
  float fVar361;
  float fVar362;
  undefined1 auVar364 [28];
  float fVar368;
  float fVar369;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  float s;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  float fVar390;
  undefined1 auVar388 [32];
  float t;
  undefined1 auVar391 [16];
  float fVar396;
  undefined1 auVar393 [32];
  float fVar395;
  undefined1 auVar394 [64];
  float fVar397;
  float fVar404;
  float fVar405;
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar420;
  float fVar423;
  undefined1 auVar413 [16];
  float fVar422;
  float fVar424;
  float fVar426;
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  float fVar425;
  undefined1 auVar416 [32];
  float fVar421;
  undefined1 auVar417 [32];
  float fVar429;
  undefined1 auVar418 [32];
  float fVar427;
  float fVar428;
  float fVar430;
  undefined1 auVar419 [64];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_be0;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  undefined8 local_b20;
  undefined8 uStack_b18;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  undefined1 auStack_9f0 [16];
  undefined1 local_9e0 [32];
  undefined8 *local_9b0;
  ulong local_9a8;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  RTCHitN local_740 [16];
  undefined1 auStack_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  uint local_6d0;
  uint uStack_6cc;
  uint uStack_6c8;
  uint uStack_6c4;
  uint uStack_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540 [4];
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined4 uStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar389 [64];
  undefined1 auVar392 [16];
  undefined1 auVar403 [64];
  
  PVar10 = prim[1];
  uVar104 = (ulong)(byte)PVar10;
  lVar103 = uVar104 * 0x25;
  fVar133 = *(float *)(prim + lVar103 + 0x12);
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar225 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar225 = vinsertps_avx(auVar225,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar140 = vsubps_avx(auVar140,*(undefined1 (*) [16])(prim + lVar103 + 6));
  auVar135._0_4_ = fVar133 * auVar140._0_4_;
  auVar135._4_4_ = fVar133 * auVar140._4_4_;
  auVar135._8_4_ = fVar133 * auVar140._8_4_;
  auVar135._12_4_ = fVar133 * auVar140._12_4_;
  auVar302._0_4_ = fVar133 * auVar225._0_4_;
  auVar302._4_4_ = fVar133 * auVar225._4_4_;
  auVar302._8_4_ = fVar133 * auVar225._8_4_;
  auVar302._12_4_ = fVar133 * auVar225._12_4_;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 4 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar225 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 5 + 6)));
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 6 + 6)));
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar141 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0xf + 6)));
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar141 = vcvtdq2ps_avx(auVar141);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar104 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1a + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1b + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar104 * 0x1c + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vshufps_avx(auVar302,auVar302,0);
  auVar21 = vshufps_avx(auVar302,auVar302,0x55);
  auVar22 = vshufps_avx(auVar302,auVar302,0xaa);
  fVar133 = auVar22._0_4_;
  fVar134 = auVar22._4_4_;
  fVar168 = auVar22._8_4_;
  fVar170 = auVar22._12_4_;
  fVar239 = auVar21._0_4_;
  fVar256 = auVar21._4_4_;
  fVar257 = auVar21._8_4_;
  fVar258 = auVar21._12_4_;
  fVar221 = auVar20._0_4_;
  fVar236 = auVar20._4_4_;
  fVar237 = auVar20._8_4_;
  fVar238 = auVar20._12_4_;
  auVar398._0_4_ = fVar221 * auVar140._0_4_ + fVar239 * auVar225._0_4_ + fVar133 * auVar112._0_4_;
  auVar398._4_4_ = fVar236 * auVar140._4_4_ + fVar256 * auVar225._4_4_ + fVar134 * auVar112._4_4_;
  auVar398._8_4_ = fVar237 * auVar140._8_4_ + fVar257 * auVar225._8_4_ + fVar168 * auVar112._8_4_;
  auVar398._12_4_ =
       fVar238 * auVar140._12_4_ + fVar258 * auVar225._12_4_ + fVar170 * auVar112._12_4_;
  auVar413._0_4_ = fVar221 * auVar141._0_4_ + fVar239 * auVar142._0_4_ + auVar17._0_4_ * fVar133;
  auVar413._4_4_ = fVar236 * auVar141._4_4_ + fVar256 * auVar142._4_4_ + auVar17._4_4_ * fVar134;
  auVar413._8_4_ = fVar237 * auVar141._8_4_ + fVar257 * auVar142._8_4_ + auVar17._8_4_ * fVar168;
  auVar413._12_4_ = fVar238 * auVar141._12_4_ + fVar258 * auVar142._12_4_ + auVar17._12_4_ * fVar170
  ;
  auVar303._0_4_ = fVar221 * auVar18._0_4_ + fVar239 * auVar145._0_4_ + auVar19._0_4_ * fVar133;
  auVar303._4_4_ = fVar236 * auVar18._4_4_ + fVar256 * auVar145._4_4_ + auVar19._4_4_ * fVar134;
  auVar303._8_4_ = fVar237 * auVar18._8_4_ + fVar257 * auVar145._8_4_ + auVar19._8_4_ * fVar168;
  auVar303._12_4_ = fVar238 * auVar18._12_4_ + fVar258 * auVar145._12_4_ + auVar19._12_4_ * fVar170;
  auVar20 = vshufps_avx(auVar135,auVar135,0);
  auVar21 = vshufps_avx(auVar135,auVar135,0x55);
  auVar22 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar133 = auVar22._0_4_;
  fVar134 = auVar22._4_4_;
  fVar168 = auVar22._8_4_;
  fVar170 = auVar22._12_4_;
  fVar239 = auVar21._0_4_;
  fVar256 = auVar21._4_4_;
  fVar257 = auVar21._8_4_;
  fVar258 = auVar21._12_4_;
  fVar221 = auVar20._0_4_;
  fVar236 = auVar20._4_4_;
  fVar237 = auVar20._8_4_;
  fVar238 = auVar20._12_4_;
  auVar136._0_4_ = fVar221 * auVar140._0_4_ + fVar239 * auVar225._0_4_ + fVar133 * auVar112._0_4_;
  auVar136._4_4_ = fVar236 * auVar140._4_4_ + fVar256 * auVar225._4_4_ + fVar134 * auVar112._4_4_;
  auVar136._8_4_ = fVar237 * auVar140._8_4_ + fVar257 * auVar225._8_4_ + fVar168 * auVar112._8_4_;
  auVar136._12_4_ =
       fVar238 * auVar140._12_4_ + fVar258 * auVar225._12_4_ + fVar170 * auVar112._12_4_;
  auVar107._0_4_ = fVar221 * auVar141._0_4_ + auVar17._0_4_ * fVar133 + fVar239 * auVar142._0_4_;
  auVar107._4_4_ = fVar236 * auVar141._4_4_ + auVar17._4_4_ * fVar134 + fVar256 * auVar142._4_4_;
  auVar107._8_4_ = fVar237 * auVar141._8_4_ + auVar17._8_4_ * fVar168 + fVar257 * auVar142._8_4_;
  auVar107._12_4_ = fVar238 * auVar141._12_4_ + auVar17._12_4_ * fVar170 + fVar258 * auVar142._12_4_
  ;
  auVar334._8_4_ = 0x7fffffff;
  auVar334._0_8_ = 0x7fffffff7fffffff;
  auVar334._12_4_ = 0x7fffffff;
  auVar140 = vandps_avx(auVar398,auVar334);
  auVar240._8_4_ = 0x219392ef;
  auVar240._0_8_ = 0x219392ef219392ef;
  auVar240._12_4_ = 0x219392ef;
  auVar140 = vcmpps_avx(auVar140,auVar240,1);
  auVar225 = vblendvps_avx(auVar398,auVar240,auVar140);
  auVar140 = vandps_avx(auVar413,auVar334);
  auVar140 = vcmpps_avx(auVar140,auVar240,1);
  auVar112 = vblendvps_avx(auVar413,auVar240,auVar140);
  auVar140 = vandps_avx(auVar334,auVar303);
  auVar140 = vcmpps_avx(auVar140,auVar240,1);
  auVar140 = vblendvps_avx(auVar303,auVar240,auVar140);
  auVar180._0_4_ = fVar221 * auVar18._0_4_ + fVar239 * auVar145._0_4_ + auVar19._0_4_ * fVar133;
  auVar180._4_4_ = fVar236 * auVar18._4_4_ + fVar256 * auVar145._4_4_ + auVar19._4_4_ * fVar134;
  auVar180._8_4_ = fVar237 * auVar18._8_4_ + fVar257 * auVar145._8_4_ + auVar19._8_4_ * fVar168;
  auVar180._12_4_ = fVar238 * auVar18._12_4_ + fVar258 * auVar145._12_4_ + auVar19._12_4_ * fVar170;
  auVar141 = vrcpps_avx(auVar225);
  fVar221 = auVar141._0_4_;
  auVar222._0_4_ = fVar221 * auVar225._0_4_;
  fVar236 = auVar141._4_4_;
  auVar222._4_4_ = fVar236 * auVar225._4_4_;
  fVar237 = auVar141._8_4_;
  auVar222._8_4_ = fVar237 * auVar225._8_4_;
  fVar238 = auVar141._12_4_;
  auVar222._12_4_ = fVar238 * auVar225._12_4_;
  auVar280._8_4_ = 0x3f800000;
  auVar280._0_8_ = &DAT_3f8000003f800000;
  auVar280._12_4_ = 0x3f800000;
  auVar225 = vsubps_avx(auVar280,auVar222);
  fVar221 = fVar221 + fVar221 * auVar225._0_4_;
  fVar236 = fVar236 + fVar236 * auVar225._4_4_;
  fVar237 = fVar237 + fVar237 * auVar225._8_4_;
  fVar238 = fVar238 + fVar238 * auVar225._12_4_;
  auVar225 = vrcpps_avx(auVar112);
  fVar239 = auVar225._0_4_;
  auVar262._0_4_ = fVar239 * auVar112._0_4_;
  fVar256 = auVar225._4_4_;
  auVar262._4_4_ = fVar256 * auVar112._4_4_;
  fVar257 = auVar225._8_4_;
  auVar262._8_4_ = fVar257 * auVar112._8_4_;
  fVar258 = auVar225._12_4_;
  auVar262._12_4_ = fVar258 * auVar112._12_4_;
  auVar225 = vsubps_avx(auVar280,auVar262);
  fVar239 = fVar239 + fVar239 * auVar225._0_4_;
  fVar256 = fVar256 + fVar256 * auVar225._4_4_;
  fVar257 = fVar257 + fVar257 * auVar225._8_4_;
  fVar258 = fVar258 + fVar258 * auVar225._12_4_;
  auVar225 = vrcpps_avx(auVar140);
  fVar261 = auVar225._0_4_;
  auVar304._0_4_ = fVar261 * auVar140._0_4_;
  fVar274 = auVar225._4_4_;
  auVar304._4_4_ = fVar274 * auVar140._4_4_;
  fVar275 = auVar225._8_4_;
  auVar304._8_4_ = fVar275 * auVar140._8_4_;
  fVar276 = auVar225._12_4_;
  auVar304._12_4_ = fVar276 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar280,auVar304);
  fVar261 = fVar261 + fVar261 * auVar140._0_4_;
  fVar274 = fVar274 + fVar274 * auVar140._4_4_;
  fVar275 = fVar275 + fVar275 * auVar140._8_4_;
  fVar276 = fVar276 + fVar276 * auVar140._12_4_;
  auVar140 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar103 + 0x16)) *
                           *(float *)(prim + lVar103 + 0x1a)));
  auVar112 = vshufps_avx(auVar140,auVar140,0);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar104 * 7 + 6);
  auVar140 = vpmovsxwd_avx(auVar140);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar104 * 0xb + 6);
  auVar225 = vpmovsxwd_avx(auVar225);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar141 = vsubps_avx(auVar225,auVar140);
  fVar133 = auVar112._0_4_;
  fVar134 = auVar112._4_4_;
  fVar168 = auVar112._8_4_;
  fVar170 = auVar112._12_4_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar104 * 9 + 6);
  auVar225 = vpmovsxwd_avx(auVar112);
  auVar305._0_4_ = auVar141._0_4_ * fVar133 + auVar140._0_4_;
  auVar305._4_4_ = auVar141._4_4_ * fVar134 + auVar140._4_4_;
  auVar305._8_4_ = auVar141._8_4_ * fVar168 + auVar140._8_4_;
  auVar305._12_4_ = auVar141._12_4_ * fVar170 + auVar140._12_4_;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar104 * 0xd + 6);
  auVar112 = vpmovsxwd_avx(auVar141);
  auVar140 = vcvtdq2ps_avx(auVar225);
  auVar225 = vcvtdq2ps_avx(auVar112);
  auVar225 = vsubps_avx(auVar225,auVar140);
  auVar335._0_4_ = auVar225._0_4_ * fVar133 + auVar140._0_4_;
  auVar335._4_4_ = auVar225._4_4_ * fVar134 + auVar140._4_4_;
  auVar335._8_4_ = auVar225._8_4_ * fVar168 + auVar140._8_4_;
  auVar335._12_4_ = auVar225._12_4_ * fVar170 + auVar140._12_4_;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar104 * 0x12 + 6);
  auVar140 = vpmovsxwd_avx(auVar142);
  uVar100 = (ulong)(uint)((int)(uVar104 * 5) << 2);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar104 * 2 + uVar100 + 6);
  auVar225 = vpmovsxwd_avx(auVar17);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar140);
  auVar363._0_4_ = auVar225._0_4_ * fVar133 + auVar140._0_4_;
  auVar363._4_4_ = auVar225._4_4_ * fVar134 + auVar140._4_4_;
  auVar363._8_4_ = auVar225._8_4_ * fVar168 + auVar140._8_4_;
  auVar363._12_4_ = auVar225._12_4_ * fVar170 + auVar140._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar100 + 6);
  auVar140 = vpmovsxwd_avx(auVar18);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar104 * 0x18 + 6);
  auVar225 = vpmovsxwd_avx(auVar145);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar112 = vsubps_avx(auVar225,auVar140);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar104 * 0x1d + 6);
  auVar225 = vpmovsxwd_avx(auVar19);
  auVar386._0_4_ = auVar112._0_4_ * fVar133 + auVar140._0_4_;
  auVar386._4_4_ = auVar112._4_4_ * fVar134 + auVar140._4_4_;
  auVar386._8_4_ = auVar112._8_4_ * fVar168 + auVar140._8_4_;
  auVar386._12_4_ = auVar112._12_4_ * fVar170 + auVar140._12_4_;
  auVar140 = vcvtdq2ps_avx(auVar225);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar104 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar225 = vpmovsxwd_avx(auVar20);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar140);
  auVar391._0_4_ = auVar225._0_4_ * fVar133 + auVar140._0_4_;
  auVar391._4_4_ = auVar225._4_4_ * fVar134 + auVar140._4_4_;
  auVar391._8_4_ = auVar225._8_4_ * fVar168 + auVar140._8_4_;
  auVar391._12_4_ = auVar225._12_4_ * fVar170 + auVar140._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar104) + 6);
  auVar140 = vpmovsxwd_avx(auVar21);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar104 * 0x23 + 6);
  auVar225 = vpmovsxwd_avx(auVar22);
  auVar225 = vcvtdq2ps_avx(auVar225);
  auVar225 = vsubps_avx(auVar225,auVar140);
  auVar281._0_4_ = auVar140._0_4_ + auVar225._0_4_ * fVar133;
  auVar281._4_4_ = auVar140._4_4_ + auVar225._4_4_ * fVar134;
  auVar281._8_4_ = auVar140._8_4_ + auVar225._8_4_ * fVar168;
  auVar281._12_4_ = auVar140._12_4_ + auVar225._12_4_ * fVar170;
  auVar140 = vsubps_avx(auVar305,auVar136);
  auVar306._0_4_ = fVar221 * auVar140._0_4_;
  auVar306._4_4_ = fVar236 * auVar140._4_4_;
  auVar306._8_4_ = fVar237 * auVar140._8_4_;
  auVar306._12_4_ = fVar238 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar335,auVar136);
  auVar137._0_4_ = fVar221 * auVar140._0_4_;
  auVar137._4_4_ = fVar236 * auVar140._4_4_;
  auVar137._8_4_ = fVar237 * auVar140._8_4_;
  auVar137._12_4_ = fVar238 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar363,auVar107);
  auVar223._0_4_ = fVar239 * auVar140._0_4_;
  auVar223._4_4_ = fVar256 * auVar140._4_4_;
  auVar223._8_4_ = fVar257 * auVar140._8_4_;
  auVar223._12_4_ = fVar258 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar386,auVar107);
  auVar108._0_4_ = fVar239 * auVar140._0_4_;
  auVar108._4_4_ = fVar256 * auVar140._4_4_;
  auVar108._8_4_ = fVar257 * auVar140._8_4_;
  auVar108._12_4_ = fVar258 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar391,auVar180);
  auVar241._0_4_ = fVar261 * auVar140._0_4_;
  auVar241._4_4_ = fVar274 * auVar140._4_4_;
  auVar241._8_4_ = fVar275 * auVar140._8_4_;
  auVar241._12_4_ = fVar276 * auVar140._12_4_;
  auVar140 = vsubps_avx(auVar281,auVar180);
  auVar181._0_4_ = fVar261 * auVar140._0_4_;
  auVar181._4_4_ = fVar274 * auVar140._4_4_;
  auVar181._8_4_ = fVar275 * auVar140._8_4_;
  auVar181._12_4_ = fVar276 * auVar140._12_4_;
  auVar140 = vpminsd_avx(auVar306,auVar137);
  auVar225 = vpminsd_avx(auVar223,auVar108);
  auVar140 = vmaxps_avx(auVar140,auVar225);
  auVar225 = vpminsd_avx(auVar241,auVar181);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar336._4_4_ = uVar8;
  auVar336._0_4_ = uVar8;
  auVar336._8_4_ = uVar8;
  auVar336._12_4_ = uVar8;
  auVar225 = vmaxps_avx(auVar225,auVar336);
  auVar140 = vmaxps_avx(auVar140,auVar225);
  local_4f0._0_4_ = auVar140._0_4_ * 0.99999964;
  local_4f0._4_4_ = auVar140._4_4_ * 0.99999964;
  local_4f0._8_4_ = auVar140._8_4_ * 0.99999964;
  local_4f0._12_4_ = auVar140._12_4_ * 0.99999964;
  auVar140 = vpmaxsd_avx(auVar306,auVar137);
  auVar225 = vpmaxsd_avx(auVar223,auVar108);
  auVar140 = vminps_avx(auVar140,auVar225);
  auVar225 = vpmaxsd_avx(auVar241,auVar181);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar182._4_4_ = uVar8;
  auVar182._0_4_ = uVar8;
  auVar182._8_4_ = uVar8;
  auVar182._12_4_ = uVar8;
  auVar225 = vminps_avx(auVar225,auVar182);
  auVar140 = vminps_avx(auVar140,auVar225);
  auVar109._0_4_ = auVar140._0_4_ * 1.0000004;
  auVar109._4_4_ = auVar140._4_4_ * 1.0000004;
  auVar109._8_4_ = auVar140._8_4_ * 1.0000004;
  auVar109._12_4_ = auVar140._12_4_ * 1.0000004;
  auVar140 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar225 = vpcmpgtd_avx(auVar140,_DAT_01ff0cf0);
  auVar140 = vcmpps_avx(local_4f0,auVar109,2);
  auVar140 = vandps_avx(auVar140,auVar225);
  uVar99 = vmovmskps_avx(auVar140);
  if (uVar99 == 0) {
    return;
  }
  auVar121._16_16_ = mm_lookupmask_ps._240_16_;
  auVar121._0_16_ = mm_lookupmask_ps._240_16_;
  uVar99 = uVar99 & 0xff;
  local_260 = vblendps_avx(auVar121,ZEXT832(0) << 0x20,0x80);
  local_9b0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar311 = ZEXT464(0) << 0x20;
  local_8b0 = prim;
LAB_0106cc9a:
  local_8a8 = (ulong)uVar99;
  lVar103 = 0;
  if (local_8a8 != 0) {
    for (; (uVar99 >> lVar103 & 1) == 0; lVar103 = lVar103 + 1) {
    }
  }
  uVar99 = *(uint *)(local_8b0 + 2);
  local_9a8 = (ulong)*(uint *)(local_8b0 + lVar103 * 4 + 6);
  pGVar11 = (context->scene->geometries).items[uVar99].ptr;
  uVar104 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                            local_9a8 *
                            pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar133 = (pGVar11->time_range).lower;
  fVar133 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar133) / ((pGVar11->time_range).upper - fVar133));
  auVar140 = vroundss_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),9);
  auVar140 = vminss_avx(auVar140,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar140 = vmaxss_avx(auVar311._0_16_,auVar140);
  fVar133 = fVar133 - auVar140._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar101 = (long)(int)auVar140._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + lVar101);
  lVar14 = *(long *)(_Var12 + 0x10 + lVar101);
  auVar140 = vshufps_avx(ZEXT416((uint)(1.0 - fVar133)),ZEXT416((uint)(1.0 - fVar133)),0);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar104);
  fVar221 = auVar140._0_4_;
  fVar236 = auVar140._4_4_;
  fVar237 = auVar140._8_4_;
  fVar238 = auVar140._12_4_;
  pfVar2 = (float *)(lVar13 + lVar14 * (uVar104 + 1));
  pfVar3 = (float *)(lVar13 + lVar14 * (uVar104 + 2));
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar104 + 3));
  lVar13 = *(long *)(_Var12 + 0x38 + lVar101);
  lVar14 = *(long *)(_Var12 + 0x48 + lVar101);
  auVar140 = vshufps_avx(ZEXT416((uint)fVar133),ZEXT416((uint)fVar133),0);
  pfVar5 = (float *)(lVar13 + uVar104 * lVar14);
  fVar239 = auVar140._0_4_;
  fVar256 = auVar140._4_4_;
  fVar257 = auVar140._8_4_;
  fVar258 = auVar140._12_4_;
  pfVar6 = (float *)(lVar13 + (uVar104 + 1) * lVar14);
  pfVar7 = (float *)(lVar13 + (uVar104 + 2) * lVar14);
  auVar224._0_4_ = fVar239 * *pfVar5 + fVar221 * *pfVar1;
  auVar224._4_4_ = fVar256 * pfVar5[1] + fVar236 * pfVar1[1];
  auVar224._8_4_ = fVar257 * pfVar5[2] + fVar237 * pfVar1[2];
  auVar224._12_4_ = fVar258 * pfVar5[3] + fVar238 * pfVar1[3];
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar225 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar133 = *(float *)(ray + k * 4 + 0x40);
  auVar387._4_4_ = fVar133;
  auVar387._0_4_ = fVar133;
  auVar387._8_4_ = fVar133;
  auVar387._12_4_ = fVar133;
  fStack_7b0 = fVar133;
  _local_7c0 = auVar387;
  fStack_7ac = fVar133;
  fStack_7a8 = fVar133;
  fStack_7a4 = fVar133;
  auVar389 = ZEXT3264(_local_7c0);
  fVar134 = *(float *)(ray + k * 4 + 0x50);
  auVar392._4_4_ = fVar134;
  auVar392._0_4_ = fVar134;
  auVar392._8_4_ = fVar134;
  auVar392._12_4_ = fVar134;
  fStack_7d0 = fVar134;
  _local_7e0 = auVar392;
  fStack_7cc = fVar134;
  fStack_7c8 = fVar134;
  fStack_7c4 = fVar134;
  auVar394 = ZEXT3264(_local_7e0);
  auVar183._0_4_ = fVar221 * *pfVar2 + fVar239 * *pfVar6;
  auVar183._4_4_ = fVar236 * pfVar2[1] + fVar256 * pfVar6[1];
  auVar183._8_4_ = fVar237 * pfVar2[2] + fVar257 * pfVar6[2];
  auVar183._12_4_ = fVar238 * pfVar2[3] + fVar258 * pfVar6[3];
  auVar140 = vunpcklps_avx(auVar387,auVar392);
  fVar168 = *(float *)(ray + k * 4 + 0x60);
  auVar399._4_4_ = fVar168;
  auVar399._0_4_ = fVar168;
  auVar399._8_4_ = fVar168;
  auVar399._12_4_ = fVar168;
  fStack_7f0 = fVar168;
  _local_800 = auVar399;
  fStack_7ec = fVar168;
  fStack_7e8 = fVar168;
  fStack_7e4 = fVar168;
  auVar403 = ZEXT3264(_local_800);
  _local_910 = vinsertps_avx(auVar140,auVar399,0x28);
  auVar110._0_4_ = (auVar224._0_4_ + auVar183._0_4_) * 0.5;
  auVar110._4_4_ = (auVar224._4_4_ + auVar183._4_4_) * 0.5;
  auVar110._8_4_ = (auVar224._8_4_ + auVar183._8_4_) * 0.5;
  auVar110._12_4_ = (auVar224._12_4_ + auVar183._12_4_) * 0.5;
  auVar140 = vsubps_avx(auVar110,auVar225);
  auVar140 = vdpps_avx(auVar140,_local_910,0x7f);
  local_920 = vdpps_avx(_local_910,_local_910,0x7f);
  auVar138._0_4_ = fVar221 * *pfVar3 + fVar239 * *pfVar7;
  auVar138._4_4_ = fVar236 * pfVar3[1] + fVar256 * pfVar7[1];
  auVar138._8_4_ = fVar237 * pfVar3[2] + fVar257 * pfVar7[2];
  auVar138._12_4_ = fVar238 * pfVar3[3] + fVar258 * pfVar7[3];
  auVar112 = vrcpss_avx(local_920,local_920);
  fVar170 = auVar140._0_4_ * auVar112._0_4_ * (2.0 - local_920._0_4_ * auVar112._0_4_);
  auVar112 = vshufps_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),0);
  auVar282._0_4_ = auVar225._0_4_ + local_910._0_4_ * auVar112._0_4_;
  auVar282._4_4_ = auVar225._4_4_ + local_910._4_4_ * auVar112._4_4_;
  auVar282._8_4_ = auVar225._8_4_ + local_910._8_4_ * auVar112._8_4_;
  auVar282._12_4_ = auVar225._12_4_ + local_910._12_4_ * auVar112._12_4_;
  auVar140 = vblendps_avx(auVar282,_DAT_01feba10,8);
  _local_a40 = vsubps_avx(auVar224,auVar140);
  auVar340 = ZEXT1664(_local_a40);
  _local_a50 = vsubps_avx(auVar138,auVar140);
  pfVar1 = (float *)(lVar13 + lVar14 * (uVar104 + 3));
  auVar139._0_4_ = fVar221 * *pfVar4 + fVar239 * *pfVar1;
  auVar139._4_4_ = fVar236 * pfVar4[1] + fVar256 * pfVar1[1];
  auVar139._8_4_ = fVar237 * pfVar4[2] + fVar257 * pfVar1[2];
  auVar139._12_4_ = fVar238 * pfVar4[3] + fVar258 * pfVar1[3];
  auVar255 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  _local_a60 = vsubps_avx(auVar183,auVar140);
  auVar419 = ZEXT1664(_local_a60);
  _local_a70 = vsubps_avx(auVar139,auVar140);
  auVar140 = vshufps_avx(_local_a40,_local_a40,0);
  register0x00001250 = auVar140;
  _local_360 = auVar140;
  auVar140 = vshufps_avx(_local_a40,_local_a40,0x55);
  register0x00001250 = auVar140;
  _local_1a0 = auVar140;
  auVar140 = vshufps_avx(_local_a40,_local_a40,0xaa);
  register0x00001250 = auVar140;
  _local_1c0 = auVar140;
  auVar140 = vshufps_avx(_local_a40,_local_a40,0xff);
  register0x00001290 = auVar140;
  _local_1e0 = auVar140;
  auVar140 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001290 = auVar140;
  _local_380 = auVar140;
  auVar140 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001290 = auVar140;
  _local_3a0 = auVar140;
  auVar140 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001290 = auVar140;
  _local_3c0 = auVar140;
  auVar140 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar140;
  _local_200 = auVar140;
  auVar140 = vshufps_avx(_local_a50,_local_a50,0);
  register0x00001290 = auVar140;
  _local_3e0 = auVar140;
  auVar140 = vshufps_avx(_local_a50,_local_a50,0x55);
  register0x00001290 = auVar140;
  _local_400 = auVar140;
  auVar140 = vshufps_avx(_local_a50,_local_a50,0xaa);
  register0x00001290 = auVar140;
  _local_420 = auVar140;
  auVar140 = vshufps_avx(_local_a50,_local_a50,0xff);
  register0x00001290 = auVar140;
  _local_440 = auVar140;
  auVar140 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar140;
  _local_460 = auVar140;
  auVar140 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar140;
  _local_480 = auVar140;
  auVar140 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar140;
  _local_4a0 = auVar140;
  auVar140 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar140;
  _local_220 = auVar140;
  auVar140 = ZEXT416((uint)(fVar133 * fVar133 + fVar134 * fVar134 + fVar168 * fVar168));
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  local_240._16_16_ = auVar140;
  local_240._0_16_ = auVar140;
  fVar133 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar170);
  auVar140 = vshufps_avx(ZEXT416((uint)(fVar133 - fVar170)),ZEXT416((uint)(fVar133 - fVar170)),0);
  local_280._16_16_ = auVar140;
  local_280._0_16_ = auVar140;
  local_750 = vpshufd_avx(ZEXT416(uVar99),0);
  local_760 = vpshufd_avx(ZEXT416(*(uint *)(local_8b0 + lVar103 * 4 + 6)),0);
  register0x00001390 = auVar112;
  _local_860 = auVar112;
  uVar100 = 0;
  uVar104 = 1;
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_240,auVar122);
  auVar140 = vsqrtss_avx(local_920,local_920);
  local_b04 = auVar140._0_4_;
  auVar140 = vsqrtss_avx(local_920,local_920);
  local_b08 = auVar140._0_4_;
  local_8d0 = 0x3f80000000000000;
  uStack_8c8 = 0;
  do {
    auVar95._8_8_ = uStack_8c8;
    auVar95._0_8_ = local_8d0;
    auVar140 = vmovshdup_avx(auVar95);
    fVar256 = auVar140._0_4_ - (float)local_8d0;
    auVar140 = vshufps_avx(auVar95,auVar95,0);
    local_960._16_16_ = auVar140;
    local_960._0_16_ = auVar140;
    auVar225 = vshufps_avx(ZEXT416((uint)fVar256),ZEXT416((uint)fVar256),0);
    local_980._16_16_ = auVar225;
    local_980._0_16_ = auVar225;
    fVar424 = auVar225._0_4_;
    fVar426 = auVar225._4_4_;
    fVar429 = auVar225._8_4_;
    fVar172 = auVar225._12_4_;
    fVar277 = auVar140._0_4_;
    auVar231._0_4_ = fVar277 + fVar424 * 0.0;
    fVar412 = auVar140._4_4_;
    auVar231._4_4_ = fVar412 + fVar426 * 0.14285715;
    fVar422 = auVar140._8_4_;
    auVar231._8_4_ = fVar422 + fVar429 * 0.2857143;
    fStack_b44 = auVar140._12_4_;
    auVar231._12_4_ = fStack_b44 + fVar172 * 0.42857146;
    auVar231._16_4_ = fVar277 + fVar424 * 0.5714286;
    auVar231._20_4_ = fVar412 + fVar426 * 0.71428573;
    auVar231._24_4_ = fVar422 + fVar429 * 0.8571429;
    auVar231._28_4_ = fStack_b44 + fVar172;
    auVar121 = vsubps_avx(auVar255._0_32_,auVar231);
    local_b60._4_4_ = auVar231._4_4_ * auVar231._4_4_;
    local_b60._0_4_ = auVar231._0_4_ * auVar231._0_4_;
    fStack_b58 = auVar231._8_4_ * auVar231._8_4_;
    fStack_b54 = auVar231._12_4_ * auVar231._12_4_;
    fStack_b50 = auVar231._16_4_ * auVar231._16_4_;
    fStack_b4c = auVar231._20_4_ * auVar231._20_4_;
    fStack_b48 = auVar231._24_4_ * auVar231._24_4_;
    fVar258 = auVar231._0_4_ * 3.0;
    fVar261 = auVar231._4_4_ * 3.0;
    fVar274 = auVar231._8_4_ * 3.0;
    fVar275 = auVar231._12_4_ * 3.0;
    fVar276 = auVar231._16_4_ * 3.0;
    fVar259 = auVar231._20_4_ * 3.0;
    fVar260 = auVar231._24_4_ * 3.0;
    fVar329 = auVar255._28_4_ + -5.0;
    fVar168 = auVar121._0_4_;
    auVar311._0_4_ = fVar168 * fVar168;
    fVar170 = auVar121._4_4_;
    auVar311._4_4_ = fVar170 * fVar170;
    fVar221 = auVar121._8_4_;
    auVar311._8_4_ = fVar221 * fVar221;
    fVar236 = auVar121._12_4_;
    auVar311._12_4_ = fVar236 * fVar236;
    fVar237 = auVar121._16_4_;
    auVar311._16_4_ = fVar237 * fVar237;
    fVar238 = auVar121._20_4_;
    auVar311._20_4_ = fVar238 * fVar238;
    fVar239 = auVar121._24_4_;
    auVar311._28_36_ = auVar340._28_36_;
    auVar311._24_4_ = fVar239 * fVar239;
    fVar257 = auVar121._28_4_;
    fVar278 = (auVar311._0_4_ * (fVar168 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar288 = (auVar311._4_4_ * (fVar170 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar290 = (auVar311._8_4_ * (fVar221 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar292 = (auVar311._12_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar294 = (auVar311._16_4_ * (fVar237 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar296 = (auVar311._20_4_ * (fVar238 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar298 = (auVar311._24_4_ * (fVar239 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar360 = -fVar168 * auVar231._0_4_ * auVar231._0_4_ * 0.5;
    fVar367 = -fVar170 * auVar231._4_4_ * auVar231._4_4_ * 0.5;
    fVar370 = -fVar221 * auVar231._8_4_ * auVar231._8_4_ * 0.5;
    fVar373 = -fVar236 * auVar231._12_4_ * auVar231._12_4_ * 0.5;
    fVar376 = -fVar237 * auVar231._16_4_ * auVar231._16_4_ * 0.5;
    fVar379 = -fVar238 * auVar231._20_4_ * auVar231._20_4_ * 0.5;
    fVar382 = -fVar239 * auVar231._24_4_ * auVar231._24_4_ * 0.5;
    fVar134 = auVar419._28_4_;
    fVar390 = auVar389._28_4_ + fVar134;
    fVar396 = auVar394._28_4_ + fVar134;
    fVar410 = (auVar231._0_4_ * auVar231._0_4_ * (fVar258 + -5.0) + 2.0) * 0.5;
    fVar420 = (auVar231._4_4_ * auVar231._4_4_ * (fVar261 + -5.0) + 2.0) * 0.5;
    fVar423 = (auVar231._8_4_ * auVar231._8_4_ * (fVar274 + -5.0) + 2.0) * 0.5;
    fVar425 = (auVar231._12_4_ * auVar231._12_4_ * (fVar275 + -5.0) + 2.0) * 0.5;
    fVar427 = (auVar231._16_4_ * auVar231._16_4_ * (fVar276 + -5.0) + 2.0) * 0.5;
    fVar428 = (auVar231._20_4_ * auVar231._20_4_ * (fVar259 + -5.0) + 2.0) * 0.5;
    fVar430 = (auVar231._24_4_ * auVar231._24_4_ * (fVar260 + -5.0) + 2.0) * 0.5;
    fVar385 = -fVar257 + fVar390;
    fVar397 = -auVar231._0_4_ * fVar168 * fVar168 * 0.5;
    fVar404 = -auVar231._4_4_ * fVar170 * fVar170 * 0.5;
    fVar405 = -auVar231._8_4_ * fVar221 * fVar221 * 0.5;
    fVar406 = -auVar231._12_4_ * fVar236 * fVar236 * 0.5;
    fVar407 = -auVar231._16_4_ * fVar237 * fVar237 * 0.5;
    fVar408 = -auVar231._20_4_ * fVar238 * fVar238 * 0.5;
    fVar409 = -auVar231._24_4_ * fVar239 * fVar239 * 0.5;
    fVar177 = fVar397 * (float)local_360._0_4_ +
              fVar410 * (float)local_380._0_4_ +
              fVar360 * (float)local_460._0_4_ + fVar278 * (float)local_3e0._0_4_;
    fVar200 = fVar404 * (float)local_360._4_4_ +
              fVar420 * (float)local_380._4_4_ +
              fVar367 * (float)local_460._4_4_ + fVar288 * (float)local_3e0._4_4_;
    fVar203 = fVar405 * fStack_358 +
              fVar423 * fStack_378 + fVar370 * fStack_458 + fVar290 * fStack_3d8;
    fVar206 = fVar406 * fStack_354 +
              fVar425 * fStack_374 + fVar373 * fStack_454 + fVar292 * fStack_3d4;
    fVar209 = fVar407 * fStack_350 +
              fVar427 * fStack_370 + fVar376 * fStack_450 + fVar294 * fStack_3d0;
    fVar212 = fVar408 * fStack_34c +
              fVar428 * fStack_36c + fVar379 * fStack_44c + fVar296 * fStack_3cc;
    fVar215 = fVar409 * fStack_348 +
              fVar430 * fStack_368 + fVar382 * fStack_448 + fVar298 * fStack_3c8;
    fVar218 = fVar134 + 2.0 + fVar385;
    fVar178 = (float)local_1a0._0_4_ * fVar397 +
              fVar410 * (float)local_3a0._0_4_ +
              fVar360 * (float)local_480._0_4_ + fVar278 * (float)local_400._0_4_;
    fVar201 = (float)local_1a0._4_4_ * fVar404 +
              fVar420 * (float)local_3a0._4_4_ +
              fVar367 * (float)local_480._4_4_ + fVar288 * (float)local_400._4_4_;
    fVar204 = fStack_198 * fVar405 +
              fVar423 * fStack_398 + fVar370 * fStack_478 + fVar290 * fStack_3f8;
    fVar207 = fStack_194 * fVar406 +
              fVar425 * fStack_394 + fVar373 * fStack_474 + fVar292 * fStack_3f4;
    fVar210 = fStack_190 * fVar407 +
              fVar427 * fStack_390 + fVar376 * fStack_470 + fVar294 * fStack_3f0;
    fVar213 = fStack_18c * fVar408 +
              fVar428 * fStack_38c + fVar379 * fStack_46c + fVar296 * fStack_3ec;
    fVar216 = fStack_188 * fVar409 +
              fVar430 * fStack_388 + fVar382 * fStack_468 + fVar298 * fStack_3e8;
    fVar219 = fVar385 + fVar390 + fVar396;
    fVar179 = (float)local_1c0._0_4_ * fVar397 +
              fVar410 * (float)local_3c0._0_4_ +
              fVar360 * (float)local_4a0._0_4_ + fVar278 * (float)local_420._0_4_;
    fVar202 = (float)local_1c0._4_4_ * fVar404 +
              fVar420 * (float)local_3c0._4_4_ +
              fVar367 * (float)local_4a0._4_4_ + fVar288 * (float)local_420._4_4_;
    fVar205 = fStack_1b8 * fVar405 +
              fVar423 * fStack_3b8 + fVar370 * fStack_498 + fVar290 * fStack_418;
    fVar208 = fStack_1b4 * fVar406 +
              fVar425 * fStack_3b4 + fVar373 * fStack_494 + fVar292 * fStack_414;
    fVar211 = fStack_1b0 * fVar407 +
              fVar427 * fStack_3b0 + fVar376 * fStack_490 + fVar294 * fStack_410;
    fVar214 = fStack_1ac * fVar408 +
              fVar428 * fStack_3ac + fVar379 * fStack_48c + fVar296 * fStack_40c;
    fVar217 = fStack_1a8 * fVar409 +
              fVar430 * fStack_3a8 + fVar382 * fStack_488 + fVar298 * fStack_408;
    fVar220 = fVar385 + fVar396 + auVar403._28_4_ + fVar134;
    local_7a0._0_4_ =
         (float)local_1e0._0_4_ * fVar397 +
         (float)local_200._0_4_ * fVar410 +
         fVar360 * (float)local_220._0_4_ + fVar278 * (float)local_440._0_4_;
    local_7a0._4_4_ =
         (float)local_1e0._4_4_ * fVar404 +
         (float)local_200._4_4_ * fVar420 +
         fVar367 * (float)local_220._4_4_ + fVar288 * (float)local_440._4_4_;
    local_7a0._8_4_ =
         fStack_1d8 * fVar405 + fStack_1f8 * fVar423 + fVar370 * fStack_218 + fVar290 * fStack_438;
    local_7a0._12_4_ =
         fStack_1d4 * fVar406 + fStack_1f4 * fVar425 + fVar373 * fStack_214 + fVar292 * fStack_434;
    local_7a0._16_4_ =
         fStack_1d0 * fVar407 + fStack_1f0 * fVar427 + fVar376 * fStack_210 + fVar294 * fStack_430;
    local_7a0._20_4_ =
         fStack_1cc * fVar408 + fStack_1ec * fVar428 + fVar379 * fStack_20c + fVar296 * fStack_42c;
    local_7a0._24_4_ =
         fStack_1c8 * fVar409 + fStack_1e8 * fVar430 + fVar382 * fStack_208 + fVar298 * fStack_428;
    local_7a0._28_4_ = fVar385 + fVar134 + 2.0 + -fVar257 + 0.0;
    fVar397 = fVar257 + fVar257;
    auVar24._4_4_ = (fVar170 + fVar170) * auVar231._4_4_;
    auVar24._0_4_ = (fVar168 + fVar168) * auVar231._0_4_;
    auVar24._8_4_ = (fVar221 + fVar221) * auVar231._8_4_;
    auVar24._12_4_ = (fVar236 + fVar236) * auVar231._12_4_;
    auVar24._16_4_ = (fVar237 + fVar237) * auVar231._16_4_;
    auVar24._20_4_ = (fVar238 + fVar238) * auVar231._20_4_;
    auVar24._24_4_ = (fVar239 + fVar239) * auVar231._24_4_;
    auVar24._28_4_ = auVar231._28_4_ + auVar231._28_4_;
    auVar121 = vsubps_avx(auVar24,auVar311._0_32_);
    fVar278 = auVar255._28_4_ + 2.0;
    auVar23._4_4_ = (fVar170 + fVar170) * (fVar261 + 2.0);
    auVar23._0_4_ = (fVar168 + fVar168) * (fVar258 + 2.0);
    auVar23._8_4_ = (fVar221 + fVar221) * (fVar274 + 2.0);
    auVar23._12_4_ = (fVar236 + fVar236) * (fVar275 + 2.0);
    auVar23._16_4_ = (fVar237 + fVar237) * (fVar276 + 2.0);
    auVar23._20_4_ = (fVar238 + fVar238) * (fVar259 + 2.0);
    auVar23._24_4_ = (fVar239 + fVar239) * (fVar260 + 2.0);
    auVar23._28_4_ = fVar278;
    auVar25._4_4_ = fVar170 * fVar170 * 3.0;
    auVar25._0_4_ = fVar168 * fVar168 * 3.0;
    auVar25._8_4_ = fVar221 * fVar221 * 3.0;
    auVar25._12_4_ = fVar236 * fVar236 * 3.0;
    auVar25._16_4_ = fVar237 * fVar237 * 3.0;
    auVar25._20_4_ = fVar238 * fVar238 * 3.0;
    auVar25._24_4_ = fVar239 * fVar239 * 3.0;
    auVar25._28_4_ = fVar257;
    auVar122 = vsubps_avx(auVar23,auVar25);
    auVar24 = vsubps_avx(_local_b60,auVar24);
    fVar373 = auVar121._0_4_ * 0.5;
    fVar376 = auVar121._4_4_ * 0.5;
    fVar379 = auVar121._8_4_ * 0.5;
    fVar382 = auVar121._12_4_ * 0.5;
    fVar385 = auVar121._16_4_ * 0.5;
    fVar390 = auVar121._20_4_ * 0.5;
    fVar396 = auVar121._24_4_ * 0.5;
    fVar292 = (auVar231._0_4_ * fVar258 + (auVar231._0_4_ + auVar231._0_4_) * (fVar258 + -5.0)) *
              0.5;
    fVar294 = (auVar231._4_4_ * fVar261 + (auVar231._4_4_ + auVar231._4_4_) * (fVar261 + -5.0)) *
              0.5;
    fVar296 = (auVar231._8_4_ * fVar274 + (auVar231._8_4_ + auVar231._8_4_) * (fVar274 + -5.0)) *
              0.5;
    fVar298 = (auVar231._12_4_ * fVar275 + (auVar231._12_4_ + auVar231._12_4_) * (fVar275 + -5.0)) *
              0.5;
    fVar360 = (auVar231._16_4_ * fVar276 + (auVar231._16_4_ + auVar231._16_4_) * (fVar276 + -5.0)) *
              0.5;
    fVar367 = (auVar231._20_4_ * fVar259 + (auVar231._20_4_ + auVar231._20_4_) * (fVar259 + -5.0)) *
              0.5;
    fVar370 = (auVar231._24_4_ * fVar260 + (auVar231._24_4_ + auVar231._24_4_) * (fVar260 + -5.0)) *
              0.5;
    fVar134 = auVar122._0_4_ * 0.5;
    fVar168 = auVar122._4_4_ * 0.5;
    fVar170 = auVar122._8_4_ * 0.5;
    fVar221 = auVar122._12_4_ * 0.5;
    fVar239 = auVar122._16_4_ * 0.5;
    fVar257 = auVar122._20_4_ * 0.5;
    fVar275 = auVar122._24_4_ * 0.5;
    fVar236 = auVar24._0_4_ * 0.5;
    fVar237 = auVar24._4_4_ * 0.5;
    fVar238 = auVar24._8_4_ * 0.5;
    fVar276 = auVar24._12_4_ * 0.5;
    fVar259 = auVar24._16_4_ * 0.5;
    fVar288 = auVar24._20_4_ * 0.5;
    fVar290 = auVar24._24_4_ * 0.5;
    fVar359 = fVar397 + auVar121._28_4_;
    fVar330 = fVar359 + fVar397 + fVar329;
    fVar278 = fVar278 + auVar231._28_4_ + fVar329 + auVar122._28_4_ + auVar24._28_4_;
    auVar140 = vpermilps_avx(ZEXT416((uint)(fVar256 * 0.04761905)),0);
    fVar261 = auVar140._0_4_;
    fVar300 = fVar261 * (fVar373 * (float)local_360._0_4_ +
                        fVar292 * (float)local_380._0_4_ +
                        fVar134 * (float)local_3e0._0_4_ + fVar236 * (float)local_460._0_4_);
    fVar274 = auVar140._4_4_;
    fVar312 = fVar274 * (fVar376 * (float)local_360._4_4_ +
                        fVar294 * (float)local_380._4_4_ +
                        fVar168 * (float)local_3e0._4_4_ + fVar237 * (float)local_460._4_4_);
    auVar29._4_4_ = fVar312;
    auVar29._0_4_ = fVar300;
    fVar260 = auVar140._8_4_;
    fVar314 = fVar260 * (fVar379 * fStack_358 +
                        fVar296 * fStack_378 + fVar170 * fStack_3d8 + fVar238 * fStack_458);
    auVar29._8_4_ = fVar314;
    fVar258 = auVar140._12_4_;
    fVar317 = fVar258 * (fVar382 * fStack_354 +
                        fVar298 * fStack_374 + fVar221 * fStack_3d4 + fVar276 * fStack_454);
    auVar29._12_4_ = fVar317;
    fVar320 = fVar261 * (fVar385 * fStack_350 +
                        fVar360 * fStack_370 + fVar239 * fStack_3d0 + fVar259 * fStack_450);
    auVar29._16_4_ = fVar320;
    fVar323 = fVar274 * (fVar390 * fStack_34c +
                        fVar367 * fStack_36c + fVar257 * fStack_3cc + fVar288 * fStack_44c);
    auVar29._20_4_ = fVar323;
    fVar326 = fVar260 * (fVar396 * fStack_348 +
                        fVar370 * fStack_368 + fVar275 * fStack_3c8 + fVar290 * fStack_448);
    auVar29._24_4_ = fVar326;
    auVar29._28_4_ = fVar330;
    fVar331 = fVar261 * ((float)local_1a0._0_4_ * fVar373 +
                        fVar292 * (float)local_3a0._0_4_ +
                        fVar134 * (float)local_400._0_4_ + fVar236 * (float)local_480._0_4_);
    fVar341 = fVar274 * ((float)local_1a0._4_4_ * fVar376 +
                        fVar294 * (float)local_3a0._4_4_ +
                        fVar168 * (float)local_400._4_4_ + fVar237 * (float)local_480._4_4_);
    local_900._4_4_ = fVar341;
    local_900._0_4_ = fVar331;
    fVar344 = fVar260 * (fStack_198 * fVar379 +
                        fVar296 * fStack_398 + fVar170 * fStack_3f8 + fVar238 * fStack_478);
    local_900._8_4_ = fVar344;
    fVar347 = fVar258 * (fStack_194 * fVar382 +
                        fVar298 * fStack_394 + fVar221 * fStack_3f4 + fVar276 * fStack_474);
    local_900._12_4_ = fVar347;
    fVar350 = fVar261 * (fStack_190 * fVar385 +
                        fVar360 * fStack_390 + fVar239 * fStack_3f0 + fVar259 * fStack_470);
    local_900._16_4_ = fVar350;
    fVar353 = fVar274 * (fStack_18c * fVar390 +
                        fVar367 * fStack_38c + fVar257 * fStack_3ec + fVar288 * fStack_46c);
    local_900._20_4_ = fVar353;
    fVar356 = fVar260 * (fStack_188 * fVar396 +
                        fVar370 * fStack_388 + fVar275 * fStack_3e8 + fVar290 * fStack_468);
    local_900._24_4_ = fVar356;
    local_900._28_4_ = fVar359;
    fVar361 = fVar261 * ((float)local_1c0._0_4_ * fVar373 +
                        fVar134 * (float)local_420._0_4_ + fVar236 * (float)local_4a0._0_4_ +
                        fVar292 * (float)local_3c0._0_4_);
    fVar368 = fVar274 * ((float)local_1c0._4_4_ * fVar376 +
                        fVar168 * (float)local_420._4_4_ + fVar237 * (float)local_4a0._4_4_ +
                        fVar294 * (float)local_3c0._4_4_);
    auVar32._4_4_ = fVar368;
    auVar32._0_4_ = fVar361;
    fVar371 = fVar260 * (fStack_1b8 * fVar379 +
                        fVar170 * fStack_418 + fVar238 * fStack_498 + fVar296 * fStack_3b8);
    auVar32._8_4_ = fVar371;
    fVar374 = fVar258 * (fStack_1b4 * fVar382 +
                        fVar221 * fStack_414 + fVar276 * fStack_494 + fVar298 * fStack_3b4);
    auVar32._12_4_ = fVar374;
    fVar377 = fVar261 * (fStack_1b0 * fVar385 +
                        fVar239 * fStack_410 + fVar259 * fStack_490 + fVar360 * fStack_3b0);
    auVar32._16_4_ = fVar377;
    fVar380 = fVar274 * (fStack_1ac * fVar390 +
                        fVar257 * fStack_40c + fVar288 * fStack_48c + fVar367 * fStack_3ac);
    auVar32._20_4_ = fVar380;
    fVar383 = fVar260 * (fStack_1a8 * fVar396 +
                        fVar275 * fStack_408 + fVar290 * fStack_488 + fVar370 * fStack_3a8);
    auVar32._24_4_ = fVar383;
    auVar32._28_4_ = fVar397;
    fVar236 = fVar261 * ((float)local_1e0._0_4_ * fVar373 +
                        (float)local_200._0_4_ * fVar292 +
                        fVar134 * (float)local_440._0_4_ + (float)local_220._0_4_ * fVar236);
    fVar237 = fVar274 * ((float)local_1e0._4_4_ * fVar376 +
                        (float)local_200._4_4_ * fVar294 +
                        fVar168 * (float)local_440._4_4_ + (float)local_220._4_4_ * fVar237);
    auVar26._4_4_ = fVar237;
    auVar26._0_4_ = fVar236;
    fVar238 = fVar260 * (fStack_1d8 * fVar379 +
                        fStack_1f8 * fVar296 + fVar170 * fStack_438 + fStack_218 * fVar238);
    auVar26._8_4_ = fVar238;
    fVar258 = fVar258 * (fStack_1d4 * fVar382 +
                        fStack_1f4 * fVar298 + fVar221 * fStack_434 + fStack_214 * fVar276);
    auVar26._12_4_ = fVar258;
    fVar261 = fVar261 * (fStack_1d0 * fVar385 +
                        fStack_1f0 * fVar360 + fVar239 * fStack_430 + fStack_210 * fVar259);
    auVar26._16_4_ = fVar261;
    fVar274 = fVar274 * (fStack_1cc * fVar390 +
                        fStack_1ec * fVar367 + fVar257 * fStack_42c + fStack_20c * fVar288);
    auVar26._20_4_ = fVar274;
    fVar260 = fVar260 * (fStack_1c8 * fVar396 +
                        fStack_1e8 * fVar370 + fVar275 * fStack_428 + fStack_208 * fVar290);
    auVar26._24_4_ = fVar260;
    auVar26._28_4_ = fVar278;
    auVar85._4_4_ = fVar201;
    auVar85._0_4_ = fVar178;
    auVar85._8_4_ = fVar204;
    auVar85._12_4_ = fVar207;
    auVar85._16_4_ = fVar210;
    auVar85._20_4_ = fVar213;
    auVar85._24_4_ = fVar216;
    auVar85._28_4_ = fVar219;
    auVar121 = vperm2f128_avx(auVar85,auVar85,1);
    auVar121 = vshufps_avx(auVar121,auVar85,0x30);
    local_9e0 = vshufps_avx(auVar85,auVar121,0x29);
    auVar87._4_4_ = fVar202;
    auVar87._0_4_ = fVar179;
    auVar87._8_4_ = fVar205;
    auVar87._12_4_ = fVar208;
    auVar87._16_4_ = fVar211;
    auVar87._20_4_ = fVar214;
    auVar87._24_4_ = fVar217;
    auVar87._28_4_ = fVar220;
    auVar121 = vperm2f128_avx(auVar87,auVar87,1);
    auVar121 = vshufps_avx(auVar121,auVar87,0x30);
    _local_a00 = vshufps_avx(auVar87,auVar121,0x29);
    auVar122 = vsubps_avx(local_7a0,auVar26);
    auVar121 = vperm2f128_avx(auVar122,auVar122,1);
    auVar121 = vshufps_avx(auVar121,auVar122,0x30);
    local_660 = vshufps_avx(auVar122,auVar121,0x29);
    _local_5a0 = vsubps_avx(local_9e0,auVar85);
    local_580 = vsubps_avx(_local_a00,auVar87);
    fVar168 = local_5a0._0_4_;
    fVar239 = local_5a0._4_4_;
    auVar27._4_4_ = fVar368 * fVar239;
    auVar27._0_4_ = fVar361 * fVar168;
    fVar275 = local_5a0._8_4_;
    auVar27._8_4_ = fVar371 * fVar275;
    fVar290 = local_5a0._12_4_;
    auVar27._12_4_ = fVar374 * fVar290;
    fVar367 = local_5a0._16_4_;
    auVar27._16_4_ = fVar377 * fVar367;
    fVar385 = local_5a0._20_4_;
    auVar27._20_4_ = fVar380 * fVar385;
    fVar405 = local_5a0._24_4_;
    auVar27._24_4_ = fVar383 * fVar405;
    auVar27._28_4_ = auVar122._28_4_;
    fVar170 = local_580._0_4_;
    fVar256 = local_580._4_4_;
    auVar28._4_4_ = fVar341 * fVar256;
    auVar28._0_4_ = fVar331 * fVar170;
    fVar276 = local_580._8_4_;
    auVar28._8_4_ = fVar344 * fVar276;
    fVar292 = local_580._12_4_;
    auVar28._12_4_ = fVar347 * fVar292;
    fVar370 = local_580._16_4_;
    auVar28._16_4_ = fVar350 * fVar370;
    fVar390 = local_580._20_4_;
    auVar28._20_4_ = fVar353 * fVar390;
    fVar406 = local_580._24_4_;
    auVar28._24_4_ = fVar356 * fVar406;
    auVar28._28_4_ = auVar121._28_4_;
    auVar24 = vsubps_avx(auVar28,auVar27);
    auVar89._4_4_ = fVar200;
    auVar89._0_4_ = fVar177;
    auVar89._8_4_ = fVar203;
    auVar89._12_4_ = fVar206;
    auVar89._16_4_ = fVar209;
    auVar89._20_4_ = fVar212;
    auVar89._24_4_ = fVar215;
    auVar89._28_4_ = fVar218;
    auVar121 = vperm2f128_avx(auVar89,auVar89,1);
    auVar121 = vshufps_avx(auVar121,auVar89,0x30);
    auVar23 = vshufps_avx(auVar89,auVar121,0x29);
    local_5c0 = vsubps_avx(auVar23,auVar89);
    auVar30._4_4_ = fVar312 * fVar256;
    auVar30._0_4_ = fVar300 * fVar170;
    auVar30._8_4_ = fVar314 * fVar276;
    auVar30._12_4_ = fVar317 * fVar292;
    auVar30._16_4_ = fVar320 * fVar370;
    auVar30._20_4_ = fVar323 * fVar390;
    auVar30._24_4_ = fVar326 * fVar406;
    auVar30._28_4_ = auVar23._28_4_;
    fVar221 = local_5c0._0_4_;
    fVar257 = local_5c0._4_4_;
    auVar31._4_4_ = fVar368 * fVar257;
    auVar31._0_4_ = fVar361 * fVar221;
    fVar259 = local_5c0._8_4_;
    auVar31._8_4_ = fVar371 * fVar259;
    fVar294 = local_5c0._12_4_;
    auVar31._12_4_ = fVar374 * fVar294;
    fVar373 = local_5c0._16_4_;
    auVar31._16_4_ = fVar377 * fVar373;
    fVar396 = local_5c0._20_4_;
    auVar31._20_4_ = fVar380 * fVar396;
    fVar407 = local_5c0._24_4_;
    auVar31._24_4_ = fVar383 * fVar407;
    auVar31._28_4_ = fVar218;
    auVar25 = vsubps_avx(auVar31,auVar30);
    auVar366._4_4_ = fVar341 * fVar257;
    auVar366._0_4_ = fVar331 * fVar221;
    auVar366._8_4_ = fVar344 * fVar259;
    auVar366._12_4_ = fVar347 * fVar294;
    auVar366._16_4_ = fVar350 * fVar373;
    auVar366._20_4_ = fVar353 * fVar396;
    auVar366._24_4_ = fVar356 * fVar407;
    auVar366._28_4_ = fVar218;
    auVar33._4_4_ = fVar239 * fVar312;
    auVar33._0_4_ = fVar168 * fVar300;
    auVar33._8_4_ = fVar275 * fVar314;
    auVar33._12_4_ = fVar290 * fVar317;
    auVar33._16_4_ = fVar367 * fVar320;
    auVar33._20_4_ = fVar385 * fVar323;
    auVar33._24_4_ = fVar405 * fVar326;
    auVar33._28_4_ = fVar219;
    auVar26 = vsubps_avx(auVar33,auVar366);
    fVar134 = auVar26._28_4_;
    fVar288 = auVar25._28_4_ + fVar134;
    auVar232._0_4_ = fVar221 * fVar221 + fVar168 * fVar168 + fVar170 * fVar170;
    auVar232._4_4_ = fVar257 * fVar257 + fVar239 * fVar239 + fVar256 * fVar256;
    auVar232._8_4_ = fVar259 * fVar259 + fVar275 * fVar275 + fVar276 * fVar276;
    auVar232._12_4_ = fVar294 * fVar294 + fVar290 * fVar290 + fVar292 * fVar292;
    auVar232._16_4_ = fVar373 * fVar373 + fVar367 * fVar367 + fVar370 * fVar370;
    auVar232._20_4_ = fVar396 * fVar396 + fVar385 * fVar385 + fVar390 * fVar390;
    auVar232._24_4_ = fVar407 * fVar407 + fVar405 * fVar405 + fVar406 * fVar406;
    auVar232._28_4_ = fVar134 + fVar134 + fVar288;
    auVar121 = vrcpps_avx(auVar232);
    fVar296 = auVar121._0_4_;
    fVar298 = auVar121._4_4_;
    auVar34._4_4_ = fVar298 * auVar232._4_4_;
    auVar34._0_4_ = fVar296 * auVar232._0_4_;
    fVar360 = auVar121._8_4_;
    auVar34._8_4_ = fVar360 * auVar232._8_4_;
    fVar376 = auVar121._12_4_;
    auVar34._12_4_ = fVar376 * auVar232._12_4_;
    fVar379 = auVar121._16_4_;
    auVar34._16_4_ = fVar379 * auVar232._16_4_;
    fVar382 = auVar121._20_4_;
    auVar34._20_4_ = fVar382 * auVar232._20_4_;
    fVar329 = auVar121._24_4_;
    auVar34._24_4_ = fVar329 * auVar232._24_4_;
    auVar34._28_4_ = fVar219;
    auVar400._8_4_ = 0x3f800000;
    auVar400._0_8_ = &DAT_3f8000003f800000;
    auVar400._12_4_ = 0x3f800000;
    auVar400._16_4_ = 0x3f800000;
    auVar400._20_4_ = 0x3f800000;
    auVar400._24_4_ = 0x3f800000;
    auVar400._28_4_ = 0x3f800000;
    auVar27 = vsubps_avx(auVar400,auVar34);
    fVar296 = auVar27._0_4_ * fVar296 + fVar296;
    fVar298 = auVar27._4_4_ * fVar298 + fVar298;
    fVar360 = auVar27._8_4_ * fVar360 + fVar360;
    fVar376 = auVar27._12_4_ * fVar376 + fVar376;
    fVar379 = auVar27._16_4_ * fVar379 + fVar379;
    fVar382 = auVar27._20_4_ * fVar382 + fVar382;
    fVar329 = auVar27._24_4_ * fVar329 + fVar329;
    auVar122 = vperm2f128_avx(local_900,local_900,1);
    auVar122 = vshufps_avx(auVar122,local_900,0x30);
    local_ac0 = vshufps_avx(local_900,auVar122,0x29);
    auVar122 = vperm2f128_avx(auVar32,auVar32,1);
    auVar122 = vshufps_avx(auVar122,auVar32,0x30);
    local_ae0 = vshufps_avx(auVar32,auVar122,0x29);
    fVar362 = local_ae0._0_4_;
    fVar369 = local_ae0._4_4_;
    auVar35._4_4_ = fVar369 * fVar239;
    auVar35._0_4_ = fVar362 * fVar168;
    fVar372 = local_ae0._8_4_;
    auVar35._8_4_ = fVar372 * fVar275;
    fVar375 = local_ae0._12_4_;
    auVar35._12_4_ = fVar375 * fVar290;
    fVar378 = local_ae0._16_4_;
    auVar35._16_4_ = fVar378 * fVar367;
    fVar381 = local_ae0._20_4_;
    auVar35._20_4_ = fVar381 * fVar385;
    fVar384 = local_ae0._24_4_;
    auVar35._24_4_ = fVar384 * fVar405;
    auVar35._28_4_ = auVar122._28_4_;
    fVar332 = local_ac0._0_4_;
    fVar342 = local_ac0._4_4_;
    auVar36._4_4_ = fVar342 * fVar256;
    auVar36._0_4_ = fVar332 * fVar170;
    fVar345 = local_ac0._8_4_;
    auVar36._8_4_ = fVar345 * fVar276;
    fVar348 = local_ac0._12_4_;
    auVar36._12_4_ = fVar348 * fVar292;
    fVar351 = local_ac0._16_4_;
    auVar36._16_4_ = fVar351 * fVar370;
    fVar354 = local_ac0._20_4_;
    auVar36._20_4_ = fVar354 * fVar390;
    fVar357 = local_ac0._24_4_;
    auVar36._24_4_ = fVar357 * fVar406;
    auVar36._28_4_ = 0x3f800000;
    auVar28 = vsubps_avx(auVar36,auVar35);
    auVar122 = vperm2f128_avx(auVar29,auVar29,1);
    auVar122 = vshufps_avx(auVar122,auVar29,0x30);
    local_780 = vshufps_avx(auVar29,auVar122,0x29);
    fVar301 = local_780._0_4_;
    fVar313 = local_780._4_4_;
    auVar37._4_4_ = fVar313 * fVar256;
    auVar37._0_4_ = fVar301 * fVar170;
    fVar315 = local_780._8_4_;
    auVar37._8_4_ = fVar315 * fVar276;
    fVar318 = local_780._12_4_;
    auVar37._12_4_ = fVar318 * fVar292;
    fVar321 = local_780._16_4_;
    auVar37._16_4_ = fVar321 * fVar370;
    fVar324 = local_780._20_4_;
    auVar37._20_4_ = fVar324 * fVar390;
    fVar327 = local_780._24_4_;
    auVar37._24_4_ = fVar327 * fVar406;
    auVar37._28_4_ = auVar122._28_4_;
    auVar38._4_4_ = fVar369 * fVar257;
    auVar38._0_4_ = fVar362 * fVar221;
    auVar38._8_4_ = fVar372 * fVar259;
    auVar38._12_4_ = fVar375 * fVar294;
    auVar38._16_4_ = fVar378 * fVar373;
    auVar38._20_4_ = fVar381 * fVar396;
    auVar38._24_4_ = fVar384 * fVar407;
    auVar38._28_4_ = uStack_184;
    auVar29 = vsubps_avx(auVar38,auVar37);
    auVar39._4_4_ = fVar342 * fVar257;
    auVar39._0_4_ = fVar332 * fVar221;
    auVar39._8_4_ = fVar345 * fVar259;
    auVar39._12_4_ = fVar348 * fVar294;
    auVar39._16_4_ = fVar351 * fVar373;
    auVar39._20_4_ = fVar354 * fVar396;
    auVar39._24_4_ = fVar357 * fVar407;
    auVar39._28_4_ = uStack_184;
    auVar40._4_4_ = fVar239 * fVar313;
    auVar40._0_4_ = fVar168 * fVar301;
    auVar40._8_4_ = fVar275 * fVar315;
    auVar40._12_4_ = fVar290 * fVar318;
    auVar40._16_4_ = fVar367 * fVar321;
    auVar40._20_4_ = fVar385 * fVar324;
    auVar40._24_4_ = fVar405 * fVar327;
    auVar40._28_4_ = fStack_1a4;
    auVar122 = vsubps_avx(auVar40,auVar39);
    fVar134 = auVar122._28_4_;
    auVar41._4_4_ =
         (auVar24._4_4_ * auVar24._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar26._4_4_ * auVar26._4_4_) * fVar298;
    auVar41._0_4_ =
         (auVar24._0_4_ * auVar24._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar26._0_4_ * auVar26._0_4_) * fVar296;
    auVar41._8_4_ =
         (auVar24._8_4_ * auVar24._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar26._8_4_ * auVar26._8_4_) * fVar360;
    auVar41._12_4_ =
         (auVar24._12_4_ * auVar24._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar26._12_4_ * auVar26._12_4_) * fVar376;
    auVar41._16_4_ =
         (auVar24._16_4_ * auVar24._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar26._16_4_ * auVar26._16_4_) * fVar379;
    auVar41._20_4_ =
         (auVar24._20_4_ * auVar24._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar26._20_4_ * auVar26._20_4_) * fVar382;
    auVar41._24_4_ =
         (auVar24._24_4_ * auVar24._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar26._24_4_ * auVar26._24_4_) * fVar329;
    auVar41._28_4_ = auVar24._28_4_ + fVar288;
    auVar42._4_4_ =
         (auVar28._4_4_ * auVar28._4_4_ +
         auVar29._4_4_ * auVar29._4_4_ + auVar122._4_4_ * auVar122._4_4_) * fVar298;
    auVar42._0_4_ =
         (auVar28._0_4_ * auVar28._0_4_ +
         auVar29._0_4_ * auVar29._0_4_ + auVar122._0_4_ * auVar122._0_4_) * fVar296;
    auVar42._8_4_ =
         (auVar28._8_4_ * auVar28._8_4_ +
         auVar29._8_4_ * auVar29._8_4_ + auVar122._8_4_ * auVar122._8_4_) * fVar360;
    auVar42._12_4_ =
         (auVar28._12_4_ * auVar28._12_4_ +
         auVar29._12_4_ * auVar29._12_4_ + auVar122._12_4_ * auVar122._12_4_) * fVar376;
    auVar42._16_4_ =
         (auVar28._16_4_ * auVar28._16_4_ +
         auVar29._16_4_ * auVar29._16_4_ + auVar122._16_4_ * auVar122._16_4_) * fVar379;
    auVar42._20_4_ =
         (auVar28._20_4_ * auVar28._20_4_ +
         auVar29._20_4_ * auVar29._20_4_ + auVar122._20_4_ * auVar122._20_4_) * fVar382;
    auVar42._24_4_ =
         (auVar28._24_4_ * auVar28._24_4_ +
         auVar29._24_4_ * auVar29._24_4_ + auVar122._24_4_ * auVar122._24_4_) * fVar329;
    auVar42._28_4_ = auVar27._28_4_ + auVar121._28_4_;
    auVar121 = vmaxps_avx(auVar41,auVar42);
    auVar122 = vperm2f128_avx(local_7a0,local_7a0,1);
    auVar122 = vshufps_avx(auVar122,local_7a0,0x30);
    auVar25 = vshufps_avx(local_7a0,auVar122,0x29);
    auVar154._0_4_ = (float)local_7a0._0_4_ + fVar236;
    auVar154._4_4_ = local_7a0._4_4_ + fVar237;
    auVar154._8_4_ = local_7a0._8_4_ + fVar238;
    auVar154._12_4_ = local_7a0._12_4_ + fVar258;
    auVar154._16_4_ = local_7a0._16_4_ + fVar261;
    auVar154._20_4_ = local_7a0._20_4_ + fVar274;
    auVar154._24_4_ = local_7a0._24_4_ + fVar260;
    auVar154._28_4_ = local_7a0._28_4_ + fVar278;
    auVar122 = vmaxps_avx(local_7a0,auVar154);
    auVar24 = vmaxps_avx(local_660,auVar25);
    auVar24 = vmaxps_avx(auVar122,auVar24);
    auVar122 = vrsqrtps_avx(auVar232);
    fVar236 = auVar122._0_4_;
    fVar237 = auVar122._4_4_;
    fVar238 = auVar122._8_4_;
    fVar258 = auVar122._12_4_;
    fVar261 = auVar122._16_4_;
    fVar274 = auVar122._20_4_;
    fVar260 = auVar122._24_4_;
    auVar43._4_4_ = fVar237 * fVar237 * fVar237 * auVar232._4_4_ * 0.5;
    auVar43._0_4_ = fVar236 * fVar236 * fVar236 * auVar232._0_4_ * 0.5;
    auVar43._8_4_ = fVar238 * fVar238 * fVar238 * auVar232._8_4_ * 0.5;
    auVar43._12_4_ = fVar258 * fVar258 * fVar258 * auVar232._12_4_ * 0.5;
    auVar43._16_4_ = fVar261 * fVar261 * fVar261 * auVar232._16_4_ * 0.5;
    auVar43._20_4_ = fVar274 * fVar274 * fVar274 * auVar232._20_4_ * 0.5;
    auVar43._24_4_ = fVar260 * fVar260 * fVar260 * auVar232._24_4_ * 0.5;
    auVar43._28_4_ = auVar232._28_4_;
    auVar44._4_4_ = fVar237 * 1.5;
    auVar44._0_4_ = fVar236 * 1.5;
    auVar44._8_4_ = fVar238 * 1.5;
    auVar44._12_4_ = fVar258 * 1.5;
    auVar44._16_4_ = fVar261 * 1.5;
    auVar44._20_4_ = fVar274 * 1.5;
    auVar44._24_4_ = fVar260 * 1.5;
    auVar44._28_4_ = auVar122._28_4_;
    auVar122 = vsubps_avx(auVar44,auVar43);
    auVar86._4_4_ = fVar201;
    auVar86._0_4_ = fVar178;
    auVar86._8_4_ = fVar204;
    auVar86._12_4_ = fVar207;
    auVar86._16_4_ = fVar210;
    auVar86._20_4_ = fVar213;
    auVar86._24_4_ = fVar216;
    auVar86._28_4_ = fVar219;
    local_b00 = vsubps_avx(ZEXT832(0) << 0x20,auVar86);
    auVar88._4_4_ = fVar202;
    auVar88._0_4_ = fVar179;
    auVar88._8_4_ = fVar205;
    auVar88._12_4_ = fVar208;
    auVar88._16_4_ = fVar211;
    auVar88._20_4_ = fVar214;
    auVar88._24_4_ = fVar217;
    auVar88._28_4_ = fVar220;
    local_940 = vsubps_avx(ZEXT832(0) << 0x20,auVar88);
    fVar236 = local_940._0_4_;
    fVar258 = local_940._4_4_;
    fVar260 = local_940._8_4_;
    fVar296 = local_940._12_4_;
    fVar376 = local_940._16_4_;
    fVar329 = local_940._20_4_;
    fVar408 = local_940._24_4_;
    fVar237 = local_b00._0_4_;
    fVar261 = local_b00._4_4_;
    fVar278 = local_b00._8_4_;
    fVar298 = local_b00._12_4_;
    fVar379 = local_b00._16_4_;
    fVar397 = local_b00._20_4_;
    fVar409 = local_b00._24_4_;
    auVar90._4_4_ = fVar200;
    auVar90._0_4_ = fVar177;
    auVar90._8_4_ = fVar203;
    auVar90._12_4_ = fVar206;
    auVar90._16_4_ = fVar209;
    auVar90._20_4_ = fVar212;
    auVar90._24_4_ = fVar215;
    auVar90._28_4_ = fVar218;
    auVar26 = vsubps_avx(ZEXT832(0) << 0x20,auVar90);
    fVar333 = auVar26._0_4_;
    fVar343 = auVar26._4_4_;
    fVar346 = auVar26._8_4_;
    fVar349 = auVar26._12_4_;
    fVar352 = auVar26._16_4_;
    fVar355 = auVar26._20_4_;
    fVar358 = auVar26._24_4_;
    auVar401._0_4_ =
         fVar333 * (float)local_7c0._0_4_ +
         (float)local_7e0._0_4_ * fVar237 + (float)local_800._0_4_ * fVar236;
    auVar401._4_4_ =
         fVar343 * (float)local_7c0._4_4_ +
         (float)local_7e0._4_4_ * fVar261 + (float)local_800._4_4_ * fVar258;
    auVar401._8_4_ = fVar346 * fStack_7b8 + fStack_7d8 * fVar278 + fStack_7f8 * fVar260;
    auVar401._12_4_ = fVar349 * fStack_7b4 + fStack_7d4 * fVar298 + fStack_7f4 * fVar296;
    auVar401._16_4_ = fVar352 * fStack_7b0 + fStack_7d0 * fVar379 + fStack_7f0 * fVar376;
    auVar401._20_4_ = fVar355 * fStack_7ac + fStack_7cc * fVar397 + fStack_7ec * fVar329;
    auVar401._24_4_ = fVar358 * fStack_7a8 + fStack_7c8 * fVar409 + fStack_7e8 * fVar408;
    auVar401._28_4_ = fVar134 + fVar134 + auVar29._28_4_ + fVar134;
    auVar416._0_4_ = fVar333 * fVar333 + fVar237 * fVar237 + fVar236 * fVar236;
    auVar416._4_4_ = fVar343 * fVar343 + fVar261 * fVar261 + fVar258 * fVar258;
    auVar416._8_4_ = fVar346 * fVar346 + fVar278 * fVar278 + fVar260 * fVar260;
    auVar416._12_4_ = fVar349 * fVar349 + fVar298 * fVar298 + fVar296 * fVar296;
    auVar416._16_4_ = fVar352 * fVar352 + fVar379 * fVar379 + fVar376 * fVar376;
    auVar416._20_4_ = fVar355 * fVar355 + fVar397 * fVar397 + fVar329 * fVar329;
    auVar416._24_4_ = fVar358 * fVar358 + fVar409 * fVar409 + fVar408 * fVar408;
    auVar416._28_4_ = fStack_1a4 + fStack_1a4 + fVar134;
    fVar238 = auVar122._0_4_;
    fVar274 = auVar122._4_4_;
    fVar288 = auVar122._8_4_;
    fVar360 = auVar122._12_4_;
    fVar382 = auVar122._16_4_;
    fVar404 = auVar122._20_4_;
    fVar410 = auVar122._24_4_;
    fVar420 = (float)local_7c0._0_4_ * fVar221 * fVar238 +
              fVar168 * fVar238 * (float)local_7e0._0_4_ +
              fVar238 * fVar170 * (float)local_800._0_4_;
    fVar423 = (float)local_7c0._4_4_ * fVar257 * fVar274 +
              fVar239 * fVar274 * (float)local_7e0._4_4_ +
              fVar274 * fVar256 * (float)local_800._4_4_;
    fVar425 = fStack_7b8 * fVar259 * fVar288 +
              fVar275 * fVar288 * fStack_7d8 + fVar288 * fVar276 * fStack_7f8;
    fVar427 = fStack_7b4 * fVar294 * fVar360 +
              fVar290 * fVar360 * fStack_7d4 + fVar360 * fVar292 * fStack_7f4;
    fVar428 = fStack_7b0 * fVar373 * fVar382 +
              fVar367 * fVar382 * fStack_7d0 + fVar382 * fVar370 * fStack_7f0;
    fVar430 = fStack_7ac * fVar396 * fVar404 +
              fVar385 * fVar404 * fStack_7cc + fVar404 * fVar390 * fStack_7ec;
    fVar132 = fStack_7a8 * fVar407 * fVar410 +
              fVar405 * fVar410 * fStack_7c8 + fVar410 * fVar406 * fStack_7e8;
    fVar134 = fStack_7a4 + fStack_7c4 + fStack_7e4;
    local_4e0._0_4_ =
         fVar333 * fVar221 * fVar238 + fVar168 * fVar238 * fVar237 + fVar238 * fVar170 * fVar236;
    local_4e0._4_4_ =
         fVar343 * fVar257 * fVar274 + fVar239 * fVar274 * fVar261 + fVar274 * fVar256 * fVar258;
    local_4e0._8_4_ =
         fVar346 * fVar259 * fVar288 + fVar275 * fVar288 * fVar278 + fVar288 * fVar276 * fVar260;
    local_4e0._12_4_ =
         fVar349 * fVar294 * fVar360 + fVar290 * fVar360 * fVar298 + fVar360 * fVar292 * fVar296;
    local_4e0._16_4_ =
         fVar352 * fVar373 * fVar382 + fVar367 * fVar382 * fVar379 + fVar382 * fVar370 * fVar376;
    local_4e0._20_4_ =
         fVar355 * fVar396 * fVar404 + fVar385 * fVar404 * fVar397 + fVar404 * fVar390 * fVar329;
    local_4e0._24_4_ =
         fVar358 * fVar407 * fVar410 + fVar405 * fVar410 * fVar409 + fVar410 * fVar406 * fVar408;
    local_4e0._28_4_ = fStack_7c4 + fVar134;
    auVar389 = ZEXT3264(local_4e0);
    auVar45._4_4_ = local_4e0._4_4_ * fVar423;
    auVar45._0_4_ = local_4e0._0_4_ * fVar420;
    auVar45._8_4_ = local_4e0._8_4_ * fVar425;
    auVar45._12_4_ = local_4e0._12_4_ * fVar427;
    auVar45._16_4_ = local_4e0._16_4_ * fVar428;
    auVar45._20_4_ = local_4e0._20_4_ * fVar430;
    auVar45._24_4_ = local_4e0._24_4_ * fVar132;
    auVar45._28_4_ = fVar134;
    auVar27 = vsubps_avx(auVar401,auVar45);
    auVar46._4_4_ = local_4e0._4_4_ * local_4e0._4_4_;
    auVar46._0_4_ = local_4e0._0_4_ * local_4e0._0_4_;
    auVar46._8_4_ = local_4e0._8_4_ * local_4e0._8_4_;
    auVar46._12_4_ = local_4e0._12_4_ * local_4e0._12_4_;
    auVar46._16_4_ = local_4e0._16_4_ * local_4e0._16_4_;
    auVar46._20_4_ = local_4e0._20_4_ * local_4e0._20_4_;
    auVar46._24_4_ = local_4e0._24_4_ * local_4e0._24_4_;
    auVar46._28_4_ = fStack_7c4;
    auVar28 = vsubps_avx(auVar416,auVar46);
    local_560 = vsqrtps_avx(auVar121);
    fVar134 = (local_560._0_4_ + auVar24._0_4_) * 1.0000002;
    fVar169 = (local_560._4_4_ + auVar24._4_4_) * 1.0000002;
    fVar171 = (local_560._8_4_ + auVar24._8_4_) * 1.0000002;
    fVar173 = (local_560._12_4_ + auVar24._12_4_) * 1.0000002;
    fVar174 = (local_560._16_4_ + auVar24._16_4_) * 1.0000002;
    fVar175 = (local_560._20_4_ + auVar24._20_4_) * 1.0000002;
    fVar176 = (local_560._24_4_ + auVar24._24_4_) * 1.0000002;
    auVar47._4_4_ = fVar169 * fVar169;
    auVar47._0_4_ = fVar134 * fVar134;
    auVar47._8_4_ = fVar171 * fVar171;
    auVar47._12_4_ = fVar173 * fVar173;
    auVar47._16_4_ = fVar174 * fVar174;
    auVar47._20_4_ = fVar175 * fVar175;
    auVar47._24_4_ = fVar176 * fVar176;
    auVar47._28_4_ = local_560._28_4_ + auVar24._28_4_;
    fVar411 = auVar27._0_4_ + auVar27._0_4_;
    fVar421 = auVar27._4_4_ + auVar27._4_4_;
    local_5e0._0_8_ = CONCAT44(fVar421,fVar411);
    local_5e0._8_4_ = auVar27._8_4_ + auVar27._8_4_;
    local_5e0._12_4_ = auVar27._12_4_ + auVar27._12_4_;
    local_5e0._16_4_ = auVar27._16_4_ + auVar27._16_4_;
    local_5e0._20_4_ = auVar27._20_4_ + auVar27._20_4_;
    local_5e0._24_4_ = auVar27._24_4_ + auVar27._24_4_;
    fVar134 = auVar27._28_4_;
    local_5e0._28_4_ = fVar134 + fVar134;
    auVar419 = ZEXT3264(local_5e0);
    auVar24 = vsubps_avx(auVar28,auVar47);
    local_2c0._4_4_ = fVar423 * fVar423;
    local_2c0._0_4_ = fVar420 * fVar420;
    local_2c0._8_4_ = fVar425 * fVar425;
    local_2c0._12_4_ = fVar427 * fVar427;
    local_2c0._16_4_ = fVar428 * fVar428;
    local_2c0._20_4_ = fVar430 * fVar430;
    local_2c0._24_4_ = fVar132 * fVar132;
    local_2c0._28_4_ = local_5a0._28_4_;
    local_6a0 = vsubps_avx(local_240,local_2c0);
    auVar394 = ZEXT3264(local_6a0);
    auVar48._4_4_ = fVar421 * fVar421;
    auVar48._0_4_ = fVar411 * fVar411;
    auVar48._8_4_ = local_5e0._8_4_ * local_5e0._8_4_;
    auVar48._12_4_ = local_5e0._12_4_ * local_5e0._12_4_;
    auVar48._16_4_ = local_5e0._16_4_ * local_5e0._16_4_;
    auVar48._20_4_ = local_5e0._20_4_ * local_5e0._20_4_;
    auVar48._24_4_ = local_5e0._24_4_ * local_5e0._24_4_;
    auVar48._28_4_ = fVar134;
    fVar169 = local_6a0._0_4_;
    local_680._0_4_ = fVar169 * 4.0;
    fVar171 = local_6a0._4_4_;
    local_680._4_4_ = fVar171 * 4.0;
    fVar173 = local_6a0._8_4_;
    fStack_678 = fVar173 * 4.0;
    fVar174 = local_6a0._12_4_;
    fStack_674 = fVar174 * 4.0;
    fVar175 = local_6a0._16_4_;
    fStack_670 = fVar175 * 4.0;
    fVar176 = local_6a0._20_4_;
    fStack_66c = fVar176 * 4.0;
    fVar395 = local_6a0._24_4_;
    fStack_668 = fVar395 * 4.0;
    fStack_664 = 4.0;
    auVar49._4_4_ = (float)local_680._4_4_ * auVar24._4_4_;
    auVar49._0_4_ = (float)local_680._0_4_ * auVar24._0_4_;
    auVar49._8_4_ = fStack_678 * auVar24._8_4_;
    auVar49._12_4_ = fStack_674 * auVar24._12_4_;
    auVar49._16_4_ = fStack_670 * auVar24._16_4_;
    auVar49._20_4_ = fStack_66c * auVar24._20_4_;
    auVar49._24_4_ = fStack_668 * auVar24._24_4_;
    auVar49._28_4_ = 0x40800000;
    auVar27 = vsubps_avx(auVar48,auVar49);
    auVar403 = ZEXT3264(auVar27);
    auVar121 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
    fVar134 = local_6a0._28_4_;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0x7f,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar121 >> 0xbf,0) == '\0') &&
        (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar121[0x1f])
    {
      auVar233._8_4_ = 0x7f800000;
      auVar233._0_8_ = 0x7f8000007f800000;
      auVar233._12_4_ = 0x7f800000;
      auVar233._16_4_ = 0x7f800000;
      auVar233._20_4_ = 0x7f800000;
      auVar233._24_4_ = 0x7f800000;
      auVar233._28_4_ = 0x7f800000;
      auVar431._8_4_ = 0xff800000;
      auVar431._0_8_ = 0xff800000ff800000;
      auVar431._12_4_ = 0xff800000;
      auVar431._16_4_ = 0xff800000;
      auVar431._20_4_ = 0xff800000;
      auVar431._24_4_ = 0xff800000;
      auVar431._28_4_ = 0xff800000;
    }
    else {
      auVar31 = vsqrtps_avx(auVar27);
      auVar285._0_4_ = fVar169 + fVar169;
      auVar285._4_4_ = fVar171 + fVar171;
      auVar285._8_4_ = fVar173 + fVar173;
      auVar285._12_4_ = fVar174 + fVar174;
      auVar285._16_4_ = fVar175 + fVar175;
      auVar285._20_4_ = fVar176 + fVar176;
      auVar285._24_4_ = fVar395 + fVar395;
      auVar285._28_4_ = fVar134 + fVar134;
      auVar30 = vrcpps_avx(auVar285);
      auVar29 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
      auVar403 = ZEXT3264(auVar29);
      fVar279 = auVar30._0_4_;
      fVar289 = auVar30._4_4_;
      auVar50._4_4_ = auVar285._4_4_ * fVar289;
      auVar50._0_4_ = auVar285._0_4_ * fVar279;
      fVar291 = auVar30._8_4_;
      auVar50._8_4_ = auVar285._8_4_ * fVar291;
      fVar293 = auVar30._12_4_;
      auVar50._12_4_ = auVar285._12_4_ * fVar293;
      fVar295 = auVar30._16_4_;
      auVar50._16_4_ = auVar285._16_4_ * fVar295;
      fVar297 = auVar30._20_4_;
      auVar50._20_4_ = auVar285._20_4_ * fVar297;
      fVar299 = auVar30._24_4_;
      auVar50._24_4_ = auVar285._24_4_ * fVar299;
      auVar50._28_4_ = auVar285._28_4_;
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = &DAT_3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar123._16_4_ = 0x3f800000;
      auVar123._20_4_ = 0x3f800000;
      auVar123._24_4_ = 0x3f800000;
      auVar123._28_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar123,auVar50);
      fVar279 = fVar279 + fVar279 * auVar27._0_4_;
      fVar289 = fVar289 + fVar289 * auVar27._4_4_;
      fVar291 = fVar291 + fVar291 * auVar27._8_4_;
      fVar293 = fVar293 + fVar293 * auVar27._12_4_;
      fVar295 = fVar295 + fVar295 * auVar27._16_4_;
      fVar297 = fVar297 + fVar297 * auVar27._20_4_;
      fVar299 = fVar299 + fVar299 * auVar27._24_4_;
      auVar307._0_8_ = CONCAT44(fVar421,fVar411) ^ 0x8000000080000000;
      auVar307._8_4_ = -local_5e0._8_4_;
      auVar307._12_4_ = -local_5e0._12_4_;
      auVar307._16_4_ = -local_5e0._16_4_;
      auVar307._20_4_ = -local_5e0._20_4_;
      auVar307._24_4_ = -local_5e0._24_4_;
      auVar307._28_4_ = -local_5e0._28_4_;
      auVar366 = vsubps_avx(auVar307,auVar31);
      fVar411 = auVar366._0_4_ * fVar279;
      fVar421 = auVar366._4_4_ * fVar289;
      auVar51._4_4_ = fVar421;
      auVar51._0_4_ = fVar411;
      fVar316 = auVar366._8_4_ * fVar291;
      auVar51._8_4_ = fVar316;
      fVar319 = auVar366._12_4_ * fVar293;
      auVar51._12_4_ = fVar319;
      fVar322 = auVar366._16_4_ * fVar295;
      auVar51._16_4_ = fVar322;
      fVar325 = auVar366._20_4_ * fVar297;
      auVar51._20_4_ = fVar325;
      fVar328 = auVar366._24_4_ * fVar299;
      auVar51._24_4_ = fVar328;
      auVar51._28_4_ = auVar366._28_4_;
      auVar31 = vsubps_avx(auVar31,local_5e0);
      fVar279 = auVar31._0_4_ * fVar279;
      fVar289 = auVar31._4_4_ * fVar289;
      auVar52._4_4_ = fVar289;
      auVar52._0_4_ = fVar279;
      fVar291 = auVar31._8_4_ * fVar291;
      auVar52._8_4_ = fVar291;
      fVar293 = auVar31._12_4_ * fVar293;
      auVar52._12_4_ = fVar293;
      fVar295 = auVar31._16_4_ * fVar295;
      auVar52._16_4_ = fVar295;
      fVar297 = auVar31._20_4_ * fVar297;
      auVar52._20_4_ = fVar297;
      fVar299 = auVar31._24_4_ * fVar299;
      auVar52._24_4_ = fVar299;
      auVar52._28_4_ = auVar31._28_4_;
      fStack_504 = local_4e0._28_4_ + auVar30._28_4_ + auVar27._28_4_;
      local_520[0] = fVar238 * (local_4e0._0_4_ + fVar420 * fVar411);
      local_520[1] = fVar274 * (local_4e0._4_4_ + fVar423 * fVar421);
      local_520[2] = fVar288 * (local_4e0._8_4_ + fVar425 * fVar316);
      local_520[3] = fVar360 * (local_4e0._12_4_ + fVar427 * fVar319);
      fStack_510 = fVar382 * (local_4e0._16_4_ + fVar428 * fVar322);
      fStack_50c = fVar404 * (local_4e0._20_4_ + fVar430 * fVar325);
      fStack_508 = fVar410 * (local_4e0._24_4_ + fVar132 * fVar328);
      local_540[0] = fVar238 * (local_4e0._0_4_ + fVar420 * fVar279);
      local_540[1] = fVar274 * (local_4e0._4_4_ + fVar423 * fVar289);
      local_540[2] = fVar288 * (local_4e0._8_4_ + fVar425 * fVar291);
      local_540[3] = fVar360 * (local_4e0._12_4_ + fVar427 * fVar293);
      fStack_530 = fVar382 * (local_4e0._16_4_ + fVar428 * fVar295);
      fStack_52c = fVar404 * (local_4e0._20_4_ + fVar430 * fVar297);
      fStack_528 = fVar410 * (local_4e0._24_4_ + fVar132 * fVar299);
      fStack_524 = local_4e0._28_4_ + fStack_504;
      auVar286._8_4_ = 0x7f800000;
      auVar286._0_8_ = 0x7f8000007f800000;
      auVar286._12_4_ = 0x7f800000;
      auVar286._16_4_ = 0x7f800000;
      auVar286._20_4_ = 0x7f800000;
      auVar286._24_4_ = 0x7f800000;
      auVar286._28_4_ = 0x7f800000;
      auVar233 = vblendvps_avx(auVar286,auVar51,auVar29);
      auVar308._8_4_ = 0x7fffffff;
      auVar308._0_8_ = 0x7fffffff7fffffff;
      auVar308._12_4_ = 0x7fffffff;
      auVar308._16_4_ = 0x7fffffff;
      auVar308._20_4_ = 0x7fffffff;
      auVar308._24_4_ = 0x7fffffff;
      auVar308._28_4_ = 0x7fffffff;
      auVar27 = vandps_avx(local_2c0,auVar308);
      auVar27 = vmaxps_avx(local_4c0,auVar27);
      auVar53._4_4_ = auVar27._4_4_ * 1.9073486e-06;
      auVar53._0_4_ = auVar27._0_4_ * 1.9073486e-06;
      auVar53._8_4_ = auVar27._8_4_ * 1.9073486e-06;
      auVar53._12_4_ = auVar27._12_4_ * 1.9073486e-06;
      auVar53._16_4_ = auVar27._16_4_ * 1.9073486e-06;
      auVar53._20_4_ = auVar27._20_4_ * 1.9073486e-06;
      auVar53._24_4_ = auVar27._24_4_ * 1.9073486e-06;
      auVar53._28_4_ = auVar27._28_4_;
      auVar27 = vandps_avx(local_6a0,auVar308);
      auVar27 = vcmpps_avx(auVar27,auVar53,1);
      auVar419 = ZEXT3264(auVar27);
      auVar287._8_4_ = 0xff800000;
      auVar287._0_8_ = 0xff800000ff800000;
      auVar287._12_4_ = 0xff800000;
      auVar287._16_4_ = 0xff800000;
      auVar287._20_4_ = 0xff800000;
      auVar287._24_4_ = 0xff800000;
      auVar287._28_4_ = 0xff800000;
      auVar431 = vblendvps_avx(auVar287,auVar52,auVar29);
      auVar30 = auVar29 & auVar27;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar121 = vandps_avx(auVar27,auVar29);
        auVar140 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar27 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,2);
        auVar338._8_4_ = 0xff800000;
        auVar338._0_8_ = 0xff800000ff800000;
        auVar338._12_4_ = 0xff800000;
        auVar338._16_4_ = 0xff800000;
        auVar338._20_4_ = 0xff800000;
        auVar338._24_4_ = 0xff800000;
        auVar338._28_4_ = 0xff800000;
        auVar418._8_4_ = 0x7f800000;
        auVar418._0_8_ = 0x7f8000007f800000;
        auVar418._12_4_ = 0x7f800000;
        auVar418._16_4_ = 0x7f800000;
        auVar418._20_4_ = 0x7f800000;
        auVar418._24_4_ = 0x7f800000;
        auVar418._28_4_ = 0x7f800000;
        auVar419 = ZEXT3264(auVar418);
        auVar24 = vblendvps_avx(auVar418,auVar338,auVar27);
        auVar225 = vpmovsxwd_avx(auVar140);
        auVar140 = vpunpckhwd_avx(auVar140,auVar140);
        auVar273._16_16_ = auVar140;
        auVar273._0_16_ = auVar225;
        auVar233 = vblendvps_avx(auVar233,auVar24,auVar273);
        auVar24 = vblendvps_avx(auVar338,auVar418,auVar27);
        auVar431 = vblendvps_avx(auVar431,auVar24,auVar273);
        auVar24 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar166._0_4_ = auVar121._0_4_ ^ auVar24._0_4_;
        auVar166._4_4_ = auVar121._4_4_ ^ auVar24._4_4_;
        auVar166._8_4_ = auVar121._8_4_ ^ auVar24._8_4_;
        auVar166._12_4_ = auVar121._12_4_ ^ auVar24._12_4_;
        auVar166._16_4_ = auVar121._16_4_ ^ auVar24._16_4_;
        auVar166._20_4_ = auVar121._20_4_ ^ auVar24._20_4_;
        auVar166._24_4_ = auVar121._24_4_ ^ auVar24._24_4_;
        auVar166._28_4_ = auVar121._28_4_ ^ auVar24._28_4_;
        auVar121 = vorps_avx(auVar27,auVar166);
        auVar121 = vandps_avx(auVar29,auVar121);
      }
    }
    auVar340 = ZEXT3264(local_260);
    auVar24 = local_260 & auVar121;
    fVar411 = (float)local_860._0_4_;
    fVar421 = (float)local_860._4_4_;
    fVar279 = fStack_858;
    fVar289 = fStack_854;
    fVar291 = fStack_850;
    fVar293 = fStack_84c;
    fVar295 = fStack_848;
    fVar297 = fStack_844;
    if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar24 >> 0x7f,0) == '\0') &&
          (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar24 >> 0xbf,0) == '\0') &&
        (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar24[0x1f]) {
      auVar311 = ZEXT1664((undefined1  [16])0x0);
      auVar255 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      local_2a0 = auVar122;
      auVar140 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar192._16_16_ = auVar140;
      auVar192._0_16_ = auVar140;
      local_600 = vminps_avx(auVar192,auVar431);
      auVar124._0_4_ =
           (float)local_7c0._0_4_ * fVar300 +
           (float)local_7e0._0_4_ * fVar331 + (float)local_800._0_4_ * fVar361;
      auVar124._4_4_ =
           (float)local_7c0._4_4_ * fVar312 +
           (float)local_7e0._4_4_ * fVar341 + (float)local_800._4_4_ * fVar368;
      auVar124._8_4_ = fStack_7b8 * fVar314 + fStack_7d8 * fVar344 + fStack_7f8 * fVar371;
      auVar124._12_4_ = fStack_7b4 * fVar317 + fStack_7d4 * fVar347 + fStack_7f4 * fVar374;
      auVar124._16_4_ = fStack_7b0 * fVar320 + fStack_7d0 * fVar350 + fStack_7f0 * fVar377;
      auVar124._20_4_ = fStack_7ac * fVar323 + fStack_7cc * fVar353 + fStack_7ec * fVar380;
      auVar124._24_4_ = fStack_7a8 * fVar326 + fStack_7c8 * fVar356 + fStack_7e8 * fVar383;
      auVar124._28_4_ = fVar330 + fVar359 + auVar26._28_4_;
      auVar24 = vrcpps_avx(auVar124);
      fVar330 = auVar24._0_4_;
      fVar299 = auVar24._4_4_;
      auVar54._4_4_ = auVar124._4_4_ * fVar299;
      auVar54._0_4_ = auVar124._0_4_ * fVar330;
      fVar316 = auVar24._8_4_;
      auVar54._8_4_ = auVar124._8_4_ * fVar316;
      fVar319 = auVar24._12_4_;
      auVar54._12_4_ = auVar124._12_4_ * fVar319;
      fVar322 = auVar24._16_4_;
      auVar54._16_4_ = auVar124._16_4_ * fVar322;
      fVar325 = auVar24._20_4_;
      auVar54._20_4_ = auVar124._20_4_ * fVar325;
      fVar328 = auVar24._24_4_;
      auVar54._24_4_ = auVar124._24_4_ * fVar328;
      auVar54._28_4_ = fVar359;
      auVar402._8_4_ = 0x3f800000;
      auVar402._0_8_ = &DAT_3f8000003f800000;
      auVar402._12_4_ = 0x3f800000;
      auVar402._16_4_ = 0x3f800000;
      auVar402._20_4_ = 0x3f800000;
      auVar402._24_4_ = 0x3f800000;
      auVar402._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar402,auVar54);
      auVar365._8_4_ = 0x7fffffff;
      auVar365._0_8_ = 0x7fffffff7fffffff;
      auVar365._12_4_ = 0x7fffffff;
      auVar365._16_4_ = 0x7fffffff;
      auVar365._20_4_ = 0x7fffffff;
      auVar365._24_4_ = 0x7fffffff;
      auVar365._28_4_ = 0x7fffffff;
      auVar24 = vandps_avx(auVar365,auVar124);
      auVar432._8_4_ = 0x219392ef;
      auVar432._0_8_ = 0x219392ef219392ef;
      auVar432._12_4_ = 0x219392ef;
      auVar432._16_4_ = 0x219392ef;
      auVar432._20_4_ = 0x219392ef;
      auVar432._24_4_ = 0x219392ef;
      auVar432._28_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar24,auVar432,1);
      auVar389 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar55._4_4_ =
           (fVar299 + fVar299 * auVar29._4_4_) *
           -(fVar312 * fVar343 + fVar341 * fVar261 + fVar368 * fVar258);
      auVar55._0_4_ =
           (fVar330 + fVar330 * auVar29._0_4_) *
           -(fVar300 * fVar333 + fVar331 * fVar237 + fVar361 * fVar236);
      auVar55._8_4_ =
           (fVar316 + fVar316 * auVar29._8_4_) *
           -(fVar314 * fVar346 + fVar344 * fVar278 + fVar371 * fVar260);
      auVar55._12_4_ =
           (fVar319 + fVar319 * auVar29._12_4_) *
           -(fVar317 * fVar349 + fVar347 * fVar298 + fVar374 * fVar296);
      auVar55._16_4_ =
           (fVar322 + fVar322 * auVar29._16_4_) *
           -(fVar320 * fVar352 + fVar350 * fVar379 + fVar377 * fVar376);
      auVar55._20_4_ =
           (fVar325 + fVar325 * auVar29._20_4_) *
           -(fVar323 * fVar355 + fVar353 * fVar397 + fVar380 * fVar329);
      auVar55._24_4_ =
           (fVar328 + fVar328 * auVar29._24_4_) *
           -(fVar326 * fVar358 + fVar356 * fVar409 + fVar383 * fVar408);
      auVar55._28_4_ = -(auVar26._28_4_ + auVar233._28_4_ + local_600._28_4_);
      auVar78 = ZEXT812(0);
      auVar364 = ZEXT1228(auVar78) << 0x20;
      auVar24 = vcmpps_avx(auVar124,ZEXT1232(auVar78) << 0x20,1);
      auVar24 = vorps_avx(auVar27,auVar24);
      auVar393._8_4_ = 0xff800000;
      auVar393._0_8_ = 0xff800000ff800000;
      auVar393._12_4_ = 0xff800000;
      auVar393._16_4_ = 0xff800000;
      auVar393._20_4_ = 0xff800000;
      auVar393._24_4_ = 0xff800000;
      auVar393._28_4_ = 0xff800000;
      auVar24 = vblendvps_avx(auVar55,auVar393,auVar24);
      auVar26 = vcmpps_avx(auVar124,ZEXT1232(auVar78) << 0x20,6);
      auVar26 = vorps_avx(auVar27,auVar26);
      auVar417._8_4_ = 0x7f800000;
      auVar417._0_8_ = 0x7f8000007f800000;
      auVar417._12_4_ = 0x7f800000;
      auVar417._16_4_ = 0x7f800000;
      auVar417._20_4_ = 0x7f800000;
      auVar417._24_4_ = 0x7f800000;
      auVar417._28_4_ = 0x7f800000;
      auVar419 = ZEXT3264(auVar417);
      auVar26 = vblendvps_avx(auVar55,auVar417,auVar26);
      auVar27 = vmaxps_avx(local_280,auVar233);
      auVar27 = vmaxps_avx(auVar27,auVar24);
      auVar26 = vminps_avx(local_600,auVar26);
      auVar394 = ZEXT3264(auVar26);
      auVar366 = ZEXT1232(auVar78) << 0x20;
      auVar24 = vsubps_avx(auVar366,local_9e0);
      auVar29 = vsubps_avx(auVar366,_local_a00);
      auVar56._4_4_ = auVar29._4_4_ * -fVar369;
      auVar56._0_4_ = auVar29._0_4_ * -fVar362;
      auVar56._8_4_ = auVar29._8_4_ * -fVar372;
      auVar56._12_4_ = auVar29._12_4_ * -fVar375;
      auVar56._16_4_ = auVar29._16_4_ * -fVar378;
      auVar56._20_4_ = auVar29._20_4_ * -fVar381;
      auVar56._24_4_ = auVar29._24_4_ * -fVar384;
      auVar56._28_4_ = auVar29._28_4_;
      auVar57._4_4_ = fVar342 * auVar24._4_4_;
      auVar57._0_4_ = fVar332 * auVar24._0_4_;
      auVar57._8_4_ = fVar345 * auVar24._8_4_;
      auVar57._12_4_ = fVar348 * auVar24._12_4_;
      auVar57._16_4_ = fVar351 * auVar24._16_4_;
      auVar57._20_4_ = fVar354 * auVar24._20_4_;
      auVar57._24_4_ = fVar357 * auVar24._24_4_;
      auVar57._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar56,auVar57);
      auVar23 = vsubps_avx(auVar366,auVar23);
      auVar58._4_4_ = fVar313 * auVar23._4_4_;
      auVar58._0_4_ = fVar301 * auVar23._0_4_;
      auVar58._8_4_ = fVar315 * auVar23._8_4_;
      auVar58._12_4_ = fVar318 * auVar23._12_4_;
      auVar58._16_4_ = fVar321 * auVar23._16_4_;
      auVar58._20_4_ = fVar324 * auVar23._20_4_;
      uVar8 = auVar23._28_4_;
      auVar58._24_4_ = fVar327 * auVar23._24_4_;
      auVar58._28_4_ = uVar8;
      auVar29 = vsubps_avx(auVar24,auVar58);
      auVar59._4_4_ = (float)local_800._4_4_ * -fVar369;
      auVar59._0_4_ = (float)local_800._0_4_ * -fVar362;
      auVar59._8_4_ = fStack_7f8 * -fVar372;
      auVar59._12_4_ = fStack_7f4 * -fVar375;
      auVar59._16_4_ = fStack_7f0 * -fVar378;
      auVar59._20_4_ = fStack_7ec * -fVar381;
      auVar59._24_4_ = fStack_7e8 * -fVar384;
      auVar59._28_4_ = local_ae0._28_4_ ^ 0x80000000;
      auVar60._4_4_ = (float)local_7e0._4_4_ * fVar342;
      auVar60._0_4_ = (float)local_7e0._0_4_ * fVar332;
      auVar60._8_4_ = fStack_7d8 * fVar345;
      auVar60._12_4_ = fStack_7d4 * fVar348;
      auVar60._16_4_ = fStack_7d0 * fVar351;
      auVar60._20_4_ = fStack_7cc * fVar354;
      auVar60._24_4_ = fStack_7c8 * fVar357;
      auVar60._28_4_ = uVar8;
      auVar24 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar313 * (float)local_7c0._4_4_;
      auVar61._0_4_ = fVar301 * (float)local_7c0._0_4_;
      auVar61._8_4_ = fVar315 * fStack_7b8;
      auVar61._12_4_ = fVar318 * fStack_7b4;
      auVar61._16_4_ = fVar321 * fStack_7b0;
      auVar61._20_4_ = fVar324 * fStack_7ac;
      auVar61._24_4_ = fVar327 * fStack_7a8;
      auVar61._28_4_ = uVar8;
      auVar253._8_4_ = 0x3f800000;
      auVar253._0_8_ = &DAT_3f8000003f800000;
      auVar253._12_4_ = 0x3f800000;
      auVar253._16_4_ = 0x3f800000;
      auVar253._20_4_ = 0x3f800000;
      auVar253._24_4_ = 0x3f800000;
      auVar253._28_4_ = 0x3f800000;
      auVar403 = ZEXT3264(auVar253);
      auVar30 = vsubps_avx(auVar24,auVar61);
      auVar24 = vrcpps_avx(auVar30);
      fVar236 = auVar24._0_4_;
      fVar237 = auVar24._4_4_;
      auVar62._4_4_ = auVar30._4_4_ * fVar237;
      auVar62._0_4_ = auVar30._0_4_ * fVar236;
      fVar258 = auVar24._8_4_;
      auVar62._8_4_ = auVar30._8_4_ * fVar258;
      fVar261 = auVar24._12_4_;
      auVar62._12_4_ = auVar30._12_4_ * fVar261;
      fVar260 = auVar24._16_4_;
      auVar62._16_4_ = auVar30._16_4_ * fVar260;
      fVar278 = auVar24._20_4_;
      auVar62._20_4_ = auVar30._20_4_ * fVar278;
      fVar296 = auVar24._24_4_;
      auVar62._24_4_ = auVar30._24_4_ * fVar296;
      auVar62._28_4_ = fStack_7a4;
      auVar31 = vsubps_avx(auVar253,auVar62);
      auVar125._8_4_ = 0x7fffffff;
      auVar125._0_8_ = 0x7fffffff7fffffff;
      auVar125._12_4_ = 0x7fffffff;
      auVar125._16_4_ = 0x7fffffff;
      auVar125._20_4_ = 0x7fffffff;
      auVar125._24_4_ = 0x7fffffff;
      auVar125._28_4_ = 0x7fffffff;
      auVar24 = vandps_avx(auVar30,auVar125);
      auVar23 = vcmpps_avx(auVar24,auVar432,1);
      auVar63._4_4_ = (fVar237 + fVar237 * auVar31._4_4_) * -auVar29._4_4_;
      auVar63._0_4_ = (fVar236 + fVar236 * auVar31._0_4_) * -auVar29._0_4_;
      auVar63._8_4_ = (fVar258 + fVar258 * auVar31._8_4_) * -auVar29._8_4_;
      auVar63._12_4_ = (fVar261 + fVar261 * auVar31._12_4_) * -auVar29._12_4_;
      auVar63._16_4_ = (fVar260 + fVar260 * auVar31._16_4_) * -auVar29._16_4_;
      auVar63._20_4_ = (fVar278 + fVar278 * auVar31._20_4_) * -auVar29._20_4_;
      auVar63._24_4_ = (fVar296 + fVar296 * auVar31._24_4_) * -auVar29._24_4_;
      auVar63._28_4_ = auVar29._28_4_ ^ 0x80000000;
      auVar24 = vcmpps_avx(auVar30,auVar366,1);
      auVar24 = vorps_avx(auVar23,auVar24);
      auVar126._8_4_ = 0xff800000;
      auVar126._0_8_ = 0xff800000ff800000;
      auVar126._12_4_ = 0xff800000;
      auVar126._16_4_ = 0xff800000;
      auVar126._20_4_ = 0xff800000;
      auVar126._24_4_ = 0xff800000;
      auVar126._28_4_ = 0xff800000;
      auVar24 = vblendvps_avx(auVar63,auVar126,auVar24);
      _local_9a0 = vmaxps_avx(auVar27,auVar24);
      auVar24 = vcmpps_avx(auVar30,ZEXT1232(auVar78) << 0x20,6);
      auVar24 = vorps_avx(auVar23,auVar24);
      auVar24 = vblendvps_avx(auVar63,auVar417,auVar24);
      auVar121 = vandps_avx(local_260,auVar121);
      local_2e0 = vminps_avx(auVar26,auVar24);
      auVar24 = vcmpps_avx(_local_9a0,local_2e0,2);
      auVar23 = auVar121 & auVar24;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar23 = vminps_avx(local_7a0,auVar154);
        auVar25 = vminps_avx(local_660,auVar25);
        auVar23 = vminps_avx(auVar23,auVar25);
        auVar23 = vsubps_avx(auVar23,local_560);
        auVar121 = vandps_avx(auVar24,auVar121);
        auVar98._4_4_ = local_520[1];
        auVar98._0_4_ = local_520[0];
        auVar98._8_4_ = local_520[2];
        auVar98._12_4_ = local_520[3];
        auVar98._16_4_ = fStack_510;
        auVar98._20_4_ = fStack_50c;
        auVar98._24_4_ = fStack_508;
        auVar98._28_4_ = fStack_504;
        auVar24 = vminps_avx(auVar98,auVar253);
        auVar24 = vmaxps_avx(auVar24,ZEXT832(0) << 0x20);
        local_520[0] = fVar277 + fVar424 * (auVar24._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar412 + fVar426 * (auVar24._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar422 + fVar429 * (auVar24._8_4_ + 2.0) * 0.125;
        local_520[3] = fStack_b44 + fVar172 * (auVar24._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar277 + fVar424 * (auVar24._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar412 + fVar426 * (auVar24._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar422 + fVar429 * (auVar24._24_4_ + 6.0) * 0.125;
        fStack_504 = fStack_b44 + auVar24._28_4_ + 7.0;
        auVar97._4_4_ = local_540[1];
        auVar97._0_4_ = local_540[0];
        auVar97._8_4_ = local_540[2];
        auVar97._12_4_ = local_540[3];
        auVar97._16_4_ = fStack_530;
        auVar97._20_4_ = fStack_52c;
        auVar97._24_4_ = fStack_528;
        auVar97._28_4_ = fStack_524;
        auVar24 = vminps_avx(auVar97,auVar253);
        auVar24 = vmaxps_avx(auVar24,ZEXT832(0) << 0x20);
        local_540[0] = fVar277 + fVar424 * (auVar24._0_4_ + 0.0) * 0.125;
        local_540[1] = fVar412 + fVar426 * (auVar24._4_4_ + 1.0) * 0.125;
        local_540[2] = fVar422 + fVar429 * (auVar24._8_4_ + 2.0) * 0.125;
        local_540[3] = fStack_b44 + fVar172 * (auVar24._12_4_ + 3.0) * 0.125;
        fStack_530 = fVar277 + fVar424 * (auVar24._16_4_ + 4.0) * 0.125;
        fStack_52c = fVar412 + fVar426 * (auVar24._20_4_ + 5.0) * 0.125;
        fStack_528 = fVar422 + fVar429 * (auVar24._24_4_ + 6.0) * 0.125;
        fStack_524 = fStack_b44 + auVar24._28_4_ + 7.0;
        auVar64._4_4_ = auVar23._4_4_ * 0.99999976;
        auVar64._0_4_ = auVar23._0_4_ * 0.99999976;
        auVar64._8_4_ = auVar23._8_4_ * 0.99999976;
        auVar64._12_4_ = auVar23._12_4_ * 0.99999976;
        auVar64._16_4_ = auVar23._16_4_ * 0.99999976;
        auVar64._20_4_ = auVar23._20_4_ * 0.99999976;
        auVar64._24_4_ = auVar23._24_4_ * 0.99999976;
        auVar64._28_4_ = 0x3f7ffffc;
        auVar24 = vmaxps_avx(ZEXT1232(auVar78) << 0x20,auVar64);
        auVar65._4_4_ = auVar24._4_4_ * auVar24._4_4_;
        auVar65._0_4_ = auVar24._0_4_ * auVar24._0_4_;
        auVar65._8_4_ = auVar24._8_4_ * auVar24._8_4_;
        auVar65._12_4_ = auVar24._12_4_ * auVar24._12_4_;
        auVar65._16_4_ = auVar24._16_4_ * auVar24._16_4_;
        auVar65._20_4_ = auVar24._20_4_ * auVar24._20_4_;
        auVar65._24_4_ = auVar24._24_4_ * auVar24._24_4_;
        auVar65._28_4_ = auVar24._28_4_;
        auVar23 = vsubps_avx(auVar28,auVar65);
        auVar66._4_4_ = auVar23._4_4_ * (float)local_680._4_4_;
        auVar66._0_4_ = auVar23._0_4_ * (float)local_680._0_4_;
        auVar66._8_4_ = auVar23._8_4_ * fStack_678;
        auVar66._12_4_ = auVar23._12_4_ * fStack_674;
        auVar66._16_4_ = auVar23._16_4_ * fStack_670;
        auVar66._20_4_ = auVar23._20_4_ * fStack_66c;
        auVar66._24_4_ = auVar23._24_4_ * fStack_668;
        auVar66._28_4_ = auVar24._28_4_;
        auVar25 = vsubps_avx(auVar48,auVar66);
        _local_880 = ZEXT432(0) << 0x20;
        local_aa0 = vcmpps_avx(auVar25,ZEXT832(0) << 0x20,5);
        fVar236 = local_9a0._28_4_;
        auVar24 = local_aa0;
        if ((((((((local_aa0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_aa0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_aa0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_aa0 >> 0x7f,0) == '\0') &&
              (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_aa0 >> 0xbf,0) == '\0') &&
            (local_aa0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_aa0[0x1f]) {
          _local_8a0 = ZEXT832(0) << 0x20;
          _local_680 = _local_8a0;
          auVar230 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar250 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar193._8_4_ = 0x7f800000;
          auVar193._0_8_ = 0x7f8000007f800000;
          auVar193._12_4_ = 0x7f800000;
          auVar193._16_4_ = 0x7f800000;
          auVar193._20_4_ = 0x7f800000;
          auVar193._24_4_ = 0x7f800000;
          auVar193._28_4_ = 0x7f800000;
          auVar267._8_4_ = 0xff800000;
          auVar267._0_8_ = 0xff800000ff800000;
          auVar267._12_4_ = 0xff800000;
          auVar267._16_4_ = 0xff800000;
          auVar267._20_4_ = 0xff800000;
          auVar267._24_4_ = 0xff800000;
          auVar267._28_4_ = 0xff800000;
          auVar388 = local_980;
          local_aa0 = auVar32;
        }
        else {
          auVar27 = vsqrtps_avx(auVar25);
          auVar251._0_4_ = fVar169 + fVar169;
          auVar251._4_4_ = fVar171 + fVar171;
          auVar251._8_4_ = fVar173 + fVar173;
          auVar251._12_4_ = fVar174 + fVar174;
          auVar251._16_4_ = fVar175 + fVar175;
          auVar251._20_4_ = fVar176 + fVar176;
          auVar251._24_4_ = fVar395 + fVar395;
          auVar251._28_4_ = fVar134 + fVar134;
          auVar26 = vrcpps_avx(auVar251);
          fVar134 = auVar26._0_4_;
          fVar237 = auVar26._4_4_;
          auVar67._4_4_ = auVar251._4_4_ * fVar237;
          auVar67._0_4_ = auVar251._0_4_ * fVar134;
          fVar258 = auVar26._8_4_;
          auVar67._8_4_ = auVar251._8_4_ * fVar258;
          fVar261 = auVar26._12_4_;
          auVar67._12_4_ = auVar251._12_4_ * fVar261;
          fVar260 = auVar26._16_4_;
          auVar67._16_4_ = auVar251._16_4_ * fVar260;
          fVar278 = auVar26._20_4_;
          auVar67._20_4_ = auVar251._20_4_ * fVar278;
          fVar296 = auVar26._24_4_;
          auVar67._24_4_ = auVar251._24_4_ * fVar296;
          auVar67._28_4_ = auVar251._28_4_;
          auVar28 = vsubps_avx(auVar253,auVar67);
          fVar134 = fVar134 + fVar134 * auVar28._0_4_;
          fVar237 = fVar237 + fVar237 * auVar28._4_4_;
          fVar258 = fVar258 + fVar258 * auVar28._8_4_;
          fVar261 = fVar261 + fVar261 * auVar28._12_4_;
          fVar260 = fVar260 + fVar260 * auVar28._16_4_;
          fVar278 = fVar278 + fVar278 * auVar28._20_4_;
          fVar296 = fVar296 + fVar296 * auVar28._24_4_;
          fVar298 = auVar26._28_4_ + auVar28._28_4_;
          auVar268._0_8_ = local_5e0._0_8_ ^ 0x8000000080000000;
          auVar268._8_4_ = -local_5e0._8_4_;
          auVar268._12_4_ = -local_5e0._12_4_;
          auVar268._16_4_ = -local_5e0._16_4_;
          auVar268._20_4_ = -local_5e0._20_4_;
          auVar268._24_4_ = -local_5e0._24_4_;
          auVar268._28_4_ = -local_5e0._28_4_;
          auVar26 = vsubps_avx(auVar268,auVar27);
          fVar412 = auVar26._0_4_ * fVar134;
          fVar422 = auVar26._4_4_ * fVar237;
          auVar68._4_4_ = fVar422;
          auVar68._0_4_ = fVar412;
          fVar424 = auVar26._8_4_ * fVar258;
          auVar68._8_4_ = fVar424;
          fVar426 = auVar26._12_4_ * fVar261;
          auVar68._12_4_ = fVar426;
          fVar169 = auVar26._16_4_ * fVar260;
          auVar68._16_4_ = fVar169;
          fVar429 = auVar26._20_4_ * fVar278;
          auVar68._20_4_ = fVar429;
          fVar171 = auVar26._24_4_ * fVar296;
          auVar68._24_4_ = fVar171;
          auVar68._28_4_ = 0x7f800000;
          auVar419 = ZEXT3264(auVar68);
          auVar27 = vsubps_avx(auVar27,local_5e0);
          fVar134 = auVar27._0_4_ * fVar134;
          fVar237 = auVar27._4_4_ * fVar237;
          auVar69._4_4_ = fVar237;
          auVar69._0_4_ = fVar134;
          fVar258 = auVar27._8_4_ * fVar258;
          auVar69._8_4_ = fVar258;
          fVar261 = auVar27._12_4_ * fVar261;
          auVar69._12_4_ = fVar261;
          fVar260 = auVar27._16_4_ * fVar260;
          auVar69._16_4_ = fVar260;
          fVar278 = auVar27._20_4_ * fVar278;
          auVar69._20_4_ = fVar278;
          fVar296 = auVar27._24_4_ * fVar296;
          auVar69._24_4_ = fVar296;
          auVar69._28_4_ = 0x3f800000;
          auVar403 = ZEXT3264(auVar69);
          fVar376 = fVar238 * (fVar412 * fVar420 + local_4e0._0_4_);
          fVar379 = fVar274 * (fVar422 * fVar423 + local_4e0._4_4_);
          fVar329 = fVar288 * (fVar424 * fVar425 + local_4e0._8_4_);
          fVar397 = fVar360 * (fVar426 * fVar427 + local_4e0._12_4_);
          fVar408 = fVar382 * (fVar169 * fVar428 + local_4e0._16_4_);
          fVar409 = fVar404 * (fVar429 * fVar430 + local_4e0._20_4_);
          fVar277 = fVar410 * (fVar171 * fVar132 + local_4e0._24_4_);
          auVar234._0_4_ = fVar177 + fVar221 * fVar376;
          auVar234._4_4_ = fVar200 + fVar257 * fVar379;
          auVar234._8_4_ = fVar203 + fVar259 * fVar329;
          auVar234._12_4_ = fVar206 + fVar294 * fVar397;
          auVar234._16_4_ = fVar209 + fVar373 * fVar408;
          auVar234._20_4_ = fVar212 + fVar396 * fVar409;
          auVar234._24_4_ = fVar215 + fVar407 * fVar277;
          auVar234._28_4_ = fVar218 + auVar27._28_4_ + local_4e0._28_4_;
          auVar70._4_4_ = (float)local_7c0._4_4_ * fVar422;
          auVar70._0_4_ = (float)local_7c0._0_4_ * fVar412;
          auVar70._8_4_ = fStack_7b8 * fVar424;
          auVar70._12_4_ = fStack_7b4 * fVar426;
          auVar70._16_4_ = fStack_7b0 * fVar169;
          auVar70._20_4_ = fStack_7ac * fVar429;
          auVar70._24_4_ = fStack_7a8 * fVar171;
          auVar70._28_4_ = fVar298;
          _local_a00 = vsubps_avx(auVar70,auVar234);
          auVar252._0_4_ = fVar178 + fVar168 * fVar376;
          auVar252._4_4_ = fVar201 + fVar239 * fVar379;
          auVar252._8_4_ = fVar204 + fVar275 * fVar329;
          auVar252._12_4_ = fVar207 + fVar290 * fVar397;
          auVar252._16_4_ = fVar210 + fVar367 * fVar408;
          auVar252._20_4_ = fVar213 + fVar385 * fVar409;
          auVar252._24_4_ = fVar216 + fVar405 * fVar277;
          auVar252._28_4_ = fVar219 + fVar298;
          auVar71._4_4_ = (float)local_7e0._4_4_ * fVar422;
          auVar71._0_4_ = (float)local_7e0._0_4_ * fVar412;
          auVar71._8_4_ = fStack_7d8 * fVar424;
          auVar71._12_4_ = fStack_7d4 * fVar426;
          auVar71._16_4_ = fStack_7d0 * fVar169;
          auVar71._20_4_ = fStack_7cc * fVar429;
          auVar71._24_4_ = fStack_7c8 * fVar171;
          auVar71._28_4_ = fVar236;
          auVar27 = vsubps_avx(auVar71,auVar252);
          auVar269._0_4_ = fVar179 + fVar170 * fVar376;
          auVar269._4_4_ = fVar202 + fVar256 * fVar379;
          auVar269._8_4_ = fVar205 + fVar276 * fVar329;
          auVar269._12_4_ = fVar208 + fVar292 * fVar397;
          auVar269._16_4_ = fVar211 + fVar370 * fVar408;
          auVar269._20_4_ = fVar214 + fVar390 * fVar409;
          auVar269._24_4_ = fVar217 + fVar406 * fVar277;
          auVar269._28_4_ = fVar220 + auVar26._28_4_;
          auVar72._4_4_ = (float)local_800._4_4_ * fVar422;
          auVar72._0_4_ = (float)local_800._0_4_ * fVar412;
          auVar72._8_4_ = fStack_7f8 * fVar424;
          auVar72._12_4_ = fStack_7f4 * fVar426;
          auVar72._16_4_ = fStack_7f0 * fVar169;
          auVar72._20_4_ = fStack_7ec * fVar429;
          auVar72._24_4_ = fStack_7e8 * fVar171;
          auVar72._28_4_ = fVar236;
          local_900 = vsubps_avx(auVar72,auVar269);
          fVar238 = fVar238 * (fVar134 * fVar420 + local_4e0._0_4_);
          fVar274 = fVar274 * (fVar237 * fVar423 + local_4e0._4_4_);
          fVar288 = fVar288 * (fVar258 * fVar425 + local_4e0._8_4_);
          fVar360 = fVar360 * (fVar261 * fVar427 + local_4e0._12_4_);
          fVar382 = fVar382 * (fVar260 * fVar428 + local_4e0._16_4_);
          fVar404 = fVar404 * (fVar278 * fVar430 + local_4e0._20_4_);
          fVar410 = fVar410 * (fVar296 * fVar132 + local_4e0._24_4_);
          auVar309._0_4_ = fVar177 + fVar221 * fVar238;
          auVar309._4_4_ = fVar200 + fVar257 * fVar274;
          auVar309._8_4_ = fVar203 + fVar259 * fVar288;
          auVar309._12_4_ = fVar206 + fVar294 * fVar360;
          auVar309._16_4_ = fVar209 + fVar373 * fVar382;
          auVar309._20_4_ = fVar212 + fVar396 * fVar404;
          auVar309._24_4_ = fVar215 + fVar407 * fVar410;
          auVar309._28_4_ = fVar218 + fVar236;
          auVar73._4_4_ = (float)local_7c0._4_4_ * fVar237;
          auVar73._0_4_ = (float)local_7c0._0_4_ * fVar134;
          auVar73._8_4_ = fStack_7b8 * fVar258;
          auVar73._12_4_ = fStack_7b4 * fVar261;
          auVar73._16_4_ = fStack_7b0 * fVar260;
          auVar73._20_4_ = fStack_7ac * fVar278;
          auVar73._24_4_ = fStack_7a8 * fVar296;
          auVar73._28_4_ = fStack_7a4;
          _local_880 = vsubps_avx(auVar73,auVar309);
          auVar310._0_4_ = fVar178 + fVar168 * fVar238;
          auVar310._4_4_ = fVar201 + fVar239 * fVar274;
          auVar310._8_4_ = fVar204 + fVar275 * fVar288;
          auVar310._12_4_ = fVar207 + fVar290 * fVar360;
          auVar310._16_4_ = fVar210 + fVar367 * fVar382;
          auVar310._20_4_ = fVar213 + fVar385 * fVar404;
          auVar310._24_4_ = fVar216 + fVar405 * fVar410;
          auVar310._28_4_ = fVar219 + local_880._28_4_;
          auVar74._4_4_ = (float)local_7e0._4_4_ * fVar237;
          auVar74._0_4_ = (float)local_7e0._0_4_ * fVar134;
          auVar74._8_4_ = fStack_7d8 * fVar258;
          auVar74._12_4_ = fStack_7d4 * fVar261;
          auVar74._16_4_ = fStack_7d0 * fVar260;
          auVar74._20_4_ = fStack_7cc * fVar278;
          auVar74._24_4_ = fStack_7c8 * fVar296;
          auVar74._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar74,auVar310);
          auVar270._0_4_ = fVar179 + fVar170 * fVar238;
          auVar270._4_4_ = fVar202 + fVar256 * fVar274;
          auVar270._8_4_ = fVar205 + fVar276 * fVar288;
          auVar270._12_4_ = fVar208 + fVar292 * fVar360;
          auVar270._16_4_ = fVar211 + fVar370 * fVar382;
          auVar270._20_4_ = fVar214 + fVar390 * fVar404;
          auVar270._24_4_ = fVar217 + fVar406 * fVar410;
          auVar270._28_4_ = fVar220 + local_900._28_4_ + local_4e0._28_4_;
          auVar75._4_4_ = (float)local_800._4_4_ * fVar237;
          auVar75._0_4_ = (float)local_800._0_4_ * fVar134;
          auVar75._8_4_ = fStack_7f8 * fVar258;
          auVar75._12_4_ = fStack_7f4 * fVar261;
          auVar75._16_4_ = fStack_7f0 * fVar260;
          auVar75._20_4_ = fStack_7ec * fVar278;
          auVar75._24_4_ = fStack_7e8 * fVar296;
          auVar75._28_4_ = local_8a0._28_4_;
          _local_680 = vsubps_avx(auVar75,auVar270);
          auVar26 = vcmpps_avx(auVar25,_DAT_02020f00,5);
          auVar194._8_4_ = 0x7f800000;
          auVar194._0_8_ = 0x7f8000007f800000;
          auVar194._12_4_ = 0x7f800000;
          auVar194._16_4_ = 0x7f800000;
          auVar194._20_4_ = 0x7f800000;
          auVar194._24_4_ = 0x7f800000;
          auVar194._28_4_ = 0x7f800000;
          auVar193 = vblendvps_avx(auVar194,auVar68,auVar26);
          auVar337._8_4_ = 0x7fffffff;
          auVar337._0_8_ = 0x7fffffff7fffffff;
          auVar337._12_4_ = 0x7fffffff;
          auVar337._16_4_ = 0x7fffffff;
          auVar337._20_4_ = 0x7fffffff;
          auVar337._24_4_ = 0x7fffffff;
          auVar337._28_4_ = 0x7fffffff;
          auVar25 = vandps_avx(auVar337,local_2c0);
          auVar25 = vmaxps_avx(local_4c0,auVar25);
          auVar388._8_4_ = 0x36000000;
          auVar388._0_8_ = 0x3600000036000000;
          auVar388._12_4_ = 0x36000000;
          auVar388._16_4_ = 0x36000000;
          auVar388._20_4_ = 0x36000000;
          auVar388._24_4_ = 0x36000000;
          auVar388._28_4_ = 0x36000000;
          auVar76._4_4_ = auVar25._4_4_ * 1.9073486e-06;
          auVar76._0_4_ = auVar25._0_4_ * 1.9073486e-06;
          auVar76._8_4_ = auVar25._8_4_ * 1.9073486e-06;
          auVar76._12_4_ = auVar25._12_4_ * 1.9073486e-06;
          auVar76._16_4_ = auVar25._16_4_ * 1.9073486e-06;
          auVar76._20_4_ = auVar25._20_4_ * 1.9073486e-06;
          auVar76._24_4_ = auVar25._24_4_ * 1.9073486e-06;
          auVar76._28_4_ = auVar25._28_4_;
          auVar25 = vandps_avx(auVar337,local_6a0);
          auVar25 = vcmpps_avx(auVar25,auVar76,1);
          auVar271._8_4_ = 0xff800000;
          auVar271._0_8_ = 0xff800000ff800000;
          auVar271._12_4_ = 0xff800000;
          auVar271._16_4_ = 0xff800000;
          auVar271._20_4_ = 0xff800000;
          auVar271._24_4_ = 0xff800000;
          auVar271._28_4_ = 0xff800000;
          auVar267 = vblendvps_avx(auVar271,auVar69,auVar26);
          auVar28 = auVar26 & auVar25;
          if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0x7f,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0xbf,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar28[0x1f] < '\0') {
            auVar24 = vandps_avx(auVar25,auVar26);
            auVar140 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
            auVar78 = ZEXT412(0);
            auVar419 = ZEXT1264(auVar78) << 0x20;
            auVar388 = vcmpps_avx(auVar23,ZEXT1232(auVar78) << 0x20,2);
            auVar433._8_4_ = 0xff800000;
            auVar433._0_8_ = 0xff800000ff800000;
            auVar433._12_4_ = 0xff800000;
            auVar433._16_4_ = 0xff800000;
            auVar433._20_4_ = 0xff800000;
            auVar433._24_4_ = 0xff800000;
            auVar433._28_4_ = 0xff800000;
            auVar434._8_4_ = 0x7f800000;
            auVar434._0_8_ = 0x7f8000007f800000;
            auVar434._12_4_ = 0x7f800000;
            auVar434._16_4_ = 0x7f800000;
            auVar434._20_4_ = 0x7f800000;
            auVar434._24_4_ = 0x7f800000;
            auVar434._28_4_ = 0x7f800000;
            auVar122 = vblendvps_avx(auVar434,auVar433,auVar388);
            auVar225 = vpmovsxwd_avx(auVar140);
            auVar403 = ZEXT1664(auVar225);
            auVar140 = vpunpckhwd_avx(auVar140,auVar140);
            auVar339._16_16_ = auVar140;
            auVar339._0_16_ = auVar225;
            auVar193 = vblendvps_avx(auVar193,auVar122,auVar339);
            auVar122 = vblendvps_avx(auVar433,auVar434,auVar388);
            auVar267 = vblendvps_avx(auVar267,auVar122,auVar339);
            auVar23 = vcmpps_avx(ZEXT1232(auVar78) << 0x20,ZEXT1232(auVar78) << 0x20,0xf);
            auVar167._0_4_ = auVar23._0_4_ ^ auVar24._0_4_;
            auVar167._4_4_ = auVar23._4_4_ ^ auVar24._4_4_;
            auVar167._8_4_ = auVar23._8_4_ ^ auVar24._8_4_;
            auVar167._12_4_ = auVar23._12_4_ ^ auVar24._12_4_;
            auVar167._16_4_ = auVar23._16_4_ ^ auVar24._16_4_;
            auVar167._20_4_ = auVar23._20_4_ ^ auVar24._20_4_;
            auVar167._24_4_ = auVar23._24_4_ ^ auVar24._24_4_;
            auVar167._28_4_ = auVar23._28_4_ ^ auVar24._28_4_;
            auVar24 = vorps_avx(auVar388,auVar167);
            auVar24 = vandps_avx(auVar26,auVar24);
          }
          auVar394 = ZEXT3264(auVar122);
          auVar230 = local_a00._0_28_;
          auVar250 = auVar27._0_28_;
          auVar364 = local_900._0_28_;
          local_9e0 = auVar121;
        }
        auVar389 = ZEXT3264(auVar388);
        _local_340 = _local_9a0;
        local_320 = vminps_avx(local_2e0,auVar193);
        _local_300 = vmaxps_avx(_local_9a0,auVar267);
        auVar340 = ZEXT3264(_local_300);
        auVar122 = vcmpps_avx(_local_9a0,local_320,2);
        local_560 = vandps_avx(auVar122,auVar121);
        local_620 = local_560;
        auVar23 = vcmpps_avx(_local_300,local_2e0,2);
        local_640 = vandps_avx(auVar23,auVar121);
        auVar121 = vorps_avx(local_640,local_560);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          local_5c0 = local_640;
          _local_5a0 = _local_300;
          local_840 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_600._0_4_ = auVar24._0_4_ ^ local_840._0_4_;
          local_600._4_4_ = auVar24._4_4_ ^ local_840._4_4_;
          local_600._8_4_ = auVar24._8_4_ ^ local_840._8_4_;
          local_600._12_4_ = auVar24._12_4_ ^ local_840._12_4_;
          local_600._16_4_ = auVar24._16_4_ ^ local_840._16_4_;
          local_600._20_4_ = auVar24._20_4_ ^ local_840._20_4_;
          local_600._24_4_ = auVar24._24_4_ ^ local_840._24_4_;
          local_600._28_4_ = (uint)auVar24._28_4_ ^ (uint)local_840._28_4_;
          auVar128._0_4_ =
               auVar230._0_4_ * (float)local_7c0._0_4_ +
               auVar250._0_4_ * (float)local_7e0._0_4_ + auVar364._0_4_ * (float)local_800._0_4_;
          auVar128._4_4_ =
               auVar230._4_4_ * (float)local_7c0._4_4_ +
               auVar250._4_4_ * (float)local_7e0._4_4_ + auVar364._4_4_ * (float)local_800._4_4_;
          auVar128._8_4_ =
               auVar230._8_4_ * fStack_7b8 +
               auVar250._8_4_ * fStack_7d8 + auVar364._8_4_ * fStack_7f8;
          auVar128._12_4_ =
               auVar230._12_4_ * fStack_7b4 +
               auVar250._12_4_ * fStack_7d4 + auVar364._12_4_ * fStack_7f4;
          auVar128._16_4_ =
               auVar230._16_4_ * fStack_7b0 +
               auVar250._16_4_ * fStack_7d0 + auVar364._16_4_ * fStack_7f0;
          auVar128._20_4_ =
               auVar230._20_4_ * fStack_7ac +
               auVar250._20_4_ * fStack_7cc + auVar364._20_4_ * fStack_7ec;
          auVar128._24_4_ =
               auVar230._24_4_ * fStack_7a8 +
               auVar250._24_4_ * fStack_7c8 + auVar364._24_4_ * fStack_7e8;
          auVar128._28_4_ = local_840._28_4_ + auVar24._28_4_ + auVar122._28_4_;
          auVar155._8_4_ = 0x7fffffff;
          auVar155._0_8_ = 0x7fffffff7fffffff;
          auVar155._12_4_ = 0x7fffffff;
          auVar155._16_4_ = 0x7fffffff;
          auVar155._20_4_ = 0x7fffffff;
          auVar155._24_4_ = 0x7fffffff;
          auVar155._28_4_ = 0x7fffffff;
          auVar121 = vandps_avx(auVar128,auVar155);
          auVar156._8_4_ = 0x3e99999a;
          auVar156._0_8_ = 0x3e99999a3e99999a;
          auVar156._12_4_ = 0x3e99999a;
          auVar156._16_4_ = 0x3e99999a;
          auVar156._20_4_ = 0x3e99999a;
          auVar156._24_4_ = 0x3e99999a;
          auVar156._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar156,1);
          auVar121 = vorps_avx(auVar121,local_600);
          auVar157._8_4_ = 3;
          auVar157._0_8_ = 0x300000003;
          auVar157._12_4_ = 3;
          auVar157._16_4_ = 3;
          auVar157._20_4_ = 3;
          auVar157._24_4_ = 3;
          auVar157._28_4_ = 3;
          auVar196._8_4_ = 2;
          auVar196._0_8_ = 0x200000002;
          auVar196._12_4_ = 2;
          auVar196._16_4_ = 2;
          auVar196._20_4_ = 2;
          auVar196._24_4_ = 2;
          auVar196._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar196,auVar157,auVar121);
          local_5e0 = ZEXT432((uint)uVar104);
          auVar225 = vpshufd_avx(ZEXT416((uint)uVar104),0);
          auVar140 = vpcmpgtd_avx(auVar121._16_16_,auVar225);
          local_6a0._0_16_ = auVar225;
          auVar225 = vpcmpgtd_avx(auVar121._0_16_,auVar225);
          auVar158._16_16_ = auVar140;
          auVar158._0_16_ = auVar225;
          local_580 = vblendps_avx(ZEXT1632(auVar225),auVar158,0xf0);
          local_620 = vandnps_avx(local_580,local_560);
          auVar121 = local_560 & ~local_580;
          auVar255 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar311 = ZEXT864(0) << 0x20;
          local_660._0_8_ = uVar104;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            local_820._4_4_ = (float)local_860._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = (float)local_860._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = fStack_858 + fStack_998;
            fStack_814 = fStack_854 + fStack_994;
            fStack_810 = fStack_850 + fStack_990;
            fStack_80c = fStack_84c + fStack_98c;
            fStack_808 = fStack_848 + fStack_988;
            fStack_804 = fStack_844 + fVar236;
            do {
              auVar242 = auVar255._0_16_;
              auVar159._8_4_ = 0x7f800000;
              auVar159._0_8_ = 0x7f8000007f800000;
              auVar159._12_4_ = 0x7f800000;
              auVar159._16_4_ = 0x7f800000;
              auVar159._20_4_ = 0x7f800000;
              auVar159._24_4_ = 0x7f800000;
              auVar159._28_4_ = 0x7f800000;
              auVar121 = vblendvps_avx(auVar159,_local_9a0,local_620);
              auVar122 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar122 = vminps_avx(auVar121,auVar122);
              auVar24 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar24);
              auVar24 = vperm2f128_avx(auVar122,auVar122,1);
              auVar122 = vminps_avx(auVar122,auVar24);
              auVar122 = vcmpps_avx(auVar121,auVar122,0);
              auVar24 = local_620 & auVar122;
              auVar121 = local_620;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar122,local_620);
              }
              uVar102 = vmovmskps_avx(auVar121);
              uVar16 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar104 = (ulong)uVar16;
              *(undefined4 *)(local_620 + uVar104 * 4) = 0;
              fVar134 = local_520[uVar104];
              uVar16 = *(uint *)(local_340 + uVar104 * 4);
              fVar168 = local_b04;
              if ((float)local_920._0_4_ < 0.0) {
                fVar168 = sqrtf((float)local_920._0_4_);
                auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar242._8_4_ = 0x7fffffff;
                auVar242._0_8_ = 0x7fffffff7fffffff;
                auVar242._12_4_ = 0x7fffffff;
              }
              auVar403 = ZEXT464(uVar16);
              auVar394 = ZEXT464((uint)fVar134);
              auVar225 = vminps_avx(_local_a40,_local_a60);
              auVar140 = vmaxps_avx(_local_a40,_local_a60);
              auVar112 = vminps_avx(_local_a50,_local_a70);
              auVar141 = vminps_avx(auVar225,auVar112);
              auVar225 = vmaxps_avx(_local_a50,_local_a70);
              auVar112 = vmaxps_avx(auVar140,auVar225);
              auVar140 = vandps_avx(auVar141,auVar242);
              auVar225 = vandps_avx(auVar112,auVar242);
              auVar140 = vmaxps_avx(auVar140,auVar225);
              auVar225 = vmovshdup_avx(auVar140);
              auVar225 = vmaxss_avx(auVar225,auVar140);
              auVar140 = vshufpd_avx(auVar140,auVar140,1);
              auVar140 = vmaxss_avx(auVar140,auVar225);
              local_9e0._0_4_ = auVar140._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar168 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar112,auVar112,0xff);
              lVar103 = 4;
              do {
                auVar140 = vshufps_avx(auVar403._0_16_,auVar403._0_16_,0);
                auVar111._0_4_ = auVar140._0_4_ * (float)local_910._0_4_ + 0.0;
                auVar111._4_4_ = auVar140._4_4_ * (float)local_910._4_4_ + 0.0;
                auVar111._8_4_ = auVar140._8_4_ * fStack_908 + 0.0;
                auVar111._12_4_ = auVar140._12_4_ * fStack_904 + 0.0;
                fVar221 = auVar394._0_4_;
                fVar170 = 1.0 - fVar221;
                fVar134 = fVar221 * fVar221;
                fVar168 = fVar221 * 3.0;
                local_ac0._0_4_ = fVar170 * fVar170;
                auVar140 = ZEXT416((uint)(fVar221 * fVar221 * -fVar170 * 0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar225 = ZEXT416((uint)((fVar170 * fVar170 * (fVar170 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar112 = ZEXT416((uint)((fVar134 * (fVar168 + -5.0) + 2.0) * 0.5));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar141 = ZEXT416((uint)(fVar170 * fVar170 * -fVar221 * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar184._0_4_ =
                     auVar141._0_4_ * (float)local_a40._0_4_ +
                     auVar112._0_4_ * (float)local_a60._0_4_ +
                     auVar225._0_4_ * (float)local_a50._0_4_ +
                     auVar140._0_4_ * (float)local_a70._0_4_;
                auVar184._4_4_ =
                     auVar141._4_4_ * (float)local_a40._4_4_ +
                     auVar112._4_4_ * (float)local_a60._4_4_ +
                     auVar225._4_4_ * (float)local_a50._4_4_ +
                     auVar140._4_4_ * (float)local_a70._4_4_;
                auVar184._8_4_ =
                     auVar141._8_4_ * fStack_a38 +
                     auVar112._8_4_ * fStack_a58 +
                     auVar225._8_4_ * fStack_a48 + auVar140._8_4_ * fStack_a68;
                auVar184._12_4_ =
                     auVar141._12_4_ * fStack_a34 +
                     auVar112._12_4_ * fStack_a54 +
                     auVar225._12_4_ * fStack_a44 + auVar140._12_4_ * fStack_a64;
                local_900._0_16_ = auVar184;
                auVar140 = vsubps_avx(auVar111,auVar184);
                _local_a00 = auVar140;
                auVar140 = vdpps_avx(auVar140,auVar140,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(fVar221 * -9.0 + 4.0));
                fVar236 = auVar140._0_4_;
                local_be0 = auVar403._0_4_;
                if (fVar236 < 0.0) {
                  local_ae0._0_4_ = fVar134;
                  local_b00._0_16_ = ZEXT416((uint)fVar170);
                  local_940._0_4_ = fVar168;
                  local_960._0_4_ = fVar221 * 9.0;
                  local_980._0_4_ = fVar170 * -2.0;
                  fVar237 = sqrtf(fVar236);
                  auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar256 = (float)local_960._0_4_;
                  fVar238 = (float)local_980._0_4_;
                  fVar134 = (float)local_ae0._0_4_;
                  fVar239 = (float)local_940._0_4_;
                  fVar170 = (float)local_b00._0_4_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar140,auVar140);
                  fVar237 = auVar225._0_4_;
                  fVar256 = fVar221 * 9.0;
                  fVar238 = fVar170 * -2.0;
                  fVar239 = fVar168;
                }
                auVar225 = ZEXT416((uint)((fVar134 + fVar238 * fVar221) * 0.5));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar112 = ZEXT416((uint)(((fVar170 + fVar170) * (fVar239 + 2.0) +
                                          fVar170 * fVar170 * -3.0) * 0.5));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar141 = ZEXT416((uint)(((fVar221 + fVar221) * (fVar168 + -5.0) +
                                          fVar221 * fVar239) * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar142 = ZEXT416((uint)((fVar221 * (fVar170 + fVar170) - (float)local_ac0._0_4_) *
                                         0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar414._0_4_ =
                     (float)local_a40._0_4_ * auVar142._0_4_ +
                     (float)local_a60._0_4_ * auVar141._0_4_ +
                     (float)local_a70._0_4_ * auVar225._0_4_ +
                     (float)local_a50._0_4_ * auVar112._0_4_;
                auVar414._4_4_ =
                     (float)local_a40._4_4_ * auVar142._4_4_ +
                     (float)local_a60._4_4_ * auVar141._4_4_ +
                     (float)local_a70._4_4_ * auVar225._4_4_ +
                     (float)local_a50._4_4_ * auVar112._4_4_;
                auVar414._8_4_ =
                     fStack_a38 * auVar142._8_4_ +
                     fStack_a58 * auVar141._8_4_ +
                     fStack_a68 * auVar225._8_4_ + fStack_a48 * auVar112._8_4_;
                auVar414._12_4_ =
                     fStack_a34 * auVar142._12_4_ +
                     fStack_a54 * auVar141._12_4_ +
                     fStack_a64 * auVar225._12_4_ + fStack_a44 * auVar112._12_4_;
                auVar142 = vpermilps_avx(ZEXT416((uint)(fVar168 + -1.0)),0);
                auVar17 = vpermilps_avx(local_aa0._0_16_,0);
                auVar225 = vshufps_avx(ZEXT416((uint)(fVar256 + -5.0)),
                                       ZEXT416((uint)(fVar256 + -5.0)),0);
                auVar112 = ZEXT416((uint)(fVar221 * -3.0 + 2.0));
                auVar141 = vshufps_avx(auVar112,auVar112,0);
                auVar112 = vdpps_avx(auVar414,auVar414,0x7f);
                auVar143._0_4_ =
                     (float)local_a40._0_4_ * auVar141._0_4_ +
                     (float)local_a60._0_4_ * auVar225._0_4_ +
                     (float)local_a50._0_4_ * auVar17._0_4_ +
                     (float)local_a70._0_4_ * auVar142._0_4_;
                auVar143._4_4_ =
                     (float)local_a40._4_4_ * auVar141._4_4_ +
                     (float)local_a60._4_4_ * auVar225._4_4_ +
                     (float)local_a50._4_4_ * auVar17._4_4_ +
                     (float)local_a70._4_4_ * auVar142._4_4_;
                auVar143._8_4_ =
                     fStack_a38 * auVar141._8_4_ +
                     fStack_a58 * auVar225._8_4_ +
                     fStack_a48 * auVar17._8_4_ + fStack_a68 * auVar142._8_4_;
                auVar143._12_4_ =
                     fStack_a34 * auVar141._12_4_ +
                     fStack_a54 * auVar225._12_4_ +
                     fStack_a44 * auVar17._12_4_ + fStack_a64 * auVar142._12_4_;
                auVar225 = vblendps_avx(auVar112,_DAT_01feba10,0xe);
                auVar141 = vrsqrtss_avx(auVar225,auVar225);
                fVar168 = auVar141._0_4_;
                fVar134 = auVar112._0_4_;
                auVar141 = vdpps_avx(auVar414,auVar143,0x7f);
                auVar142 = vshufps_avx(auVar112,auVar112,0);
                auVar144._0_4_ = auVar143._0_4_ * auVar142._0_4_;
                auVar144._4_4_ = auVar143._4_4_ * auVar142._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar142._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar142._12_4_;
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar243._0_4_ = auVar414._0_4_ * auVar141._0_4_;
                auVar243._4_4_ = auVar414._4_4_ * auVar141._4_4_;
                auVar243._8_4_ = auVar414._8_4_ * auVar141._8_4_;
                auVar243._12_4_ = auVar414._12_4_ * auVar141._12_4_;
                auVar17 = vsubps_avx(auVar144,auVar243);
                auVar141 = vrcpss_avx(auVar225,auVar225);
                auVar225 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(local_be0 * (float)local_780._0_4_)));
                auVar389 = ZEXT1664(auVar225);
                auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar134 * auVar141._0_4_)));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                uVar104 = CONCAT44(auVar414._4_4_,auVar414._0_4_);
                auVar263._0_8_ = uVar104 ^ 0x8000000080000000;
                auVar263._8_4_ = -auVar414._8_4_;
                auVar263._12_4_ = -auVar414._12_4_;
                auVar142 = ZEXT416((uint)(fVar168 * 1.5 +
                                         fVar134 * -0.5 * fVar168 * fVar168 * fVar168));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar226._0_4_ = auVar142._0_4_ * auVar17._0_4_ * auVar141._0_4_;
                auVar226._4_4_ = auVar142._4_4_ * auVar17._4_4_ * auVar141._4_4_;
                auVar226._8_4_ = auVar142._8_4_ * auVar17._8_4_ * auVar141._8_4_;
                auVar226._12_4_ = auVar142._12_4_ * auVar17._12_4_ * auVar141._12_4_;
                auVar283._0_4_ = auVar414._0_4_ * auVar142._0_4_;
                auVar283._4_4_ = auVar414._4_4_ * auVar142._4_4_;
                auVar283._8_4_ = auVar414._8_4_ * auVar142._8_4_;
                auVar283._12_4_ = auVar414._12_4_ * auVar142._12_4_;
                local_aa0._0_4_ = auVar225._0_4_;
                if (fVar134 < 0.0) {
                  local_ac0._0_16_ = auVar263;
                  local_ae0._0_16_ = auVar283;
                  local_b00._0_16_ = auVar226;
                  fVar134 = sqrtf(fVar134);
                  auVar389 = ZEXT464((uint)local_aa0._0_4_);
                  auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar226 = local_b00._0_16_;
                  auVar263 = local_ac0._0_16_;
                  auVar283 = local_ae0._0_16_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar112,auVar112);
                  fVar134 = auVar225._0_4_;
                }
                auVar225 = vdpps_avx(_local_a00,auVar283,0x7f);
                fVar134 = ((float)local_9e0._0_4_ / fVar134) * (fVar237 + 1.0) +
                          auVar389._0_4_ + fVar237 * (float)local_9e0._0_4_;
                auVar112 = vdpps_avx(auVar263,auVar283,0x7f);
                auVar141 = vdpps_avx(_local_a00,auVar226,0x7f);
                auVar142 = vdpps_avx(_local_910,auVar283,0x7f);
                auVar17 = vdpps_avx(_local_a00,auVar263,0x7f);
                fVar168 = auVar112._0_4_ + auVar141._0_4_;
                fVar170 = auVar225._0_4_;
                auVar113._0_4_ = fVar170 * fVar170;
                auVar113._4_4_ = auVar225._4_4_ * auVar225._4_4_;
                auVar113._8_4_ = auVar225._8_4_ * auVar225._8_4_;
                auVar113._12_4_ = auVar225._12_4_ * auVar225._12_4_;
                auVar141 = vsubps_avx(auVar140,auVar113);
                auVar112 = vdpps_avx(_local_a00,_local_910,0x7f);
                fVar237 = auVar17._0_4_ - fVar170 * fVar168;
                fVar238 = auVar112._0_4_ - fVar170 * auVar142._0_4_;
                auVar112 = vrsqrtss_avx(auVar141,auVar141);
                fVar239 = auVar141._0_4_;
                fVar170 = auVar112._0_4_;
                fVar170 = fVar170 * 1.5 + fVar239 * -0.5 * fVar170 * fVar170 * fVar170;
                if (fVar239 < 0.0) {
                  local_ac0._0_4_ = fVar134;
                  local_ae0._0_16_ = ZEXT416((uint)fVar168);
                  local_b00._0_16_ = auVar142;
                  local_940._0_4_ = fVar237;
                  local_960._0_4_ = fVar238;
                  local_980._0_4_ = fVar170;
                  fVar239 = sqrtf(fVar239);
                  auVar389 = ZEXT464((uint)local_aa0._0_4_);
                  auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar170 = (float)local_980._0_4_;
                  fVar237 = (float)local_940._0_4_;
                  fVar238 = (float)local_960._0_4_;
                  auVar142 = local_b00._0_16_;
                  fVar134 = (float)local_ac0._0_4_;
                  auVar112 = local_ae0._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar141,auVar141);
                  fVar239 = auVar112._0_4_;
                  auVar112 = ZEXT416((uint)fVar168);
                }
                auVar419 = ZEXT1664(auVar225);
                auVar340 = ZEXT1664(auVar140);
                auVar145 = vpermilps_avx(local_900._0_16_,0xff);
                auVar18 = vshufps_avx(auVar414,auVar414,0xff);
                fVar168 = fVar237 * fVar170 - auVar18._0_4_;
                auVar244._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar244._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar244._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar264._0_4_ = -fVar168;
                auVar264._4_4_ = 0x80000000;
                auVar264._8_4_ = 0x80000000;
                auVar264._12_4_ = 0x80000000;
                auVar141 = vinsertps_avx(ZEXT416((uint)(fVar238 * fVar170)),auVar244,0x10);
                auVar17 = vmovsldup_avx(ZEXT416((uint)(auVar112._0_4_ * fVar238 * fVar170 -
                                                      auVar142._0_4_ * fVar168)));
                auVar141 = vdivps_avx(auVar141,auVar17);
                auVar145 = ZEXT416((uint)(fVar239 - auVar145._0_4_));
                auVar142 = vinsertps_avx(auVar225,auVar145,0x10);
                auVar227._0_4_ = auVar142._0_4_ * auVar141._0_4_;
                auVar227._4_4_ = auVar142._4_4_ * auVar141._4_4_;
                auVar227._8_4_ = auVar142._8_4_ * auVar141._8_4_;
                auVar227._12_4_ = auVar142._12_4_ * auVar141._12_4_;
                auVar112 = vinsertps_avx(auVar264,auVar112,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar17);
                auVar185._0_4_ = auVar142._0_4_ * auVar112._0_4_;
                auVar185._4_4_ = auVar142._4_4_ * auVar112._4_4_;
                auVar185._8_4_ = auVar142._8_4_ * auVar112._8_4_;
                auVar185._12_4_ = auVar142._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar227,auVar227);
                auVar141 = vhaddps_avx(auVar185,auVar185);
                fVar221 = fVar221 - auVar112._0_4_;
                local_be0 = local_be0 - auVar141._0_4_;
                auVar403 = ZEXT464((uint)local_be0);
                auVar245._8_4_ = 0x7fffffff;
                auVar245._0_8_ = 0x7fffffff7fffffff;
                auVar245._12_4_ = 0x7fffffff;
                auVar255 = ZEXT1664(auVar245);
                auVar112 = vandps_avx(auVar225,auVar245);
                if (fVar134 <= auVar112._0_4_) {
LAB_0106ea20:
                  bVar77 = false;
                }
                else {
                  auVar112 = vandps_avx(auVar145,auVar245);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar389._0_4_ + fVar134 <=
                      auVar112._0_4_) goto LAB_0106ea20;
                  local_be0 = local_be0 + (float)local_8c0._0_4_;
                  auVar403 = ZEXT464((uint)local_be0);
                  bVar77 = true;
                  if ((((fVar133 <= local_be0) &&
                       (fVar134 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar134)) &&
                      (0.0 <= fVar221)) && (fVar221 <= 1.0)) {
                    auVar112 = vrsqrtss_avx(auVar140,auVar140);
                    fVar168 = auVar112._0_4_;
                    pGVar11 = (context->scene->geometries).items[uVar99].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar112 = ZEXT416((uint)(fVar168 * 1.5 +
                                               fVar236 * -0.5 * fVar168 * fVar168 * fVar168));
                      auVar112 = vshufps_avx(auVar112,auVar112,0);
                      auVar146._0_4_ = auVar112._0_4_ * (float)local_a00._0_4_;
                      auVar146._4_4_ = auVar112._4_4_ * (float)local_a00._4_4_;
                      auVar146._8_4_ = auVar112._8_4_ * fStack_9f8;
                      auVar146._12_4_ = auVar112._12_4_ * fStack_9f4;
                      auVar114._0_4_ = auVar414._0_4_ + auVar18._0_4_ * auVar146._0_4_;
                      auVar114._4_4_ = auVar414._4_4_ + auVar18._4_4_ * auVar146._4_4_;
                      auVar114._8_4_ = auVar414._8_4_ + auVar18._8_4_ * auVar146._8_4_;
                      auVar114._12_4_ = auVar414._12_4_ + auVar18._12_4_ * auVar146._12_4_;
                      auVar112 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar141 = vshufps_avx(auVar414,auVar414,0xc9);
                      auVar147._0_4_ = auVar141._0_4_ * auVar146._0_4_;
                      auVar147._4_4_ = auVar141._4_4_ * auVar146._4_4_;
                      auVar147._8_4_ = auVar141._8_4_ * auVar146._8_4_;
                      auVar147._12_4_ = auVar141._12_4_ * auVar146._12_4_;
                      auVar186._0_4_ = auVar414._0_4_ * auVar112._0_4_;
                      auVar186._4_4_ = auVar414._4_4_ * auVar112._4_4_;
                      auVar186._8_4_ = auVar414._8_4_ * auVar112._8_4_;
                      auVar186._12_4_ = auVar414._12_4_ * auVar112._12_4_;
                      auVar142 = vsubps_avx(auVar186,auVar147);
                      auVar112 = vshufps_avx(auVar142,auVar142,0xc9);
                      auVar141 = vshufps_avx(auVar114,auVar114,0xc9);
                      auVar187._0_4_ = auVar141._0_4_ * auVar112._0_4_;
                      auVar187._4_4_ = auVar141._4_4_ * auVar112._4_4_;
                      auVar187._8_4_ = auVar141._8_4_ * auVar112._8_4_;
                      auVar187._12_4_ = auVar141._12_4_ * auVar112._12_4_;
                      auVar112 = vshufps_avx(auVar142,auVar142,0xd2);
                      auVar115._0_4_ = auVar114._0_4_ * auVar112._0_4_;
                      auVar115._4_4_ = auVar114._4_4_ * auVar112._4_4_;
                      auVar115._8_4_ = auVar114._8_4_ * auVar112._8_4_;
                      auVar115._12_4_ = auVar114._12_4_ * auVar112._12_4_;
                      auVar112 = vsubps_avx(auVar187,auVar115);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar8 = vextractps_avx(auVar112,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar112,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar112._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar221;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9a8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar99;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar141 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
                        local_740 = (RTCHitN  [16])vshufps_avx(auVar112,auVar112,0x55);
                        auVar142 = vshufps_avx(auVar112,auVar112,0xaa);
                        local_720 = vshufps_avx(auVar112,auVar112,0);
                        auStack_730 = auVar142;
                        local_710 = auVar141;
                        local_700 = ZEXT816(0) << 0x20;
                        local_6f0 = local_760._0_8_;
                        uStack_6e8 = local_760._8_8_;
                        local_6e0 = local_750._0_8_;
                        uStack_6d8 = local_750._8_8_;
                        uVar16 = context->user->instID[0];
                        _local_6d0 = CONCAT44(uVar16,uVar16);
                        _uStack_6c8 = CONCAT44(uVar16,uVar16);
                        uVar16 = context->user->instPrimID[0];
                        _uStack_6c0 = CONCAT44(uVar16,uVar16);
                        _uStack_6b8 = CONCAT44(uVar16,uVar16);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b20 = *local_9b0;
                        uStack_b18 = local_9b0[1];
                        local_a30.valid = (int *)&local_b20;
                        local_a30.geometryUserPtr = pGVar11->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_740;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar340 = ZEXT1664(auVar140);
                          auVar389 = ZEXT1664(auVar389._0_16_);
                          auVar419 = ZEXT1664(auVar225);
                          (*pGVar11->intersectionFilterN)(&local_a30);
                          auVar255._8_56_ = extraout_var;
                          auVar255._0_8_ = extraout_XMM1_Qa;
                          auVar141 = auVar255._0_16_;
                        }
                        auVar91._8_8_ = uStack_b18;
                        auVar91._0_8_ = local_b20;
                        if (auVar91 == (undefined1  [16])0x0) {
                          auVar140 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar225 = vpcmpeqd_avx(auVar141,auVar141);
                          auVar140 = auVar140 ^ auVar225;
                          auVar255 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar311 = ZEXT864(0);
                        }
                        else {
                          p_Var15 = context->args->filter;
                          auVar255 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar311 = ZEXT1664(ZEXT816(0));
                          auVar225 = vpcmpeqd_avx(auVar142,auVar142);
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar340 = ZEXT1664(auVar340._0_16_);
                            auVar389 = ZEXT1664(auVar389._0_16_);
                            auVar419 = ZEXT1664(auVar419._0_16_);
                            (*p_Var15)(&local_a30);
                            auVar225 = vpcmpeqd_avx(auVar225,auVar225);
                            auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar255 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar92._8_8_ = uStack_b18;
                          auVar92._0_8_ = local_b20;
                          auVar112 = vpcmpeqd_avx(auVar92,_DAT_01feba10);
                          auVar140 = auVar112 ^ auVar225;
                          if (auVar92 != (undefined1  [16])0x0) {
                            auVar112 = auVar112 ^ auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar225;
                          }
                        }
                        auVar403 = ZEXT464((uint)local_be0);
                        auVar148._8_8_ = 0x100000001;
                        auVar148._0_8_ = 0x100000001;
                        if ((auVar148 & auVar140) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar134;
                        }
                      }
                    }
                  }
                }
                auVar121 = local_620;
                auVar394 = ZEXT464((uint)fVar221);
                bVar106 = lVar103 != 0;
                lVar103 = lVar103 + -1;
              } while ((!bVar77) && (bVar106));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar129._4_4_ = uVar8;
              auVar129._0_4_ = uVar8;
              auVar129._8_4_ = uVar8;
              auVar129._12_4_ = uVar8;
              auVar129._16_4_ = uVar8;
              auVar129._20_4_ = uVar8;
              auVar129._24_4_ = uVar8;
              auVar129._28_4_ = uVar8;
              auVar122 = vcmpps_avx(_local_820,auVar129,2);
              local_620 = vandps_avx(auVar122,local_620);
              auVar121 = auVar121 & auVar122;
              uVar104 = local_660._0_8_;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
          }
          auVar130._0_4_ =
               (float)local_880._0_4_ * (float)local_7c0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
               (float)local_680._0_4_ * (float)local_800._0_4_;
          auVar130._4_4_ =
               (float)local_880._4_4_ * (float)local_7c0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
               (float)local_680._4_4_ * (float)local_800._4_4_;
          auVar130._8_4_ =
               fStack_878 * fStack_7b8 + fStack_898 * fStack_7d8 + fStack_678 * fStack_7f8;
          auVar130._12_4_ =
               fStack_874 * fStack_7b4 + fStack_894 * fStack_7d4 + fStack_674 * fStack_7f4;
          auVar130._16_4_ =
               fStack_870 * fStack_7b0 + fStack_890 * fStack_7d0 + fStack_670 * fStack_7f0;
          auVar130._20_4_ =
               fStack_86c * fStack_7ac + fStack_88c * fStack_7cc + fStack_66c * fStack_7ec;
          auVar130._24_4_ =
               fStack_868 * fStack_7a8 + fStack_888 * fStack_7c8 + fStack_668 * fStack_7e8;
          auVar130._28_4_ = fStack_864 + fStack_884 + fStack_664;
          auVar160._8_4_ = 0x7fffffff;
          auVar160._0_8_ = 0x7fffffff7fffffff;
          auVar160._12_4_ = 0x7fffffff;
          auVar160._16_4_ = 0x7fffffff;
          auVar160._20_4_ = 0x7fffffff;
          auVar160._24_4_ = 0x7fffffff;
          auVar160._28_4_ = 0x7fffffff;
          auVar121 = vandps_avx(auVar130,auVar160);
          auVar161._8_4_ = 0x3e99999a;
          auVar161._0_8_ = 0x3e99999a3e99999a;
          auVar161._12_4_ = 0x3e99999a;
          auVar161._16_4_ = 0x3e99999a;
          auVar161._20_4_ = 0x3e99999a;
          auVar161._24_4_ = 0x3e99999a;
          auVar161._28_4_ = 0x3e99999a;
          auVar121 = vcmpps_avx(auVar121,auVar161,1);
          auVar122 = vorps_avx(auVar121,local_600);
          auVar162._0_4_ = (float)local_860._0_4_ + (float)local_5a0._0_4_;
          auVar162._4_4_ = (float)local_860._4_4_ + (float)local_5a0._4_4_;
          auVar162._8_4_ = fStack_858 + fStack_598;
          auVar162._12_4_ = fStack_854 + fStack_594;
          auVar162._16_4_ = fStack_850 + fStack_590;
          auVar162._20_4_ = fStack_84c + fStack_58c;
          auVar162._24_4_ = fStack_848 + fStack_588;
          auVar162._28_4_ = fStack_844 + fStack_584;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar197._4_4_ = uVar8;
          auVar197._0_4_ = uVar8;
          auVar197._8_4_ = uVar8;
          auVar197._12_4_ = uVar8;
          auVar197._16_4_ = uVar8;
          auVar197._20_4_ = uVar8;
          auVar197._24_4_ = uVar8;
          auVar197._28_4_ = uVar8;
          auVar121 = vcmpps_avx(auVar162,auVar197,2);
          _local_880 = vandps_avx(auVar121,local_5c0);
          auVar163._8_4_ = 3;
          auVar163._0_8_ = 0x300000003;
          auVar163._12_4_ = 3;
          auVar163._16_4_ = 3;
          auVar163._20_4_ = 3;
          auVar163._24_4_ = 3;
          auVar163._28_4_ = 3;
          auVar198._8_4_ = 2;
          auVar198._0_8_ = 0x200000002;
          auVar198._12_4_ = 2;
          auVar198._16_4_ = 2;
          auVar198._20_4_ = 2;
          auVar198._24_4_ = 2;
          auVar198._28_4_ = 2;
          auVar121 = vblendvps_avx(auVar198,auVar163,auVar122);
          auVar140 = vpcmpgtd_avx(auVar121._16_16_,local_6a0._0_16_);
          auVar225 = vpshufd_avx(local_5e0._0_16_,0);
          auVar225 = vpcmpgtd_avx(auVar121._0_16_,auVar225);
          auVar164._16_16_ = auVar140;
          auVar164._0_16_ = auVar225;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar225),auVar164,0xf0);
          local_640 = vandnps_avx(_local_8a0,_local_880);
          auVar121 = _local_880 & ~_local_8a0;
          fVar411 = (float)local_860._0_4_;
          fVar421 = (float)local_860._4_4_;
          fVar279 = fStack_858;
          fVar289 = fStack_854;
          fVar291 = fStack_850;
          fVar293 = fStack_84c;
          fVar295 = fStack_848;
          fVar297 = fStack_844;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            _local_9a0 = _local_300;
            local_820._4_4_ = (float)local_860._4_4_ + (float)local_300._4_4_;
            local_820._0_4_ = (float)local_860._0_4_ + (float)local_300._0_4_;
            fStack_818 = fStack_858 + fStack_2f8;
            fStack_814 = fStack_854 + fStack_2f4;
            fStack_810 = fStack_850 + fStack_2f0;
            fStack_80c = fStack_84c + fStack_2ec;
            fStack_808 = fStack_848 + fStack_2e8;
            fStack_804 = fStack_844 + fStack_2e4;
            do {
              auVar246 = auVar255._0_16_;
              auVar165._8_4_ = 0x7f800000;
              auVar165._0_8_ = 0x7f8000007f800000;
              auVar165._12_4_ = 0x7f800000;
              auVar165._16_4_ = 0x7f800000;
              auVar165._20_4_ = 0x7f800000;
              auVar165._24_4_ = 0x7f800000;
              auVar165._28_4_ = 0x7f800000;
              auVar121 = vblendvps_avx(auVar165,_local_9a0,local_640);
              auVar122 = vshufps_avx(auVar121,auVar121,0xb1);
              auVar122 = vminps_avx(auVar121,auVar122);
              auVar24 = vshufpd_avx(auVar122,auVar122,5);
              auVar122 = vminps_avx(auVar122,auVar24);
              auVar24 = vperm2f128_avx(auVar122,auVar122,1);
              auVar122 = vminps_avx(auVar122,auVar24);
              auVar122 = vcmpps_avx(auVar121,auVar122,0);
              auVar24 = local_640 & auVar122;
              auVar121 = local_640;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar24 >> 0x7f,0) != '\0') ||
                    (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar24 >> 0xbf,0) != '\0') ||
                  (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar24[0x1f] < '\0') {
                auVar121 = vandps_avx(auVar122,local_640);
              }
              uVar102 = vmovmskps_avx(auVar121);
              uVar16 = 0;
              if (uVar102 != 0) {
                for (; (uVar102 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
                }
              }
              uVar104 = (ulong)uVar16;
              *(undefined4 *)(local_640 + uVar104 * 4) = 0;
              fVar134 = local_540[uVar104];
              uVar16 = *(uint *)(local_2e0 + uVar104 * 4);
              fVar168 = local_b08;
              if ((float)local_920._0_4_ < 0.0) {
                fVar168 = sqrtf((float)local_920._0_4_);
                auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar246._8_4_ = 0x7fffffff;
                auVar246._0_8_ = 0x7fffffff7fffffff;
                auVar246._12_4_ = 0x7fffffff;
              }
              auVar403 = ZEXT464(uVar16);
              auVar394 = ZEXT464((uint)fVar134);
              auVar225 = vminps_avx(_local_a40,_local_a60);
              auVar140 = vmaxps_avx(_local_a40,_local_a60);
              auVar112 = vminps_avx(_local_a50,_local_a70);
              auVar141 = vminps_avx(auVar225,auVar112);
              auVar225 = vmaxps_avx(_local_a50,_local_a70);
              auVar112 = vmaxps_avx(auVar140,auVar225);
              auVar140 = vandps_avx(auVar141,auVar246);
              auVar225 = vandps_avx(auVar112,auVar246);
              auVar140 = vmaxps_avx(auVar140,auVar225);
              auVar225 = vmovshdup_avx(auVar140);
              auVar225 = vmaxss_avx(auVar225,auVar140);
              auVar140 = vshufpd_avx(auVar140,auVar140,1);
              auVar140 = vmaxss_avx(auVar140,auVar225);
              local_9e0._0_4_ = auVar140._0_4_ * 1.9073486e-06;
              local_780._0_4_ = fVar168 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar112,auVar112,0xff);
              lVar103 = 4;
              do {
                auVar140 = vshufps_avx(auVar403._0_16_,auVar403._0_16_,0);
                auVar116._0_4_ = auVar140._0_4_ * (float)local_910._0_4_ + 0.0;
                auVar116._4_4_ = auVar140._4_4_ * (float)local_910._4_4_ + 0.0;
                auVar116._8_4_ = auVar140._8_4_ * fStack_908 + 0.0;
                auVar116._12_4_ = auVar140._12_4_ * fStack_904 + 0.0;
                fVar221 = auVar394._0_4_;
                fVar170 = 1.0 - fVar221;
                fVar134 = fVar221 * fVar221;
                fVar168 = fVar221 * 3.0;
                local_ac0._0_4_ = fVar170 * fVar170;
                auVar140 = ZEXT416((uint)(fVar221 * fVar221 * -fVar170 * 0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar225 = ZEXT416((uint)((fVar170 * fVar170 * (fVar170 * 3.0 + -5.0) + 2.0) * 0.5))
                ;
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar112 = ZEXT416((uint)((fVar134 * (fVar168 + -5.0) + 2.0) * 0.5));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar141 = ZEXT416((uint)(fVar170 * fVar170 * -fVar221 * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar188._0_4_ =
                     auVar141._0_4_ * (float)local_a40._0_4_ +
                     auVar112._0_4_ * (float)local_a60._0_4_ +
                     auVar225._0_4_ * (float)local_a50._0_4_ +
                     auVar140._0_4_ * (float)local_a70._0_4_;
                auVar188._4_4_ =
                     auVar141._4_4_ * (float)local_a40._4_4_ +
                     auVar112._4_4_ * (float)local_a60._4_4_ +
                     auVar225._4_4_ * (float)local_a50._4_4_ +
                     auVar140._4_4_ * (float)local_a70._4_4_;
                auVar188._8_4_ =
                     auVar141._8_4_ * fStack_a38 +
                     auVar112._8_4_ * fStack_a58 +
                     auVar225._8_4_ * fStack_a48 + auVar140._8_4_ * fStack_a68;
                auVar188._12_4_ =
                     auVar141._12_4_ * fStack_a34 +
                     auVar112._12_4_ * fStack_a54 +
                     auVar225._12_4_ * fStack_a44 + auVar140._12_4_ * fStack_a64;
                local_900._0_16_ = auVar188;
                auVar140 = vsubps_avx(auVar116,auVar188);
                _local_a00 = auVar140;
                auVar140 = vdpps_avx(auVar140,auVar140,0x7f);
                local_aa0._0_16_ = ZEXT416((uint)(fVar221 * -9.0 + 4.0));
                fVar236 = auVar140._0_4_;
                local_be0 = auVar403._0_4_;
                if (fVar236 < 0.0) {
                  local_ae0._0_4_ = fVar134;
                  local_b00._0_16_ = ZEXT416((uint)fVar170);
                  local_940._0_4_ = fVar168;
                  local_960._0_4_ = fVar221 * 9.0;
                  local_980._0_4_ = fVar170 * -2.0;
                  fVar237 = sqrtf(fVar236);
                  auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar256 = (float)local_960._0_4_;
                  fVar238 = (float)local_980._0_4_;
                  fVar134 = (float)local_ae0._0_4_;
                  fVar239 = (float)local_940._0_4_;
                  fVar170 = (float)local_b00._0_4_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar140,auVar140);
                  fVar237 = auVar225._0_4_;
                  fVar256 = fVar221 * 9.0;
                  fVar238 = fVar170 * -2.0;
                  fVar239 = fVar168;
                }
                auVar225 = ZEXT416((uint)((fVar134 + fVar238 * fVar221) * 0.5));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar112 = ZEXT416((uint)(((fVar170 + fVar170) * (fVar239 + 2.0) +
                                          fVar170 * fVar170 * -3.0) * 0.5));
                auVar112 = vshufps_avx(auVar112,auVar112,0);
                auVar141 = ZEXT416((uint)(((fVar221 + fVar221) * (fVar168 + -5.0) +
                                          fVar221 * fVar239) * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar142 = ZEXT416((uint)((fVar221 * (fVar170 + fVar170) - (float)local_ac0._0_4_) *
                                         0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar415._0_4_ =
                     (float)local_a40._0_4_ * auVar142._0_4_ +
                     (float)local_a60._0_4_ * auVar141._0_4_ +
                     (float)local_a70._0_4_ * auVar225._0_4_ +
                     (float)local_a50._0_4_ * auVar112._0_4_;
                auVar415._4_4_ =
                     (float)local_a40._4_4_ * auVar142._4_4_ +
                     (float)local_a60._4_4_ * auVar141._4_4_ +
                     (float)local_a70._4_4_ * auVar225._4_4_ +
                     (float)local_a50._4_4_ * auVar112._4_4_;
                auVar415._8_4_ =
                     fStack_a38 * auVar142._8_4_ +
                     fStack_a58 * auVar141._8_4_ +
                     fStack_a68 * auVar225._8_4_ + fStack_a48 * auVar112._8_4_;
                auVar415._12_4_ =
                     fStack_a34 * auVar142._12_4_ +
                     fStack_a54 * auVar141._12_4_ +
                     fStack_a64 * auVar225._12_4_ + fStack_a44 * auVar112._12_4_;
                auVar142 = vpermilps_avx(ZEXT416((uint)(fVar168 + -1.0)),0);
                auVar17 = vpermilps_avx(local_aa0._0_16_,0);
                auVar225 = vshufps_avx(ZEXT416((uint)(fVar256 + -5.0)),
                                       ZEXT416((uint)(fVar256 + -5.0)),0);
                auVar112 = ZEXT416((uint)(fVar221 * -3.0 + 2.0));
                auVar141 = vshufps_avx(auVar112,auVar112,0);
                auVar112 = vdpps_avx(auVar415,auVar415,0x7f);
                auVar149._0_4_ =
                     (float)local_a40._0_4_ * auVar141._0_4_ +
                     (float)local_a60._0_4_ * auVar225._0_4_ +
                     (float)local_a50._0_4_ * auVar17._0_4_ +
                     (float)local_a70._0_4_ * auVar142._0_4_;
                auVar149._4_4_ =
                     (float)local_a40._4_4_ * auVar141._4_4_ +
                     (float)local_a60._4_4_ * auVar225._4_4_ +
                     (float)local_a50._4_4_ * auVar17._4_4_ +
                     (float)local_a70._4_4_ * auVar142._4_4_;
                auVar149._8_4_ =
                     fStack_a38 * auVar141._8_4_ +
                     fStack_a58 * auVar225._8_4_ +
                     fStack_a48 * auVar17._8_4_ + fStack_a68 * auVar142._8_4_;
                auVar149._12_4_ =
                     fStack_a34 * auVar141._12_4_ +
                     fStack_a54 * auVar225._12_4_ +
                     fStack_a44 * auVar17._12_4_ + fStack_a64 * auVar142._12_4_;
                auVar225 = vblendps_avx(auVar112,_DAT_01feba10,0xe);
                auVar141 = vrsqrtss_avx(auVar225,auVar225);
                fVar168 = auVar141._0_4_;
                fVar134 = auVar112._0_4_;
                auVar141 = vdpps_avx(auVar415,auVar149,0x7f);
                auVar142 = vshufps_avx(auVar112,auVar112,0);
                auVar150._0_4_ = auVar149._0_4_ * auVar142._0_4_;
                auVar150._4_4_ = auVar149._4_4_ * auVar142._4_4_;
                auVar150._8_4_ = auVar149._8_4_ * auVar142._8_4_;
                auVar150._12_4_ = auVar149._12_4_ * auVar142._12_4_;
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar247._0_4_ = auVar415._0_4_ * auVar141._0_4_;
                auVar247._4_4_ = auVar415._4_4_ * auVar141._4_4_;
                auVar247._8_4_ = auVar415._8_4_ * auVar141._8_4_;
                auVar247._12_4_ = auVar415._12_4_ * auVar141._12_4_;
                auVar17 = vsubps_avx(auVar150,auVar247);
                auVar141 = vrcpss_avx(auVar225,auVar225);
                auVar225 = vmaxss_avx(ZEXT416((uint)local_9e0._0_4_),
                                      ZEXT416((uint)(local_be0 * (float)local_780._0_4_)));
                auVar389 = ZEXT1664(auVar225);
                auVar141 = ZEXT416((uint)(auVar141._0_4_ * (2.0 - fVar134 * auVar141._0_4_)));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                uVar104 = CONCAT44(auVar415._4_4_,auVar415._0_4_);
                auVar265._0_8_ = uVar104 ^ 0x8000000080000000;
                auVar265._8_4_ = -auVar415._8_4_;
                auVar265._12_4_ = -auVar415._12_4_;
                auVar142 = ZEXT416((uint)(fVar168 * 1.5 +
                                         fVar134 * -0.5 * fVar168 * fVar168 * fVar168));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar228._0_4_ = auVar142._0_4_ * auVar17._0_4_ * auVar141._0_4_;
                auVar228._4_4_ = auVar142._4_4_ * auVar17._4_4_ * auVar141._4_4_;
                auVar228._8_4_ = auVar142._8_4_ * auVar17._8_4_ * auVar141._8_4_;
                auVar228._12_4_ = auVar142._12_4_ * auVar17._12_4_ * auVar141._12_4_;
                auVar284._0_4_ = auVar415._0_4_ * auVar142._0_4_;
                auVar284._4_4_ = auVar415._4_4_ * auVar142._4_4_;
                auVar284._8_4_ = auVar415._8_4_ * auVar142._8_4_;
                auVar284._12_4_ = auVar415._12_4_ * auVar142._12_4_;
                local_aa0._0_4_ = auVar225._0_4_;
                if (fVar134 < 0.0) {
                  local_ac0._0_16_ = auVar265;
                  local_ae0._0_16_ = auVar284;
                  local_b00._0_16_ = auVar228;
                  fVar134 = sqrtf(fVar134);
                  auVar389 = ZEXT464((uint)local_aa0._0_4_);
                  auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar228 = local_b00._0_16_;
                  auVar265 = local_ac0._0_16_;
                  auVar284 = local_ae0._0_16_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar112,auVar112);
                  fVar134 = auVar225._0_4_;
                }
                auVar225 = vdpps_avx(_local_a00,auVar284,0x7f);
                fVar134 = ((float)local_9e0._0_4_ / fVar134) * (fVar237 + 1.0) +
                          auVar389._0_4_ + fVar237 * (float)local_9e0._0_4_;
                auVar112 = vdpps_avx(auVar265,auVar284,0x7f);
                auVar141 = vdpps_avx(_local_a00,auVar228,0x7f);
                auVar142 = vdpps_avx(_local_910,auVar284,0x7f);
                auVar17 = vdpps_avx(_local_a00,auVar265,0x7f);
                fVar168 = auVar112._0_4_ + auVar141._0_4_;
                fVar170 = auVar225._0_4_;
                auVar117._0_4_ = fVar170 * fVar170;
                auVar117._4_4_ = auVar225._4_4_ * auVar225._4_4_;
                auVar117._8_4_ = auVar225._8_4_ * auVar225._8_4_;
                auVar117._12_4_ = auVar225._12_4_ * auVar225._12_4_;
                auVar141 = vsubps_avx(auVar140,auVar117);
                auVar112 = vdpps_avx(_local_a00,_local_910,0x7f);
                fVar237 = auVar17._0_4_ - fVar170 * fVar168;
                fVar238 = auVar112._0_4_ - fVar170 * auVar142._0_4_;
                auVar112 = vrsqrtss_avx(auVar141,auVar141);
                fVar239 = auVar141._0_4_;
                fVar170 = auVar112._0_4_;
                fVar170 = fVar170 * 1.5 + fVar239 * -0.5 * fVar170 * fVar170 * fVar170;
                if (fVar239 < 0.0) {
                  local_ac0._0_4_ = fVar134;
                  local_ae0._0_16_ = ZEXT416((uint)fVar168);
                  local_b00._0_16_ = auVar142;
                  local_940._0_4_ = fVar237;
                  local_960._0_4_ = fVar238;
                  local_980._0_4_ = fVar170;
                  fVar239 = sqrtf(fVar239);
                  auVar389 = ZEXT464((uint)local_aa0._0_4_);
                  auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar170 = (float)local_980._0_4_;
                  fVar237 = (float)local_940._0_4_;
                  fVar238 = (float)local_960._0_4_;
                  auVar142 = local_b00._0_16_;
                  fVar134 = (float)local_ac0._0_4_;
                  auVar112 = local_ae0._0_16_;
                }
                else {
                  auVar112 = vsqrtss_avx(auVar141,auVar141);
                  fVar239 = auVar112._0_4_;
                  auVar112 = ZEXT416((uint)fVar168);
                }
                auVar419 = ZEXT1664(auVar225);
                auVar340 = ZEXT1664(auVar140);
                auVar145 = vpermilps_avx(local_900._0_16_,0xff);
                auVar18 = vshufps_avx(auVar415,auVar415,0xff);
                fVar168 = fVar237 * fVar170 - auVar18._0_4_;
                auVar248._0_8_ = auVar142._0_8_ ^ 0x8000000080000000;
                auVar248._8_4_ = auVar142._8_4_ ^ 0x80000000;
                auVar248._12_4_ = auVar142._12_4_ ^ 0x80000000;
                auVar266._0_4_ = -fVar168;
                auVar266._4_4_ = 0x80000000;
                auVar266._8_4_ = 0x80000000;
                auVar266._12_4_ = 0x80000000;
                auVar141 = vinsertps_avx(ZEXT416((uint)(fVar238 * fVar170)),auVar248,0x10);
                auVar17 = vmovsldup_avx(ZEXT416((uint)(auVar112._0_4_ * fVar238 * fVar170 -
                                                      auVar142._0_4_ * fVar168)));
                auVar141 = vdivps_avx(auVar141,auVar17);
                auVar145 = ZEXT416((uint)(fVar239 - auVar145._0_4_));
                auVar142 = vinsertps_avx(auVar225,auVar145,0x10);
                auVar229._0_4_ = auVar142._0_4_ * auVar141._0_4_;
                auVar229._4_4_ = auVar142._4_4_ * auVar141._4_4_;
                auVar229._8_4_ = auVar142._8_4_ * auVar141._8_4_;
                auVar229._12_4_ = auVar142._12_4_ * auVar141._12_4_;
                auVar112 = vinsertps_avx(auVar266,auVar112,0x1c);
                auVar112 = vdivps_avx(auVar112,auVar17);
                auVar189._0_4_ = auVar142._0_4_ * auVar112._0_4_;
                auVar189._4_4_ = auVar142._4_4_ * auVar112._4_4_;
                auVar189._8_4_ = auVar142._8_4_ * auVar112._8_4_;
                auVar189._12_4_ = auVar142._12_4_ * auVar112._12_4_;
                auVar112 = vhaddps_avx(auVar229,auVar229);
                auVar141 = vhaddps_avx(auVar189,auVar189);
                fVar221 = fVar221 - auVar112._0_4_;
                local_be0 = local_be0 - auVar141._0_4_;
                auVar403 = ZEXT464((uint)local_be0);
                auVar249._8_4_ = 0x7fffffff;
                auVar249._0_8_ = 0x7fffffff7fffffff;
                auVar249._12_4_ = 0x7fffffff;
                auVar255 = ZEXT1664(auVar249);
                auVar112 = vandps_avx(auVar225,auVar249);
                if (fVar134 <= auVar112._0_4_) {
LAB_0106f75e:
                  bVar77 = false;
                }
                else {
                  auVar112 = vandps_avx(auVar145,auVar249);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + auVar389._0_4_ + fVar134 <=
                      auVar112._0_4_) goto LAB_0106f75e;
                  local_be0 = local_be0 + (float)local_8c0._0_4_;
                  auVar403 = ZEXT464((uint)local_be0);
                  bVar77 = true;
                  if ((((fVar133 <= local_be0) &&
                       (fVar134 = *(float *)(ray + k * 4 + 0x80), local_be0 <= fVar134)) &&
                      (0.0 <= fVar221)) && (fVar221 <= 1.0)) {
                    auVar112 = vrsqrtss_avx(auVar140,auVar140);
                    fVar168 = auVar112._0_4_;
                    pGVar11 = (context->scene->geometries).items[uVar99].ptr;
                    if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar112 = ZEXT416((uint)(fVar168 * 1.5 +
                                               fVar236 * -0.5 * fVar168 * fVar168 * fVar168));
                      auVar112 = vshufps_avx(auVar112,auVar112,0);
                      auVar151._0_4_ = auVar112._0_4_ * (float)local_a00._0_4_;
                      auVar151._4_4_ = auVar112._4_4_ * (float)local_a00._4_4_;
                      auVar151._8_4_ = auVar112._8_4_ * fStack_9f8;
                      auVar151._12_4_ = auVar112._12_4_ * fStack_9f4;
                      auVar118._0_4_ = auVar415._0_4_ + auVar18._0_4_ * auVar151._0_4_;
                      auVar118._4_4_ = auVar415._4_4_ + auVar18._4_4_ * auVar151._4_4_;
                      auVar118._8_4_ = auVar415._8_4_ + auVar18._8_4_ * auVar151._8_4_;
                      auVar118._12_4_ = auVar415._12_4_ + auVar18._12_4_ * auVar151._12_4_;
                      auVar112 = vshufps_avx(auVar151,auVar151,0xc9);
                      auVar141 = vshufps_avx(auVar415,auVar415,0xc9);
                      auVar152._0_4_ = auVar141._0_4_ * auVar151._0_4_;
                      auVar152._4_4_ = auVar141._4_4_ * auVar151._4_4_;
                      auVar152._8_4_ = auVar141._8_4_ * auVar151._8_4_;
                      auVar152._12_4_ = auVar141._12_4_ * auVar151._12_4_;
                      auVar190._0_4_ = auVar415._0_4_ * auVar112._0_4_;
                      auVar190._4_4_ = auVar415._4_4_ * auVar112._4_4_;
                      auVar190._8_4_ = auVar415._8_4_ * auVar112._8_4_;
                      auVar190._12_4_ = auVar415._12_4_ * auVar112._12_4_;
                      auVar142 = vsubps_avx(auVar190,auVar152);
                      auVar112 = vshufps_avx(auVar142,auVar142,0xc9);
                      auVar141 = vshufps_avx(auVar118,auVar118,0xc9);
                      auVar191._0_4_ = auVar141._0_4_ * auVar112._0_4_;
                      auVar191._4_4_ = auVar141._4_4_ * auVar112._4_4_;
                      auVar191._8_4_ = auVar141._8_4_ * auVar112._8_4_;
                      auVar191._12_4_ = auVar141._12_4_ * auVar112._12_4_;
                      auVar112 = vshufps_avx(auVar142,auVar142,0xd2);
                      auVar119._0_4_ = auVar118._0_4_ * auVar112._0_4_;
                      auVar119._4_4_ = auVar118._4_4_ * auVar112._4_4_;
                      auVar119._8_4_ = auVar118._8_4_ * auVar112._8_4_;
                      auVar119._12_4_ = auVar118._12_4_ * auVar112._12_4_;
                      auVar112 = vsubps_avx(auVar191,auVar119);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        uVar8 = vextractps_avx(auVar112,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                        uVar8 = vextractps_avx(auVar112,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                        *(int *)(ray + k * 4 + 0xe0) = auVar112._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar221;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_9a8;
                        *(uint *)(ray + k * 4 + 0x120) = uVar99;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar141 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
                        local_740 = (RTCHitN  [16])vshufps_avx(auVar112,auVar112,0x55);
                        auVar142 = vshufps_avx(auVar112,auVar112,0xaa);
                        local_720 = vshufps_avx(auVar112,auVar112,0);
                        auStack_730 = auVar142;
                        local_710 = auVar141;
                        local_700 = ZEXT816(0) << 0x20;
                        local_6f0 = local_760._0_8_;
                        uStack_6e8 = local_760._8_8_;
                        local_6e0 = local_750._0_8_;
                        uStack_6d8 = local_750._8_8_;
                        uVar16 = context->user->instID[0];
                        _local_6d0 = CONCAT44(uVar16,uVar16);
                        _uStack_6c8 = CONCAT44(uVar16,uVar16);
                        uVar16 = context->user->instPrimID[0];
                        _uStack_6c0 = CONCAT44(uVar16,uVar16);
                        _uStack_6b8 = CONCAT44(uVar16,uVar16);
                        *(float *)(ray + k * 4 + 0x80) = local_be0;
                        local_b20 = *local_9b0;
                        uStack_b18 = local_9b0[1];
                        local_a30.valid = (int *)&local_b20;
                        local_a30.geometryUserPtr = pGVar11->userPtr;
                        local_a30.context = context->user;
                        local_a30.hit = local_740;
                        local_a30.N = 4;
                        local_a30.ray = (RTCRayN *)ray;
                        if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar340 = ZEXT1664(auVar140);
                          auVar389 = ZEXT1664(auVar389._0_16_);
                          auVar419 = ZEXT1664(auVar225);
                          (*pGVar11->intersectionFilterN)(&local_a30);
                          auVar394._8_56_ = extraout_var_00;
                          auVar394._0_8_ = extraout_XMM1_Qa_00;
                          auVar141 = auVar394._0_16_;
                        }
                        auVar93._8_8_ = uStack_b18;
                        auVar93._0_8_ = local_b20;
                        if (auVar93 == (undefined1  [16])0x0) {
                          auVar140 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar225 = vpcmpeqd_avx(auVar141,auVar141);
                          auVar140 = auVar140 ^ auVar225;
                          auVar255 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar311 = ZEXT864(0);
                        }
                        else {
                          p_Var15 = context->args->filter;
                          auVar255 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar311 = ZEXT1664(ZEXT816(0));
                          auVar225 = vpcmpeqd_avx(auVar142,auVar142);
                          if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar340 = ZEXT1664(auVar340._0_16_);
                            auVar389 = ZEXT1664(auVar389._0_16_);
                            auVar419 = ZEXT1664(auVar419._0_16_);
                            (*p_Var15)(&local_a30);
                            auVar225 = vpcmpeqd_avx(auVar225,auVar225);
                            auVar311 = ZEXT1664(ZEXT816(0) << 0x40);
                            auVar255 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar94._8_8_ = uStack_b18;
                          auVar94._0_8_ = local_b20;
                          auVar112 = vpcmpeqd_avx(auVar94,_DAT_01feba10);
                          auVar140 = auVar112 ^ auVar225;
                          if (auVar94 != (undefined1  [16])0x0) {
                            auVar112 = auVar112 ^ auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])local_a30.hit);
                            *(undefined1 (*) [16])(local_a30.ray + 0xc0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x10));
                            *(undefined1 (*) [16])(local_a30.ray + 0xd0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x20));
                            *(undefined1 (*) [16])(local_a30.ray + 0xe0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x30));
                            *(undefined1 (*) [16])(local_a30.ray + 0xf0) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x40));
                            *(undefined1 (*) [16])(local_a30.ray + 0x100) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x50));
                            *(undefined1 (*) [16])(local_a30.ray + 0x110) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x60));
                            *(undefined1 (*) [16])(local_a30.ray + 0x120) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x70));
                            *(undefined1 (*) [16])(local_a30.ray + 0x130) = auVar225;
                            auVar225 = vmaskmovps_avx(auVar112,*(undefined1 (*) [16])
                                                                (local_a30.hit + 0x80));
                            *(undefined1 (*) [16])(local_a30.ray + 0x140) = auVar225;
                          }
                        }
                        auVar403 = ZEXT464((uint)local_be0);
                        auVar153._8_8_ = 0x100000001;
                        auVar153._0_8_ = 0x100000001;
                        if ((auVar153 & auVar140) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar134;
                        }
                      }
                    }
                  }
                }
                auVar121 = local_640;
                auVar394 = ZEXT464((uint)fVar221);
                bVar106 = lVar103 != 0;
                lVar103 = lVar103 + -1;
              } while ((!bVar77) && (bVar106));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar131._4_4_ = uVar8;
              auVar131._0_4_ = uVar8;
              auVar131._8_4_ = uVar8;
              auVar131._12_4_ = uVar8;
              auVar131._16_4_ = uVar8;
              auVar131._20_4_ = uVar8;
              auVar131._24_4_ = uVar8;
              auVar131._28_4_ = uVar8;
              auVar122 = vcmpps_avx(_local_820,auVar131,2);
              local_640 = vandps_avx(auVar122,local_640);
              auVar121 = auVar121 & auVar122;
              uVar104 = local_660._0_8_;
              fVar411 = (float)local_860._0_4_;
              fVar421 = (float)local_860._4_4_;
              fVar279 = fStack_858;
              fVar289 = fStack_854;
              fVar291 = fStack_850;
              fVar293 = fStack_84c;
              fVar295 = fStack_848;
              fVar297 = fStack_844;
            } while ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar121 >> 0x7f,0) != '\0') ||
                       (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar121 >> 0xbf,0) != '\0') ||
                     (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar121[0x1f] < '\0');
          }
          auVar121 = vandps_avx(local_580,local_560);
          auVar122 = vandps_avx(_local_8a0,_local_880);
          auVar199._0_4_ = fVar411 + local_340._0_4_;
          auVar199._4_4_ = fVar421 + local_340._4_4_;
          auVar199._8_4_ = fVar279 + local_340._8_4_;
          auVar199._12_4_ = fVar289 + local_340._12_4_;
          auVar199._16_4_ = fVar291 + local_340._16_4_;
          auVar199._20_4_ = fVar293 + local_340._20_4_;
          auVar199._24_4_ = fVar295 + local_340._24_4_;
          auVar199._28_4_ = fVar297 + local_340._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar254._4_4_ = uVar8;
          auVar254._0_4_ = uVar8;
          auVar254._8_4_ = uVar8;
          auVar254._12_4_ = uVar8;
          auVar254._16_4_ = uVar8;
          auVar254._20_4_ = uVar8;
          auVar254._24_4_ = uVar8;
          auVar254._28_4_ = uVar8;
          auVar24 = vcmpps_avx(auVar199,auVar254,2);
          auVar121 = vandps_avx(auVar24,auVar121);
          auVar272._0_4_ = fVar411 + local_300._0_4_;
          auVar272._4_4_ = fVar421 + local_300._4_4_;
          auVar272._8_4_ = fVar279 + local_300._8_4_;
          auVar272._12_4_ = fVar289 + local_300._12_4_;
          auVar272._16_4_ = fVar291 + local_300._16_4_;
          auVar272._20_4_ = fVar293 + local_300._20_4_;
          auVar272._24_4_ = fVar295 + local_300._24_4_;
          auVar272._28_4_ = fVar297 + local_300._28_4_;
          auVar24 = vcmpps_avx(auVar272,auVar254,2);
          auVar122 = vandps_avx(auVar24,auVar122);
          auVar122 = vorps_avx(auVar121,auVar122);
          if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0x7f,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0xbf,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar122[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar100 * 0x60) = auVar122;
            auVar121 = vblendvps_avx(_local_300,_local_340,auVar121);
            *(undefined1 (*) [32])(auStack_160 + uVar100 * 0x60) = auVar121;
            auVar96._8_8_ = uStack_8c8;
            auVar96._0_8_ = local_8d0;
            uVar9 = vmovlps_avx(auVar96);
            *(undefined8 *)(afStack_140 + uVar100 * 0x18) = uVar9;
            auStack_138[uVar100 * 0x18] = (int)uVar104 + 1;
            uVar100 = (ulong)((int)uVar100 + 1);
          }
          auVar255 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          goto LAB_0106ded3;
        }
        auVar253._8_4_ = 0x3f800000;
        auVar253._0_8_ = &DAT_3f8000003f800000;
        auVar253._12_4_ = 0x3f800000;
        auVar253._16_4_ = 0x3f800000;
        auVar253._20_4_ = 0x3f800000;
        auVar253._24_4_ = 0x3f800000;
        auVar253._28_4_ = 0x3f800000;
      }
      auVar311 = ZEXT864(0) << 0x20;
      auVar255 = ZEXT3264(auVar253);
    }
LAB_0106ded3:
    do {
      if ((int)uVar100 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar120._4_4_ = uVar8;
        auVar120._0_4_ = uVar8;
        auVar120._8_4_ = uVar8;
        auVar120._12_4_ = uVar8;
        auVar140 = vcmpps_avx(local_4f0,auVar120,2);
        uVar99 = vmovmskps_avx(auVar140);
        uVar99 = (uint)local_8a8 - 1 & (uint)local_8a8 & uVar99;
        if (uVar99 == 0) {
          return;
        }
        goto LAB_0106cc9a;
      }
      uVar105 = (ulong)((int)uVar100 - 1);
      lVar103 = uVar105 * 0x60;
      auVar121 = *(undefined1 (*) [32])(auStack_160 + lVar103);
      auVar127._0_4_ = fVar411 + auVar121._0_4_;
      auVar127._4_4_ = fVar421 + auVar121._4_4_;
      auVar127._8_4_ = fVar279 + auVar121._8_4_;
      auVar127._12_4_ = fVar289 + auVar121._12_4_;
      auVar127._16_4_ = fVar291 + auVar121._16_4_;
      auVar127._20_4_ = fVar293 + auVar121._20_4_;
      auVar127._24_4_ = fVar295 + auVar121._24_4_;
      auVar127._28_4_ = fVar297 + auVar121._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar235._4_4_ = uVar8;
      auVar235._0_4_ = uVar8;
      auVar235._8_4_ = uVar8;
      auVar235._12_4_ = uVar8;
      auVar235._16_4_ = uVar8;
      auVar235._20_4_ = uVar8;
      auVar235._24_4_ = uVar8;
      auVar235._28_4_ = uVar8;
      auVar24 = vcmpps_avx(auVar127,auVar235,2);
      auVar122 = vandps_avx(auVar24,*(undefined1 (*) [32])(auStack_180 + lVar103));
      _local_740 = auVar122;
      auVar24 = *(undefined1 (*) [32])(auStack_180 + lVar103) & auVar24;
      bVar83 = (auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar84 = (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar82 = (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar81 = SUB321(auVar24 >> 0x7f,0) == '\0';
      bVar80 = (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar79 = SUB321(auVar24 >> 0xbf,0) == '\0';
      bVar106 = (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar77 = -1 < auVar24[0x1f];
      if (((((((!bVar83 || !bVar84) || !bVar82) || !bVar81) || !bVar80) || !bVar79) || !bVar106) ||
          !bVar77) {
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar195,auVar121,auVar122);
        auVar24 = vshufps_avx(auVar121,auVar121,0xb1);
        auVar24 = vminps_avx(auVar121,auVar24);
        auVar23 = vshufpd_avx(auVar24,auVar24,5);
        auVar24 = vminps_avx(auVar24,auVar23);
        auVar23 = vperm2f128_avx(auVar24,auVar24,1);
        auVar24 = vminps_avx(auVar24,auVar23);
        auVar121 = vcmpps_avx(auVar121,auVar24,0);
        auVar24 = auVar122 & auVar121;
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          auVar122 = vandps_avx(auVar121,auVar122);
        }
        fVar134 = afStack_140[uVar105 * 0x18 + 1];
        uVar104 = (ulong)auStack_138[uVar105 * 0x18];
        uVar102 = vmovmskps_avx(auVar122);
        uVar16 = 0;
        if (uVar102 != 0) {
          for (; (uVar102 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        fVar168 = afStack_140[uVar105 * 0x18];
        *(undefined4 *)(local_740 + (ulong)uVar16 * 4) = 0;
        if ((((((((_local_740 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_740 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_740 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_740 >> 0x7f,0) != '\0') ||
              (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_740 >> 0xbf,0) != '\0') ||
            (_local_740 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_740[0x1f] < '\0') {
          uVar105 = uVar100;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar103) = _local_740;
        auVar140 = vshufps_avx(ZEXT416((uint)(fVar134 - fVar168)),ZEXT416((uint)(fVar134 - fVar168))
                               ,0);
        local_340._4_4_ = fVar168 + auVar140._4_4_ * 0.14285715;
        local_340._0_4_ = fVar168 + auVar140._0_4_ * 0.0;
        fStack_338 = fVar168 + auVar140._8_4_ * 0.2857143;
        fStack_334 = fVar168 + auVar140._12_4_ * 0.42857146;
        fStack_330 = fVar168 + auVar140._0_4_ * 0.5714286;
        fStack_32c = fVar168 + auVar140._4_4_ * 0.71428573;
        fStack_328 = fVar168 + auVar140._8_4_ * 0.8571429;
        fStack_324 = fVar168 + auVar140._12_4_;
        local_8d0 = *(undefined8 *)(local_340 + (ulong)uVar16 * 4);
        uStack_8c8 = 0;
      }
      uVar100 = uVar105;
    } while (((((((bVar83 && bVar84) && bVar82) && bVar81) && bVar80) && bVar79) && bVar106) &&
             bVar77);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }